

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  uint uVar88;
  uint uVar89;
  undefined1 (*pauVar90) [32];
  uint uVar91;
  uint uVar92;
  long lVar93;
  ulong uVar94;
  ulong uVar95;
  int iVar96;
  ulong uVar97;
  float fVar98;
  float fVar125;
  float fVar127;
  __m128 a;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar126;
  float fVar128;
  float fVar130;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar131;
  float fVar133;
  float fVar135;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar129;
  float fVar137;
  undefined1 auVar115 [32];
  float fVar132;
  float fVar134;
  float fVar136;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar109 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar138;
  float fVar165;
  float fVar166;
  undefined1 auVar139 [16];
  undefined1 auVar151 [32];
  undefined1 auVar140 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar167;
  undefined1 auVar141 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar168;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar170 [16];
  float fVar169;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar190;
  float fVar191;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar192;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar173 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  float fVar193;
  float fVar215;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [28];
  float fVar213;
  float fVar214;
  float fVar216;
  float fVar217;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar218;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar237;
  undefined1 auVar228 [32];
  float fVar236;
  float fVar238;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar239;
  float fVar256;
  float fVar257;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar259;
  float fVar260;
  float fVar262;
  undefined1 auVar246 [32];
  float fVar258;
  undefined1 auVar247 [32];
  float fVar264;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar261;
  float fVar263;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar265;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar280;
  float fVar281;
  float fVar285;
  float fVar288;
  float fVar291;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar282;
  float fVar283;
  float fVar286;
  float fVar289;
  float fVar292;
  undefined1 auVar273 [32];
  float fVar284;
  float fVar287;
  float fVar290;
  float fVar293;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  float fVar294;
  float fVar305;
  float fVar306;
  float fVar308;
  float fVar310;
  float fVar312;
  float fVar314;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar307;
  float fVar309;
  float fVar311;
  float fVar313;
  float fVar315;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  float fVar316;
  float fVar323;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar321;
  float fVar322;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar330 [16];
  undefined1 auVar331 [28];
  float fVar336;
  float fVar338;
  float fVar342;
  float fVar344;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  float fVar337;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar343;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar334 [32];
  undefined1 auVar335 [64];
  undefined1 auVar350 [32];
  float fVar360;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [64];
  float fVar361;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar373;
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [64];
  float fVar374;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float in_register_0000151c;
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [64];
  float fVar387;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  float in_register_0000159c;
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  float in_register_000015dc;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b0c;
  float local_b00;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  RTCFilterFunctionNArguments local_a98;
  int local_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 auStack_a50 [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_950;
  float local_948;
  float local_944;
  undefined4 local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar10 = prim[1];
  uVar95 = (ulong)(byte)PVar10;
  lVar93 = uVar95 * 5;
  fVar193 = *(float *)(prim + uVar95 * 0x19 + 0x12);
  auVar106 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar95 * 0x19 + 6));
  auVar240._0_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar240._4_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar240._8_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar240._12_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 10)));
  auVar139._0_4_ = fVar193 * auVar106._0_4_;
  auVar139._4_4_ = fVar193 * auVar106._4_4_;
  auVar139._8_4_ = fVar193 * auVar106._8_4_;
  auVar139._12_4_ = fVar193 * auVar106._12_4_;
  auVar110._16_16_ = auVar29;
  auVar110._0_16_ = auVar101;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar93 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar93 + 10)));
  auVar177._16_16_ = auVar29;
  auVar177._0_16_ = auVar101;
  auVar164 = vcvtdq2ps_avx(auVar177);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 10)));
  auVar206._16_16_ = auVar29;
  auVar206._0_16_ = auVar101;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xb + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xb + 10)));
  auVar17 = vcvtdq2ps_avx(auVar206);
  auVar207._16_16_ = auVar29;
  auVar207._0_16_ = auVar101;
  auVar18 = vcvtdq2ps_avx(auVar207);
  uVar94 = (ulong)((uint)(byte)PVar10 * 0xc);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 10)));
  auVar270._16_16_ = auVar29;
  auVar270._0_16_ = auVar101;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar95 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar270);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar95 + 10)));
  auVar295._16_16_ = auVar29;
  auVar295._0_16_ = auVar101;
  lVar13 = uVar95 * 9;
  uVar94 = (ulong)(uint)((int)lVar13 * 2);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar156 = vcvtdq2ps_avx(auVar295);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 10)));
  auVar296._16_16_ = auVar29;
  auVar296._0_16_ = auVar101;
  auVar180 = vcvtdq2ps_avx(auVar296);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar95 + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar95 + 10)));
  auVar332._16_16_ = auVar29;
  auVar332._0_16_ = auVar101;
  uVar94 = (ulong)(uint)((int)lVar93 << 2);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 10)));
  auVar20 = vcvtdq2ps_avx(auVar332);
  auVar350._16_16_ = auVar29;
  auVar350._0_16_ = auVar101;
  auVar21 = vcvtdq2ps_avx(auVar350);
  auVar101 = vshufps_avx(auVar240,auVar240,0);
  auVar29 = vshufps_avx(auVar240,auVar240,0x55);
  auVar106 = vshufps_avx(auVar240,auVar240,0xaa);
  fVar193 = auVar106._0_4_;
  fVar213 = auVar106._4_4_;
  fVar214 = auVar106._8_4_;
  fVar215 = auVar106._12_4_;
  fVar216 = auVar29._0_4_;
  fVar217 = auVar29._4_4_;
  fVar218 = auVar29._8_4_;
  fVar219 = auVar29._12_4_;
  fVar231 = auVar101._0_4_;
  fVar232 = auVar101._4_4_;
  fVar233 = auVar101._8_4_;
  fVar234 = auVar101._12_4_;
  auVar375._0_4_ = fVar231 * auVar110._0_4_ + fVar216 * auVar164._0_4_ + fVar193 * auVar17._0_4_;
  auVar375._4_4_ = fVar232 * auVar110._4_4_ + fVar217 * auVar164._4_4_ + fVar213 * auVar17._4_4_;
  auVar375._8_4_ = fVar233 * auVar110._8_4_ + fVar218 * auVar164._8_4_ + fVar214 * auVar17._8_4_;
  auVar375._12_4_ = fVar234 * auVar110._12_4_ + fVar219 * auVar164._12_4_ + fVar215 * auVar17._12_4_
  ;
  auVar375._16_4_ = fVar231 * auVar110._16_4_ + fVar216 * auVar164._16_4_ + fVar193 * auVar17._16_4_
  ;
  auVar375._20_4_ = fVar232 * auVar110._20_4_ + fVar217 * auVar164._20_4_ + fVar213 * auVar17._20_4_
  ;
  auVar375._24_4_ = fVar233 * auVar110._24_4_ + fVar218 * auVar164._24_4_ + fVar214 * auVar17._24_4_
  ;
  auVar375._28_4_ = fVar219 + in_register_000015dc + in_register_0000151c;
  auVar362._0_4_ = fVar231 * auVar18._0_4_ + fVar216 * auVar19._0_4_ + auVar156._0_4_ * fVar193;
  auVar362._4_4_ = fVar232 * auVar18._4_4_ + fVar217 * auVar19._4_4_ + auVar156._4_4_ * fVar213;
  auVar362._8_4_ = fVar233 * auVar18._8_4_ + fVar218 * auVar19._8_4_ + auVar156._8_4_ * fVar214;
  auVar362._12_4_ = fVar234 * auVar18._12_4_ + fVar219 * auVar19._12_4_ + auVar156._12_4_ * fVar215;
  auVar362._16_4_ = fVar231 * auVar18._16_4_ + fVar216 * auVar19._16_4_ + auVar156._16_4_ * fVar193;
  auVar362._20_4_ = fVar232 * auVar18._20_4_ + fVar217 * auVar19._20_4_ + auVar156._20_4_ * fVar213;
  auVar362._24_4_ = fVar233 * auVar18._24_4_ + fVar218 * auVar19._24_4_ + auVar156._24_4_ * fVar214;
  auVar362._28_4_ = fVar219 + in_register_000015dc + in_register_0000159c;
  auVar246._0_4_ = fVar231 * auVar180._0_4_ + fVar216 * auVar20._0_4_ + auVar21._0_4_ * fVar193;
  auVar246._4_4_ = fVar232 * auVar180._4_4_ + fVar217 * auVar20._4_4_ + auVar21._4_4_ * fVar213;
  auVar246._8_4_ = fVar233 * auVar180._8_4_ + fVar218 * auVar20._8_4_ + auVar21._8_4_ * fVar214;
  auVar246._12_4_ = fVar234 * auVar180._12_4_ + fVar219 * auVar20._12_4_ + auVar21._12_4_ * fVar215;
  auVar246._16_4_ = fVar231 * auVar180._16_4_ + fVar216 * auVar20._16_4_ + auVar21._16_4_ * fVar193;
  auVar246._20_4_ = fVar232 * auVar180._20_4_ + fVar217 * auVar20._20_4_ + auVar21._20_4_ * fVar213;
  auVar246._24_4_ = fVar233 * auVar180._24_4_ + fVar218 * auVar20._24_4_ + auVar21._24_4_ * fVar214;
  auVar246._28_4_ = fVar234 + fVar219 + fVar215;
  auVar101 = vshufps_avx(auVar139,auVar139,0);
  auVar29 = vshufps_avx(auVar139,auVar139,0x55);
  auVar106 = vshufps_avx(auVar139,auVar139,0xaa);
  fVar213 = auVar106._0_4_;
  fVar214 = auVar106._4_4_;
  fVar215 = auVar106._8_4_;
  fVar216 = auVar106._12_4_;
  fVar232 = auVar29._0_4_;
  fVar233 = auVar29._4_4_;
  fVar234 = auVar29._8_4_;
  fVar235 = auVar29._12_4_;
  fVar217 = auVar101._0_4_;
  fVar218 = auVar101._4_4_;
  fVar219 = auVar101._8_4_;
  fVar231 = auVar101._12_4_;
  fVar193 = auVar110._28_4_;
  auVar271._0_4_ = fVar217 * auVar110._0_4_ + fVar232 * auVar164._0_4_ + fVar213 * auVar17._0_4_;
  auVar271._4_4_ = fVar218 * auVar110._4_4_ + fVar233 * auVar164._4_4_ + fVar214 * auVar17._4_4_;
  auVar271._8_4_ = fVar219 * auVar110._8_4_ + fVar234 * auVar164._8_4_ + fVar215 * auVar17._8_4_;
  auVar271._12_4_ = fVar231 * auVar110._12_4_ + fVar235 * auVar164._12_4_ + fVar216 * auVar17._12_4_
  ;
  auVar271._16_4_ = fVar217 * auVar110._16_4_ + fVar232 * auVar164._16_4_ + fVar213 * auVar17._16_4_
  ;
  auVar271._20_4_ = fVar218 * auVar110._20_4_ + fVar233 * auVar164._20_4_ + fVar214 * auVar17._20_4_
  ;
  auVar271._24_4_ = fVar219 * auVar110._24_4_ + fVar234 * auVar164._24_4_ + fVar215 * auVar17._24_4_
  ;
  auVar271._28_4_ = fVar193 + auVar164._28_4_ + auVar17._28_4_;
  auVar151._0_4_ = fVar217 * auVar18._0_4_ + auVar156._0_4_ * fVar213 + fVar232 * auVar19._0_4_;
  auVar151._4_4_ = fVar218 * auVar18._4_4_ + auVar156._4_4_ * fVar214 + fVar233 * auVar19._4_4_;
  auVar151._8_4_ = fVar219 * auVar18._8_4_ + auVar156._8_4_ * fVar215 + fVar234 * auVar19._8_4_;
  auVar151._12_4_ = fVar231 * auVar18._12_4_ + auVar156._12_4_ * fVar216 + fVar235 * auVar19._12_4_;
  auVar151._16_4_ = fVar217 * auVar18._16_4_ + auVar156._16_4_ * fVar213 + fVar232 * auVar19._16_4_;
  auVar151._20_4_ = fVar218 * auVar18._20_4_ + auVar156._20_4_ * fVar214 + fVar233 * auVar19._20_4_;
  auVar151._24_4_ = fVar219 * auVar18._24_4_ + auVar156._24_4_ * fVar215 + fVar234 * auVar19._24_4_;
  auVar151._28_4_ = fVar193 + auVar156._28_4_ + auVar17._28_4_;
  auVar297._8_4_ = 0x7fffffff;
  auVar297._0_8_ = 0x7fffffff7fffffff;
  auVar297._12_4_ = 0x7fffffff;
  auVar297._16_4_ = 0x7fffffff;
  auVar297._20_4_ = 0x7fffffff;
  auVar297._24_4_ = 0x7fffffff;
  auVar297._28_4_ = 0x7fffffff;
  auVar333._8_4_ = 0x219392ef;
  auVar333._0_8_ = 0x219392ef219392ef;
  auVar333._12_4_ = 0x219392ef;
  auVar333._16_4_ = 0x219392ef;
  auVar333._20_4_ = 0x219392ef;
  auVar333._24_4_ = 0x219392ef;
  auVar333._28_4_ = 0x219392ef;
  auVar110 = vandps_avx(auVar375,auVar297);
  auVar110 = vcmpps_avx(auVar110,auVar333,1);
  auVar164 = vblendvps_avx(auVar375,auVar333,auVar110);
  auVar110 = vandps_avx(auVar362,auVar297);
  auVar110 = vcmpps_avx(auVar110,auVar333,1);
  auVar17 = vblendvps_avx(auVar362,auVar333,auVar110);
  auVar110 = vandps_avx(auVar246,auVar297);
  auVar110 = vcmpps_avx(auVar110,auVar333,1);
  auVar110 = vblendvps_avx(auVar246,auVar333,auVar110);
  auVar178._0_4_ = fVar232 * auVar20._0_4_ + auVar21._0_4_ * fVar213 + fVar217 * auVar180._0_4_;
  auVar178._4_4_ = fVar233 * auVar20._4_4_ + auVar21._4_4_ * fVar214 + fVar218 * auVar180._4_4_;
  auVar178._8_4_ = fVar234 * auVar20._8_4_ + auVar21._8_4_ * fVar215 + fVar219 * auVar180._8_4_;
  auVar178._12_4_ = fVar235 * auVar20._12_4_ + auVar21._12_4_ * fVar216 + fVar231 * auVar180._12_4_;
  auVar178._16_4_ = fVar232 * auVar20._16_4_ + auVar21._16_4_ * fVar213 + fVar217 * auVar180._16_4_;
  auVar178._20_4_ = fVar233 * auVar20._20_4_ + auVar21._20_4_ * fVar214 + fVar218 * auVar180._20_4_;
  auVar178._24_4_ = fVar234 * auVar20._24_4_ + auVar21._24_4_ * fVar215 + fVar219 * auVar180._24_4_;
  auVar178._28_4_ = auVar19._28_4_ + fVar216 + fVar193;
  auVar18 = vrcpps_avx(auVar164);
  fVar193 = auVar18._0_4_;
  fVar213 = auVar18._4_4_;
  auVar19._4_4_ = auVar164._4_4_ * fVar213;
  auVar19._0_4_ = auVar164._0_4_ * fVar193;
  fVar214 = auVar18._8_4_;
  auVar19._8_4_ = auVar164._8_4_ * fVar214;
  fVar215 = auVar18._12_4_;
  auVar19._12_4_ = auVar164._12_4_ * fVar215;
  fVar216 = auVar18._16_4_;
  auVar19._16_4_ = auVar164._16_4_ * fVar216;
  fVar217 = auVar18._20_4_;
  auVar19._20_4_ = auVar164._20_4_ * fVar217;
  fVar218 = auVar18._24_4_;
  auVar19._24_4_ = auVar164._24_4_ * fVar218;
  auVar19._28_4_ = auVar164._28_4_;
  auVar319._8_4_ = 0x3f800000;
  auVar319._0_8_ = 0x3f8000003f800000;
  auVar319._12_4_ = 0x3f800000;
  auVar319._16_4_ = 0x3f800000;
  auVar319._20_4_ = 0x3f800000;
  auVar319._24_4_ = 0x3f800000;
  auVar319._28_4_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar319,auVar19);
  auVar164 = vrcpps_avx(auVar17);
  fVar193 = fVar193 + fVar193 * auVar19._0_4_;
  fVar213 = fVar213 + fVar213 * auVar19._4_4_;
  fVar214 = fVar214 + fVar214 * auVar19._8_4_;
  fVar215 = fVar215 + fVar215 * auVar19._12_4_;
  fVar216 = fVar216 + fVar216 * auVar19._16_4_;
  fVar217 = fVar217 + fVar217 * auVar19._20_4_;
  fVar218 = fVar218 + fVar218 * auVar19._24_4_;
  fVar239 = auVar164._0_4_;
  fVar256 = auVar164._4_4_;
  auVar156._4_4_ = fVar256 * auVar17._4_4_;
  auVar156._0_4_ = fVar239 * auVar17._0_4_;
  fVar257 = auVar164._8_4_;
  auVar156._8_4_ = fVar257 * auVar17._8_4_;
  fVar258 = auVar164._12_4_;
  auVar156._12_4_ = fVar258 * auVar17._12_4_;
  fVar259 = auVar164._16_4_;
  auVar156._16_4_ = fVar259 * auVar17._16_4_;
  fVar260 = auVar164._20_4_;
  auVar156._20_4_ = fVar260 * auVar17._20_4_;
  fVar262 = auVar164._24_4_;
  auVar156._24_4_ = fVar262 * auVar17._24_4_;
  auVar156._28_4_ = auVar18._28_4_;
  auVar164 = vsubps_avx(auVar319,auVar156);
  fVar239 = fVar239 + fVar239 * auVar164._0_4_;
  fVar256 = fVar256 + fVar256 * auVar164._4_4_;
  fVar257 = fVar257 + fVar257 * auVar164._8_4_;
  fVar258 = fVar258 + fVar258 * auVar164._12_4_;
  fVar259 = fVar259 + fVar259 * auVar164._16_4_;
  fVar260 = fVar260 + fVar260 * auVar164._20_4_;
  fVar262 = fVar262 + fVar262 * auVar164._24_4_;
  auVar164 = vrcpps_avx(auVar110);
  fVar219 = auVar164._0_4_;
  fVar231 = auVar164._4_4_;
  auVar180._4_4_ = fVar231 * auVar110._4_4_;
  auVar180._0_4_ = fVar219 * auVar110._0_4_;
  fVar232 = auVar164._8_4_;
  auVar180._8_4_ = fVar232 * auVar110._8_4_;
  fVar233 = auVar164._12_4_;
  auVar180._12_4_ = fVar233 * auVar110._12_4_;
  fVar234 = auVar164._16_4_;
  auVar180._16_4_ = fVar234 * auVar110._16_4_;
  fVar235 = auVar164._20_4_;
  auVar180._20_4_ = fVar235 * auVar110._20_4_;
  fVar237 = auVar164._24_4_;
  auVar180._24_4_ = fVar237 * auVar110._24_4_;
  auVar180._28_4_ = auVar17._28_4_;
  auVar110 = vsubps_avx(auVar319,auVar180);
  fVar219 = fVar219 + fVar219 * auVar110._0_4_;
  fVar231 = fVar231 + fVar231 * auVar110._4_4_;
  fVar232 = fVar232 + fVar232 * auVar110._8_4_;
  fVar233 = fVar233 + fVar233 * auVar110._12_4_;
  fVar234 = fVar234 + fVar234 * auVar110._16_4_;
  fVar235 = fVar235 + fVar235 * auVar110._20_4_;
  fVar237 = fVar237 + fVar237 * auVar110._24_4_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar95 * 7 + 6);
  auVar101 = vpmovsxwd_avx(auVar101);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar95 * 7 + 0xe);
  auVar29 = vpmovsxwd_avx(auVar29);
  auVar111._16_16_ = auVar29;
  auVar111._0_16_ = auVar101;
  auVar110 = vcvtdq2ps_avx(auVar111);
  auVar110 = vsubps_avx(auVar110,auVar271);
  auVar99._0_4_ = fVar193 * auVar110._0_4_;
  auVar99._4_4_ = fVar213 * auVar110._4_4_;
  auVar99._8_4_ = fVar214 * auVar110._8_4_;
  auVar99._12_4_ = fVar215 * auVar110._12_4_;
  auVar17._16_4_ = fVar216 * auVar110._16_4_;
  auVar17._0_16_ = auVar99;
  auVar17._20_4_ = fVar217 * auVar110._20_4_;
  auVar17._24_4_ = fVar218 * auVar110._24_4_;
  auVar17._28_4_ = auVar110._28_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + lVar13 + 6);
  auVar101 = vpmovsxwd_avx(auVar106);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + lVar13 + 0xe);
  auVar29 = vpmovsxwd_avx(auVar146);
  auVar298._16_16_ = auVar29;
  auVar298._0_16_ = auVar101;
  auVar110 = vcvtdq2ps_avx(auVar298);
  auVar110 = vsubps_avx(auVar110,auVar271);
  auVar194._0_4_ = fVar193 * auVar110._0_4_;
  auVar194._4_4_ = fVar213 * auVar110._4_4_;
  auVar194._8_4_ = fVar214 * auVar110._8_4_;
  auVar194._12_4_ = fVar215 * auVar110._12_4_;
  auVar20._16_4_ = fVar216 * auVar110._16_4_;
  auVar20._0_16_ = auVar194;
  auVar20._20_4_ = fVar217 * auVar110._20_4_;
  auVar20._24_4_ = fVar218 * auVar110._24_4_;
  auVar20._28_4_ = auVar18._28_4_ + auVar19._28_4_;
  lVar93 = (ulong)(byte)PVar10 * 0x10;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + lVar93 + 6);
  auVar101 = vpmovsxwd_avx(auVar105);
  auVar330._8_8_ = 0;
  auVar330._0_8_ = *(ulong *)(prim + lVar93 + 0xe);
  auVar29 = vpmovsxwd_avx(auVar330);
  lVar93 = lVar93 + uVar95 * -2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar93 + 6);
  auVar106 = vpmovsxwd_avx(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar93 + 0xe);
  auVar146 = vpmovsxwd_avx(auVar6);
  auVar272._16_16_ = auVar146;
  auVar272._0_16_ = auVar106;
  auVar110 = vcvtdq2ps_avx(auVar272);
  auVar110 = vsubps_avx(auVar110,auVar151);
  auVar266._0_4_ = fVar239 * auVar110._0_4_;
  auVar266._4_4_ = fVar256 * auVar110._4_4_;
  auVar266._8_4_ = fVar257 * auVar110._8_4_;
  auVar266._12_4_ = fVar258 * auVar110._12_4_;
  auVar164._16_4_ = fVar259 * auVar110._16_4_;
  auVar164._0_16_ = auVar266;
  auVar164._20_4_ = fVar260 * auVar110._20_4_;
  auVar164._24_4_ = fVar262 * auVar110._24_4_;
  auVar164._28_4_ = auVar110._28_4_;
  auVar299._16_16_ = auVar29;
  auVar299._0_16_ = auVar101;
  auVar110 = vcvtdq2ps_avx(auVar299);
  auVar110 = vsubps_avx(auVar110,auVar151);
  auVar140._0_4_ = fVar239 * auVar110._0_4_;
  auVar140._4_4_ = fVar256 * auVar110._4_4_;
  auVar140._8_4_ = fVar257 * auVar110._8_4_;
  auVar140._12_4_ = fVar258 * auVar110._12_4_;
  auVar18._16_4_ = fVar259 * auVar110._16_4_;
  auVar18._0_16_ = auVar140;
  auVar18._20_4_ = fVar260 * auVar110._20_4_;
  auVar18._24_4_ = fVar262 * auVar110._24_4_;
  auVar18._28_4_ = auVar110._28_4_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar94 + uVar95 + 6);
  auVar101 = vpmovsxwd_avx(auVar108);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar94 + uVar95 + 0xe);
  auVar29 = vpmovsxwd_avx(auVar7);
  auVar247._16_16_ = auVar29;
  auVar247._0_16_ = auVar101;
  auVar110 = vcvtdq2ps_avx(auVar247);
  auVar110 = vsubps_avx(auVar110,auVar178);
  auVar241._0_4_ = fVar219 * auVar110._0_4_;
  auVar241._4_4_ = fVar231 * auVar110._4_4_;
  auVar241._8_4_ = fVar232 * auVar110._8_4_;
  auVar241._12_4_ = fVar233 * auVar110._12_4_;
  auVar21._16_4_ = fVar234 * auVar110._16_4_;
  auVar21._0_16_ = auVar241;
  auVar21._20_4_ = fVar235 * auVar110._20_4_;
  auVar21._24_4_ = fVar237 * auVar110._24_4_;
  auVar21._28_4_ = auVar110._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar95 * 0x17 + 6);
  auVar101 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar95 * 0x17 + 0xe);
  auVar29 = vpmovsxwd_avx(auVar9);
  auVar300._16_16_ = auVar29;
  auVar300._0_16_ = auVar101;
  auVar110 = vcvtdq2ps_avx(auVar300);
  auVar110 = vsubps_avx(auVar110,auVar178);
  auVar170._0_4_ = fVar219 * auVar110._0_4_;
  auVar170._4_4_ = fVar231 * auVar110._4_4_;
  auVar170._8_4_ = fVar232 * auVar110._8_4_;
  auVar170._12_4_ = fVar233 * auVar110._12_4_;
  auVar30._16_4_ = fVar234 * auVar110._16_4_;
  auVar30._0_16_ = auVar170;
  auVar30._20_4_ = fVar235 * auVar110._20_4_;
  auVar30._24_4_ = fVar237 * auVar110._24_4_;
  auVar30._28_4_ = auVar110._28_4_;
  auVar101 = vpminsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar29 = vpminsd_avx(auVar99,auVar194);
  auVar320._16_16_ = auVar101;
  auVar320._0_16_ = auVar29;
  auVar105 = auVar164._16_16_;
  auVar359 = ZEXT1664(auVar105);
  auVar101 = vpminsd_avx(auVar105,auVar18._16_16_);
  auVar29 = vpminsd_avx(auVar266,auVar140);
  auVar363._16_16_ = auVar101;
  auVar363._0_16_ = auVar29;
  auVar110 = vmaxps_avx(auVar320,auVar363);
  auVar106 = auVar30._16_16_;
  auVar366 = ZEXT1664(auVar106);
  auVar146 = auVar21._16_16_;
  auVar380 = ZEXT1664(auVar146);
  auVar101 = vpminsd_avx(auVar146,auVar106);
  auVar29 = vpminsd_avx(auVar241,auVar170);
  auVar388._16_16_ = auVar101;
  auVar388._0_16_ = auVar29;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar398._4_4_ = uVar1;
  auVar398._0_4_ = uVar1;
  auVar398._8_4_ = uVar1;
  auVar398._12_4_ = uVar1;
  auVar398._16_4_ = uVar1;
  auVar398._20_4_ = uVar1;
  auVar398._24_4_ = uVar1;
  auVar398._28_4_ = uVar1;
  auVar164 = vmaxps_avx(auVar388,auVar398);
  auVar110 = vmaxps_avx(auVar110,auVar164);
  local_2c0._4_4_ = auVar110._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar110._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar110._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar110._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar110._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar110._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar110._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar110._28_4_;
  auVar101 = vpmaxsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar29 = vpmaxsd_avx(auVar99,auVar194);
  auVar112._16_16_ = auVar101;
  auVar112._0_16_ = auVar29;
  auVar101 = vpmaxsd_avx(auVar105,auVar18._16_16_);
  auVar29 = vpmaxsd_avx(auVar266,auVar140);
  auVar152._16_16_ = auVar101;
  auVar152._0_16_ = auVar29;
  auVar110 = vminps_avx(auVar112,auVar152);
  auVar101 = vpmaxsd_avx(auVar146,auVar106);
  auVar29 = vpmaxsd_avx(auVar241,auVar170);
  fVar193 = (ray->super_RayK<1>).tfar;
  auVar208._4_4_ = fVar193;
  auVar208._0_4_ = fVar193;
  auVar208._8_4_ = fVar193;
  auVar208._12_4_ = fVar193;
  auVar208._16_4_ = fVar193;
  auVar208._20_4_ = fVar193;
  auVar208._24_4_ = fVar193;
  auVar208._28_4_ = fVar193;
  auVar153._16_16_ = auVar101;
  auVar153._0_16_ = auVar29;
  auVar164 = vminps_avx(auVar153,auVar208);
  auVar110 = vminps_avx(auVar110,auVar164);
  auVar116._4_4_ = auVar110._4_4_ * 1.0000004;
  auVar116._0_4_ = auVar110._0_4_ * 1.0000004;
  auVar116._8_4_ = auVar110._8_4_ * 1.0000004;
  auVar116._12_4_ = auVar110._12_4_ * 1.0000004;
  auVar116._16_4_ = auVar110._16_4_ * 1.0000004;
  auVar116._20_4_ = auVar110._20_4_ * 1.0000004;
  auVar116._24_4_ = auVar110._24_4_ * 1.0000004;
  auVar116._28_4_ = auVar110._28_4_;
  auVar110 = vcmpps_avx(local_2c0,auVar116,2);
  auVar101 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar154._16_16_ = auVar101;
  auVar154._0_16_ = auVar101;
  auVar164 = vcvtdq2ps_avx(auVar154);
  auVar164 = vcmpps_avx(_DAT_01faff40,auVar164,1);
  auVar110 = vandps_avx(auVar110,auVar164);
  uVar88 = vmovmskps_avx(auVar110);
  if (uVar88 == 0) {
    return;
  }
  uVar88 = uVar88 & 0xff;
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  local_460 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
LAB_010bf2f6:
  uVar95 = (ulong)uVar88;
  lVar93 = 0;
  if (uVar95 != 0) {
    for (; (uVar88 >> lVar93 & 1) == 0; lVar93 = lVar93 + 1) {
    }
  }
  uVar95 = uVar95 - 1 & uVar95;
  uVar88 = *(uint *)(prim + 2);
  pGVar11 = (context->scene->geometries).items[uVar88].ptr;
  uVar94 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar93 * 4 + 6));
  p_Var12 = pGVar11[1].intersectionFilterN;
  lVar13 = *(long *)&pGVar11[1].time_range.upper;
  auVar101 = *(undefined1 (*) [16])(lVar13 + (long)p_Var12 * uVar94);
  auVar29 = *(undefined1 (*) [16])(lVar13 + (uVar94 + 1) * (long)p_Var12);
  auVar106 = *(undefined1 (*) [16])(lVar13 + (uVar94 + 2) * (long)p_Var12);
  lVar14 = 0;
  if (uVar95 != 0) {
    for (; (uVar95 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
    }
  }
  auVar146 = *(undefined1 (*) [16])(lVar13 + (uVar94 + 3) * (long)p_Var12);
  if (((uVar95 != 0) && (uVar94 = uVar95 - 1 & uVar95, uVar94 != 0)) && (lVar13 = 0, uVar94 != 0)) {
    for (; (uVar94 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  auVar100._0_4_ = (auVar101._0_4_ + auVar29._0_4_ + auVar106._0_4_ + auVar146._0_4_) * 0.25;
  auVar100._4_4_ = (auVar101._4_4_ + auVar29._4_4_ + auVar106._4_4_ + auVar146._4_4_) * 0.25;
  auVar100._8_4_ = (auVar101._8_4_ + auVar29._8_4_ + auVar106._8_4_ + auVar146._8_4_) * 0.25;
  auVar100._12_4_ = (auVar101._12_4_ + auVar29._12_4_ + auVar106._12_4_ + auVar146._12_4_) * 0.25;
  aVar3 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar105 = vsubps_avx(auVar100,(undefined1  [16])aVar3);
  auVar105 = vdpps_avx(auVar105,(undefined1  [16])aVar4,0x7f);
  auVar330 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  auVar5 = vrcpss_avx(auVar330,auVar330);
  auVar335 = ZEXT464(0x40000000);
  fVar193 = auVar105._0_4_ * auVar5._0_4_ * (2.0 - auVar5._0_4_ * auVar330._0_4_);
  local_7f0 = ZEXT416((uint)fVar193);
  auVar330 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
  fVar193 = aVar4.x;
  fVar213 = aVar4.y;
  fVar214 = aVar4.z;
  aVar167 = aVar4.field_3;
  auVar267._0_4_ = aVar3.x + fVar193 * auVar330._0_4_;
  auVar267._4_4_ = aVar3.y + fVar213 * auVar330._4_4_;
  auVar267._8_4_ = aVar3.z + fVar214 * auVar330._8_4_;
  auVar267._12_4_ = aVar3.field_3.w + aVar167.w * auVar330._12_4_;
  auVar105 = vblendps_avx(auVar267,_DAT_01f7aa10,8);
  _local_9f0 = vsubps_avx(auVar101,auVar105);
  _local_a00 = vsubps_avx(auVar106,auVar105);
  auVar255 = ZEXT1664(_local_a00);
  _local_a10 = vsubps_avx(auVar29,auVar105);
  auVar304 = ZEXT1664(_local_a10);
  _local_a20 = vsubps_avx(auVar146,auVar105);
  auVar101 = vshufps_avx(_local_9f0,_local_9f0,0);
  register0x00001290 = auVar101;
  _local_1e0 = auVar101;
  auVar101 = vshufps_avx(_local_9f0,_local_9f0,0x55);
  register0x00001290 = auVar101;
  _local_200 = auVar101;
  auVar101 = vshufps_avx(_local_9f0,_local_9f0,0xaa);
  register0x00001290 = auVar101;
  _local_220 = auVar101;
  auVar101 = vshufps_avx(_local_9f0,_local_9f0,0xff);
  register0x00001290 = auVar101;
  _local_240 = auVar101;
  auVar101 = vshufps_avx(_local_a10,_local_a10,0);
  register0x00001290 = auVar101;
  _local_260 = auVar101;
  auVar101 = vshufps_avx(_local_a10,_local_a10,0x55);
  register0x00001290 = auVar101;
  _local_280 = auVar101;
  auVar101 = vshufps_avx(_local_a10,_local_a10,0xaa);
  register0x00001290 = auVar101;
  _local_320 = auVar101;
  auVar141._0_4_ = fVar193 * fVar193;
  auVar141._4_4_ = fVar213 * fVar213;
  auVar141._8_4_ = fVar214 * fVar214;
  auVar141._12_4_ = aVar167.w * aVar167.w;
  auVar101 = vshufps_avx(auVar141,auVar141,0xaa);
  auVar29 = vshufps_avx(auVar141,auVar141,0x55);
  auVar106 = vshufps_avx(_local_a10,_local_a10,0xff);
  register0x000012d0 = auVar106;
  _local_340 = auVar106;
  auVar106 = vshufps_avx(auVar141,auVar141,0);
  local_2a0._0_4_ = auVar106._0_4_ + auVar29._0_4_ + auVar101._0_4_;
  local_2a0._4_4_ = auVar106._4_4_ + auVar29._4_4_ + auVar101._4_4_;
  local_2a0._8_4_ = auVar106._8_4_ + auVar29._8_4_ + auVar101._8_4_;
  local_2a0._12_4_ = auVar106._12_4_ + auVar29._12_4_ + auVar101._12_4_;
  local_2a0._16_4_ = auVar106._0_4_ + auVar29._0_4_ + auVar101._0_4_;
  local_2a0._20_4_ = auVar106._4_4_ + auVar29._4_4_ + auVar101._4_4_;
  local_2a0._24_4_ = auVar106._8_4_ + auVar29._8_4_ + auVar101._8_4_;
  local_2a0._28_4_ = auVar106._12_4_ + auVar29._12_4_ + auVar101._12_4_;
  auVar279 = ZEXT3264(local_2a0);
  auVar101 = vshufps_avx(_local_a00,_local_a00,0);
  register0x00001250 = auVar101;
  _local_360 = auVar101;
  auVar101 = vshufps_avx(_local_a00,_local_a00,0x55);
  register0x00001250 = auVar101;
  _local_380 = auVar101;
  auVar101 = vshufps_avx(_local_a00,_local_a00,0xaa);
  register0x00001250 = auVar101;
  _local_3a0 = auVar101;
  auVar101 = vshufps_avx(_local_a00,_local_a00,0xff);
  register0x00001250 = auVar101;
  _local_3c0 = auVar101;
  auVar101 = vshufps_avx(_local_a20,_local_a20,0);
  register0x00001250 = auVar101;
  _local_3e0 = auVar101;
  auVar101 = vshufps_avx(_local_a20,_local_a20,0x55);
  register0x00001250 = auVar101;
  _local_400 = auVar101;
  auVar101 = vshufps_avx(_local_a20,_local_a20,0xaa);
  register0x00001250 = auVar101;
  _local_420 = auVar101;
  auVar101 = vshufps_avx(_local_a20,_local_a20,0xff);
  local_440._16_16_ = auVar101;
  local_440._0_16_ = auVar101;
  register0x00001210 = auVar330;
  _local_760 = auVar330;
  local_b0c = 1;
  uVar97 = 0;
  local_580 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  local_5a0 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  local_5c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  local_480 = vandps_avx(local_2a0,auVar114);
  local_530 = ZEXT816(0x3f80000000000000);
  uVar94 = (ulong)*(uint *)(prim + lVar93 * 4 + 6);
  do {
    auVar228._8_4_ = 0x3f800000;
    auVar228._0_8_ = 0x3f8000003f800000;
    auVar228._12_4_ = 0x3f800000;
    auVar228._16_4_ = 0x3f800000;
    auVar228._20_4_ = 0x3f800000;
    iVar96 = (int)uVar97;
    auVar228._24_4_ = 0x3f800000;
    auVar228._28_4_ = 0x3f800000;
    auVar101 = vmovshdup_avx(local_530);
    auVar106 = vsubps_avx(auVar101,local_530);
    auVar101 = vshufps_avx(local_530,local_530,0);
    local_8a0._16_16_ = auVar101;
    local_8a0._0_16_ = auVar101;
    auVar29 = vshufps_avx(auVar106,auVar106,0);
    _fStack_790 = auVar29;
    _local_7a0 = auVar29;
    fVar138 = auVar29._0_4_;
    fVar165 = auVar29._4_4_;
    fVar166 = auVar29._8_4_;
    fVar168 = auVar29._12_4_;
    fVar169 = auVar101._0_4_;
    auVar209._0_4_ = fVar169 + fVar138 * 0.0;
    fVar190 = auVar101._4_4_;
    auVar209._4_4_ = fVar190 + fVar165 * 0.14285715;
    fVar191 = auVar101._8_4_;
    auVar209._8_4_ = fVar191 + fVar166 * 0.2857143;
    fVar192 = auVar101._12_4_;
    auVar209._12_4_ = fVar192 + fVar168 * 0.42857146;
    auVar209._16_4_ = fVar169 + fVar138 * 0.5714286;
    auVar209._20_4_ = fVar190 + fVar165 * 0.71428573;
    auVar209._24_4_ = fVar191 + fVar166 * 0.8571429;
    auVar209._28_4_ = fVar192 + fVar168;
    auVar110 = vsubps_avx(auVar228,auVar209);
    fVar213 = auVar110._0_4_;
    fVar214 = auVar110._4_4_;
    fVar215 = auVar110._8_4_;
    fVar216 = auVar110._12_4_;
    fVar217 = auVar110._16_4_;
    fVar218 = auVar110._20_4_;
    fVar219 = auVar110._24_4_;
    fVar234 = fVar213 * fVar213 * fVar213;
    fVar239 = fVar214 * fVar214 * fVar214;
    fVar257 = fVar215 * fVar215 * fVar215;
    fVar282 = fVar216 * fVar216 * fVar216;
    fVar285 = fVar217 * fVar217 * fVar217;
    fVar288 = fVar218 * fVar218 * fVar218;
    fVar291 = fVar219 * fVar219 * fVar219;
    fVar294 = auVar209._0_4_ * auVar209._0_4_ * auVar209._0_4_;
    fVar305 = auVar209._4_4_ * auVar209._4_4_ * auVar209._4_4_;
    fVar306 = auVar209._8_4_ * auVar209._8_4_ * auVar209._8_4_;
    fVar308 = auVar209._12_4_ * auVar209._12_4_ * auVar209._12_4_;
    fVar310 = auVar209._16_4_ * auVar209._16_4_ * auVar209._16_4_;
    fVar312 = auVar209._20_4_ * auVar209._20_4_ * auVar209._20_4_;
    fVar314 = auVar209._24_4_ * auVar209._24_4_ * auVar209._24_4_;
    fVar193 = auVar255._28_4_;
    fVar231 = auVar209._0_4_ * fVar213;
    fVar232 = auVar209._4_4_ * fVar214;
    fVar233 = auVar209._8_4_ * fVar215;
    fVar237 = auVar209._12_4_ * fVar216;
    fVar259 = auVar209._16_4_ * fVar217;
    fVar260 = auVar209._20_4_ * fVar218;
    fVar262 = auVar209._24_4_ * fVar219;
    fVar235 = auVar359._28_4_ + auVar380._28_4_;
    fVar327 = auVar304._28_4_ + fVar193 + fVar235;
    fVar348 = fVar235 + auVar279._28_4_ + auVar366._28_4_ + auVar335._28_4_;
    fVar235 = fVar234 * 0.16666667;
    fVar256 = fVar239 * 0.16666667;
    fVar258 = fVar257 * 0.16666667;
    fVar283 = fVar282 * 0.16666667;
    fVar286 = fVar285 * 0.16666667;
    fVar289 = fVar288 * 0.16666667;
    fVar292 = fVar291 * 0.16666667;
    fVar316 = (fVar294 + fVar234 * 4.0 + fVar213 * fVar231 * 12.0 + auVar209._0_4_ * fVar231 * 6.0)
              * 0.16666667;
    fVar321 = (fVar305 + fVar239 * 4.0 + fVar214 * fVar232 * 12.0 + auVar209._4_4_ * fVar232 * 6.0)
              * 0.16666667;
    fVar322 = (fVar306 + fVar257 * 4.0 + fVar215 * fVar233 * 12.0 + auVar209._8_4_ * fVar233 * 6.0)
              * 0.16666667;
    fVar323 = (fVar308 + fVar282 * 4.0 + fVar216 * fVar237 * 12.0 + auVar209._12_4_ * fVar237 * 6.0)
              * 0.16666667;
    fVar324 = (fVar310 + fVar285 * 4.0 + fVar217 * fVar259 * 12.0 + auVar209._16_4_ * fVar259 * 6.0)
              * 0.16666667;
    fVar325 = (fVar312 + fVar288 * 4.0 + fVar218 * fVar260 * 12.0 + auVar209._20_4_ * fVar260 * 6.0)
              * 0.16666667;
    fVar326 = (fVar314 + fVar291 * 4.0 + fVar219 * fVar262 * 12.0 + auVar209._24_4_ * fVar262 * 6.0)
              * 0.16666667;
    fVar234 = (fVar294 * 4.0 + fVar234 + auVar209._0_4_ * fVar231 * 12.0 + fVar213 * fVar231 * 6.0)
              * 0.16666667;
    fVar239 = (fVar305 * 4.0 + fVar239 + auVar209._4_4_ * fVar232 * 12.0 + fVar214 * fVar232 * 6.0)
              * 0.16666667;
    fVar257 = (fVar306 * 4.0 + fVar257 + auVar209._8_4_ * fVar233 * 12.0 + fVar215 * fVar233 * 6.0)
              * 0.16666667;
    fVar282 = (fVar308 * 4.0 + fVar282 + auVar209._12_4_ * fVar237 * 12.0 + fVar216 * fVar237 * 6.0)
              * 0.16666667;
    fVar285 = (fVar310 * 4.0 + fVar285 + auVar209._16_4_ * fVar259 * 12.0 + fVar217 * fVar259 * 6.0)
              * 0.16666667;
    fVar288 = (fVar312 * 4.0 + fVar288 + auVar209._20_4_ * fVar260 * 12.0 + fVar218 * fVar260 * 6.0)
              * 0.16666667;
    fVar291 = (fVar314 * 4.0 + fVar291 + auVar209._24_4_ * fVar262 * 12.0 + fVar219 * fVar262 * 6.0)
              * 0.16666667;
    fVar294 = fVar294 * 0.16666667;
    fVar305 = fVar305 * 0.16666667;
    fVar306 = fVar306 * 0.16666667;
    fVar308 = fVar308 * 0.16666667;
    fVar310 = fVar310 * 0.16666667;
    fVar312 = fVar312 * 0.16666667;
    fVar314 = fVar314 * 0.16666667;
    fVar373 = auVar366._28_4_ + 12.0;
    fVar349 = fVar348 + 12.166667;
    fVar360 = fVar373 + 12.166667;
    local_860 = (float)local_1e0._0_4_ * fVar235 +
                (float)local_260._0_4_ * fVar316 +
                fVar294 * (float)local_3e0._0_4_ + fVar234 * (float)local_360._0_4_;
    fStack_85c = (float)local_1e0._4_4_ * fVar256 +
                 (float)local_260._4_4_ * fVar321 +
                 fVar305 * (float)local_3e0._4_4_ + fVar239 * (float)local_360._4_4_;
    fStack_858 = fStack_1d8 * fVar258 +
                 fStack_258 * fVar322 + fVar306 * fStack_3d8 + fVar257 * fStack_358;
    fStack_854 = fStack_1d4 * fVar283 +
                 fStack_254 * fVar323 + fVar308 * fStack_3d4 + fVar282 * fStack_354;
    fStack_850 = fStack_1d0 * fVar286 +
                 fStack_250 * fVar324 + fVar310 * fStack_3d0 + fVar285 * fStack_350;
    fStack_84c = fStack_1cc * fVar289 +
                 fStack_24c * fVar325 + fVar312 * fStack_3cc + fVar288 * fStack_34c;
    fStack_848 = fStack_1c8 * fVar292 +
                 fStack_248 * fVar326 + fVar314 * fStack_3c8 + fVar291 * fStack_348;
    fStack_844 = fVar327 + fVar349;
    fVar98 = (float)local_200._0_4_ * fVar235 +
             (float)local_280._0_4_ * fVar316 +
             fVar294 * (float)local_400._0_4_ + fVar234 * (float)local_380._0_4_;
    fVar125 = (float)local_200._4_4_ * fVar256 +
              (float)local_280._4_4_ * fVar321 +
              fVar305 * (float)local_400._4_4_ + fVar239 * (float)local_380._4_4_;
    fVar127 = fStack_1f8 * fVar258 +
              fStack_278 * fVar322 + fVar306 * fStack_3f8 + fVar257 * fStack_378;
    fVar129 = fStack_1f4 * fVar283 +
              fStack_274 * fVar323 + fVar308 * fStack_3f4 + fVar282 * fStack_374;
    fVar131 = fStack_1f0 * fVar286 +
              fStack_270 * fVar324 + fVar310 * fStack_3f0 + fVar285 * fStack_370;
    fVar133 = fStack_1ec * fVar289 +
              fStack_26c * fVar325 + fVar312 * fStack_3ec + fVar288 * fStack_36c;
    fVar135 = fStack_1e8 * fVar292 +
              fStack_268 * fVar326 + fVar314 * fStack_3e8 + fVar291 * fStack_368;
    fVar137 = fVar327 + fVar360;
    local_840 = (float)local_220._0_4_ * fVar235 +
                fVar316 * (float)local_320._0_4_ +
                fVar294 * (float)local_420._0_4_ + fVar234 * (float)local_3a0._0_4_;
    fStack_83c = (float)local_220._4_4_ * fVar256 +
                 fVar321 * (float)local_320._4_4_ +
                 fVar305 * (float)local_420._4_4_ + fVar239 * (float)local_3a0._4_4_;
    fStack_838 = fStack_218 * fVar258 +
                 fVar322 * fStack_318 + fVar306 * fStack_418 + fVar257 * fStack_398;
    aStack_834.w = fStack_214 * fVar283 +
                   fVar323 * fStack_314 + fVar308 * fStack_414 + fVar282 * fStack_394;
    fStack_830 = fStack_210 * fVar286 +
                 fVar324 * fStack_310 + fVar310 * fStack_410 + fVar285 * fStack_390;
    fStack_82c = fStack_20c * fVar289 +
                 fVar325 * fStack_30c + fVar312 * fStack_40c + fVar288 * fStack_38c;
    fStack_828 = fStack_208 * fVar292 +
                 fVar326 * fStack_308 + fVar314 * fStack_408 + fVar291 * fStack_388;
    fStack_824 = fVar327 + fVar373 + auVar380._28_4_ + 12.0;
    local_ae0._0_4_ =
         (float)local_240._0_4_ * fVar235 +
         fVar316 * (float)local_340._0_4_ +
         fVar234 * (float)local_3c0._0_4_ + local_440._0_4_ * fVar294;
    local_ae0._4_4_ =
         (float)local_240._4_4_ * fVar256 +
         fVar321 * (float)local_340._4_4_ +
         fVar239 * (float)local_3c0._4_4_ + local_440._4_4_ * fVar305;
    fStack_ad8 = fStack_238 * fVar258 +
                 fVar322 * fStack_338 + fVar257 * fStack_3b8 + local_440._8_4_ * fVar306;
    fStack_ad4 = fStack_234 * fVar283 +
                 fVar323 * fStack_334 + fVar282 * fStack_3b4 + local_440._12_4_ * fVar308;
    fStack_ad0 = fStack_230 * fVar286 +
                 fVar324 * fStack_330 + fVar285 * fStack_3b0 + local_440._16_4_ * fVar310;
    fStack_acc = fStack_22c * fVar289 +
                 fVar325 * fStack_32c + fVar288 * fStack_3ac + local_440._20_4_ * fVar312;
    fStack_ac8 = fStack_228 * fVar292 +
                 fVar326 * fStack_328 + fVar291 * fStack_3a8 + local_440._24_4_ * fVar314;
    fStack_ac4 = auVar279._28_4_ + fVar327 + fVar348 + auVar304._28_4_;
    auVar31._4_4_ = auVar209._4_4_ * -auVar209._4_4_;
    auVar31._0_4_ = auVar209._0_4_ * -auVar209._0_4_;
    auVar31._8_4_ = auVar209._8_4_ * -auVar209._8_4_;
    auVar31._12_4_ = auVar209._12_4_ * -auVar209._12_4_;
    auVar31._16_4_ = auVar209._16_4_ * -auVar209._16_4_;
    auVar31._20_4_ = auVar209._20_4_ * -auVar209._20_4_;
    auVar31._24_4_ = auVar209._24_4_ * -auVar209._24_4_;
    auVar31._28_4_ = auVar209._28_4_;
    auVar32._4_4_ = fVar232 * 4.0;
    auVar32._0_4_ = fVar231 * 4.0;
    auVar32._8_4_ = fVar233 * 4.0;
    auVar32._12_4_ = fVar237 * 4.0;
    auVar32._16_4_ = fVar259 * 4.0;
    auVar32._20_4_ = fVar260 * 4.0;
    auVar32._24_4_ = fVar262 * 4.0;
    auVar32._28_4_ = fVar193;
    auVar110 = vsubps_avx(auVar31,auVar32);
    fVar291 = fVar213 * -fVar213 * 0.5;
    fVar292 = fVar214 * -fVar214 * 0.5;
    fVar294 = fVar215 * -fVar215 * 0.5;
    fVar305 = fVar216 * -fVar216 * 0.5;
    fVar306 = fVar217 * -fVar217 * 0.5;
    fVar308 = fVar218 * -fVar218 * 0.5;
    fVar310 = fVar219 * -fVar219 * 0.5;
    fVar239 = auVar110._0_4_ * 0.5;
    fVar256 = auVar110._4_4_ * 0.5;
    fVar282 = auVar110._8_4_ * 0.5;
    fVar285 = auVar110._12_4_ * 0.5;
    fVar286 = auVar110._16_4_ * 0.5;
    fVar288 = auVar110._20_4_ * 0.5;
    fVar289 = auVar110._24_4_ * 0.5;
    fVar234 = (fVar213 * fVar213 + fVar231 * 4.0) * 0.5;
    fVar235 = (fVar214 * fVar214 + fVar232 * 4.0) * 0.5;
    fVar257 = (fVar215 * fVar215 + fVar233 * 4.0) * 0.5;
    fVar258 = (fVar216 * fVar216 + fVar237 * 4.0) * 0.5;
    fVar259 = (fVar217 * fVar217 + fVar259 * 4.0) * 0.5;
    fVar260 = (fVar218 * fVar218 + fVar260 * 4.0) * 0.5;
    fVar262 = (fVar219 * fVar219 + fVar262 * 4.0) * 0.5;
    fVar213 = auVar209._0_4_ * auVar209._0_4_ * 0.5;
    fVar214 = auVar209._4_4_ * auVar209._4_4_ * 0.5;
    fVar215 = auVar209._8_4_ * auVar209._8_4_ * 0.5;
    fVar216 = auVar209._12_4_ * auVar209._12_4_ * 0.5;
    fVar231 = auVar209._16_4_ * auVar209._16_4_ * 0.5;
    fVar232 = auVar209._20_4_ * auVar209._20_4_ * 0.5;
    fVar233 = auVar209._24_4_ * auVar209._24_4_ * 0.5;
    fVar283 = auVar110._28_4_ + fVar192 + fVar193 + fVar349 + fVar193;
    auVar101 = vpermilps_avx(ZEXT416((uint)(auVar106._0_4_ * 0.04761905)),0);
    fVar217 = auVar101._0_4_;
    fVar374 = fVar217 * ((float)local_1e0._0_4_ * fVar291 +
                        (float)local_260._0_4_ * fVar239 +
                        fVar234 * (float)local_360._0_4_ + fVar213 * (float)local_3e0._0_4_);
    fVar218 = auVar101._4_4_;
    fVar381 = fVar218 * ((float)local_1e0._4_4_ * fVar292 +
                        (float)local_260._4_4_ * fVar256 +
                        fVar235 * (float)local_360._4_4_ + fVar214 * (float)local_3e0._4_4_);
    local_980._4_4_ = fVar381;
    local_980._0_4_ = fVar374;
    fVar219 = auVar101._8_4_;
    fVar382 = fVar219 * (fStack_1d8 * fVar294 +
                        fStack_258 * fVar282 + fVar257 * fStack_358 + fVar215 * fStack_3d8);
    local_980._8_4_ = fVar382;
    fVar237 = auVar101._12_4_;
    fVar383 = fVar237 * (fStack_1d4 * fVar305 +
                        fStack_254 * fVar285 + fVar258 * fStack_354 + fVar216 * fStack_3d4);
    local_980._12_4_ = fVar383;
    fVar384 = fVar217 * (fStack_1d0 * fVar306 +
                        fStack_250 * fVar286 + fVar259 * fStack_350 + fVar231 * fStack_3d0);
    local_980._16_4_ = fVar384;
    fVar385 = fVar218 * (fStack_1cc * fVar308 +
                        fStack_24c * fVar288 + fVar260 * fStack_34c + fVar232 * fStack_3cc);
    local_980._20_4_ = fVar385;
    fVar386 = fVar219 * (fStack_1c8 * fVar310 +
                        fStack_248 * fVar289 + fVar262 * fStack_348 + fVar233 * fStack_3c8);
    local_980._24_4_ = fVar386;
    local_980._28_4_ = uStack_1c4;
    fVar361 = fVar217 * ((float)local_200._0_4_ * fVar291 +
                        (float)local_280._0_4_ * fVar239 +
                        fVar234 * (float)local_380._0_4_ + fVar213 * (float)local_400._0_4_);
    fVar367 = fVar218 * ((float)local_200._4_4_ * fVar292 +
                        (float)local_280._4_4_ * fVar256 +
                        fVar235 * (float)local_380._4_4_ + fVar214 * (float)local_400._4_4_);
    local_8c0._4_4_ = fVar367;
    local_8c0._0_4_ = fVar361;
    fVar368 = fVar219 * (fStack_1f8 * fVar294 +
                        fStack_278 * fVar282 + fVar257 * fStack_378 + fVar215 * fStack_3f8);
    local_8c0._8_4_ = fVar368;
    fVar369 = fVar237 * (fStack_1f4 * fVar305 +
                        fStack_274 * fVar285 + fVar258 * fStack_374 + fVar216 * fStack_3f4);
    local_8c0._12_4_ = fVar369;
    fVar370 = fVar217 * (fStack_1f0 * fVar306 +
                        fStack_270 * fVar286 + fVar259 * fStack_370 + fVar231 * fStack_3f0);
    local_8c0._16_4_ = fVar370;
    fVar371 = fVar218 * (fStack_1ec * fVar308 +
                        fStack_26c * fVar288 + fVar260 * fStack_36c + fVar232 * fStack_3ec);
    local_8c0._20_4_ = fVar371;
    fVar372 = fVar219 * (fStack_1e8 * fVar310 +
                        fStack_268 * fVar289 + fVar262 * fStack_368 + fVar233 * fStack_3e8);
    local_8c0._24_4_ = fVar372;
    local_8c0._28_4_ = uStack_224;
    fVar328 = fVar217 * ((float)local_220._0_4_ * fVar291 +
                        fVar213 * (float)local_420._0_4_ + fVar234 * (float)local_3a0._0_4_ +
                        fVar239 * (float)local_320._0_4_);
    fVar336 = fVar218 * ((float)local_220._4_4_ * fVar292 +
                        fVar214 * (float)local_420._4_4_ + fVar235 * (float)local_3a0._4_4_ +
                        fVar256 * (float)local_320._4_4_);
    local_9e0._4_4_ = fVar336;
    local_9e0._0_4_ = fVar328;
    fVar338 = fVar219 * (fStack_218 * fVar294 +
                        fVar215 * fStack_418 + fVar257 * fStack_398 + fVar282 * fStack_318);
    local_9e0._8_4_ = fVar338;
    fVar340 = fVar237 * (fStack_214 * fVar305 +
                        fVar216 * fStack_414 + fVar258 * fStack_394 + fVar285 * fStack_314);
    local_9e0._12_4_ = fVar340;
    fVar342 = fVar217 * (fStack_210 * fVar306 +
                        fVar231 * fStack_410 + fVar259 * fStack_390 + fVar286 * fStack_310);
    local_9e0._16_4_ = fVar342;
    fVar344 = fVar218 * (fStack_20c * fVar308 +
                        fVar232 * fStack_40c + fVar260 * fStack_38c + fVar288 * fStack_30c);
    local_9e0._20_4_ = fVar344;
    fVar346 = fVar219 * (fStack_208 * fVar310 +
                        fVar233 * fStack_408 + fVar262 * fStack_388 + fVar289 * fStack_308);
    local_9e0._24_4_ = fVar346;
    local_9e0._28_4_ = fVar349;
    fVar239 = fVar217 * ((float)local_240._0_4_ * fVar291 +
                        fVar239 * (float)local_340._0_4_ +
                        fVar213 * local_440._0_4_ + fVar234 * (float)local_3c0._0_4_);
    fVar256 = fVar218 * ((float)local_240._4_4_ * fVar292 +
                        fVar256 * (float)local_340._4_4_ +
                        fVar214 * local_440._4_4_ + fVar235 * (float)local_3c0._4_4_);
    auVar33._4_4_ = fVar256;
    auVar33._0_4_ = fVar239;
    fVar282 = fVar219 * (fStack_238 * fVar294 +
                        fVar282 * fStack_338 + fVar215 * local_440._8_4_ + fVar257 * fStack_3b8);
    auVar33._8_4_ = fVar282;
    fVar237 = fVar237 * (fStack_234 * fVar305 +
                        fVar285 * fStack_334 + fVar216 * local_440._12_4_ + fVar258 * fStack_3b4);
    auVar33._12_4_ = fVar237;
    fVar217 = fVar217 * (fStack_230 * fVar306 +
                        fVar286 * fStack_330 + fVar231 * local_440._16_4_ + fVar259 * fStack_3b0);
    auVar33._16_4_ = fVar217;
    fVar218 = fVar218 * (fStack_22c * fVar308 +
                        fVar288 * fStack_32c + fVar232 * local_440._20_4_ + fVar260 * fStack_3ac);
    auVar33._20_4_ = fVar218;
    fVar219 = fVar219 * (fStack_228 * fVar310 +
                        fVar289 * fStack_328 + fVar233 * local_440._24_4_ + fVar262 * fStack_3a8);
    auVar33._24_4_ = fVar219;
    auVar33._28_4_ = fVar283;
    auVar80._4_4_ = fVar125;
    auVar80._0_4_ = fVar98;
    auVar80._8_4_ = fVar127;
    auVar80._12_4_ = fVar129;
    auVar80._16_4_ = fVar131;
    auVar80._20_4_ = fVar133;
    auVar80._24_4_ = fVar135;
    auVar80._28_4_ = fVar137;
    auVar110 = vperm2f128_avx(auVar80,auVar80,1);
    auVar110 = vshufps_avx(auVar110,auVar80,0x30);
    local_880 = vshufps_avx(auVar80,auVar110,0x29);
    auVar85._4_4_ = fStack_83c;
    auVar85._0_4_ = local_840;
    auVar85._8_4_ = fStack_838;
    auVar85._12_4_ = aStack_834;
    auVar85._16_4_ = fStack_830;
    auVar85._20_4_ = fStack_82c;
    auVar85._24_4_ = fStack_828;
    auVar85._28_4_ = fStack_824;
    auVar110 = vperm2f128_avx(auVar85,auVar85,1);
    auVar110 = vshufps_avx(auVar110,auVar85,0x30);
    local_a40 = vshufps_avx(auVar85,auVar110,0x29);
    auVar164 = vsubps_avx(_local_ae0,auVar33);
    auVar110 = vperm2f128_avx(auVar164,auVar164,1);
    auVar110 = vshufps_avx(auVar110,auVar164,0x30);
    local_7c0 = vshufps_avx(auVar164,auVar110,0x29);
    local_600 = vsubps_avx(local_880,auVar80);
    local_5e0 = vsubps_avx(local_a40,auVar85);
    fVar213 = local_600._0_4_;
    fVar232 = local_600._4_4_;
    auVar34._4_4_ = fVar336 * fVar232;
    auVar34._0_4_ = fVar328 * fVar213;
    fVar258 = local_600._8_4_;
    auVar34._8_4_ = fVar338 * fVar258;
    fVar288 = local_600._12_4_;
    auVar34._12_4_ = fVar340 * fVar288;
    fVar310 = local_600._16_4_;
    auVar34._16_4_ = fVar342 * fVar310;
    fVar325 = local_600._20_4_;
    auVar34._20_4_ = fVar344 * fVar325;
    fVar22 = local_600._24_4_;
    auVar34._24_4_ = fVar346 * fVar22;
    auVar34._28_4_ = auVar164._28_4_;
    fVar214 = local_5e0._0_4_;
    fVar233 = local_5e0._4_4_;
    auVar35._4_4_ = fVar367 * fVar233;
    auVar35._0_4_ = fVar361 * fVar214;
    fVar259 = local_5e0._8_4_;
    auVar35._8_4_ = fVar368 * fVar259;
    fVar289 = local_5e0._12_4_;
    auVar35._12_4_ = fVar369 * fVar289;
    fVar312 = local_5e0._16_4_;
    auVar35._16_4_ = fVar370 * fVar312;
    fVar326 = local_5e0._20_4_;
    auVar35._20_4_ = fVar371 * fVar326;
    fVar23 = local_5e0._24_4_;
    auVar35._24_4_ = fVar372 * fVar23;
    auVar35._28_4_ = auVar110._28_4_;
    auVar17 = vsubps_avx(auVar35,auVar34);
    auVar82._4_4_ = fStack_85c;
    auVar82._0_4_ = local_860;
    auVar82._8_4_ = fStack_858;
    auVar82._12_4_ = fStack_854;
    auVar82._16_4_ = fStack_850;
    auVar82._20_4_ = fStack_84c;
    auVar82._24_4_ = fStack_848;
    auVar82._28_4_ = fStack_844;
    auVar110 = vperm2f128_avx(auVar82,auVar82,1);
    auVar110 = vshufps_avx(auVar110,auVar82,0x30);
    local_9c0 = vshufps_avx(auVar82,auVar110,0x29);
    _local_720 = vsubps_avx(local_9c0,auVar82);
    auVar36._4_4_ = fVar381 * fVar233;
    auVar36._0_4_ = fVar374 * fVar214;
    auVar36._8_4_ = fVar382 * fVar259;
    auVar36._12_4_ = fVar383 * fVar289;
    auVar36._16_4_ = fVar384 * fVar312;
    auVar36._20_4_ = fVar385 * fVar326;
    auVar36._24_4_ = fVar386 * fVar23;
    auVar36._28_4_ = local_9c0._28_4_;
    fVar215 = local_720._0_4_;
    fVar234 = local_720._4_4_;
    auVar37._4_4_ = fVar336 * fVar234;
    auVar37._0_4_ = fVar328 * fVar215;
    fVar260 = local_720._8_4_;
    auVar37._8_4_ = fVar338 * fVar260;
    fVar291 = local_720._12_4_;
    auVar37._12_4_ = fVar340 * fVar291;
    fVar314 = local_720._16_4_;
    auVar37._16_4_ = fVar342 * fVar314;
    fVar327 = local_720._20_4_;
    auVar37._20_4_ = fVar344 * fVar327;
    fVar24 = local_720._24_4_;
    auVar37._24_4_ = fVar346 * fVar24;
    auVar37._28_4_ = local_880._28_4_;
    auVar18 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar367 * fVar234;
    auVar38._0_4_ = fVar361 * fVar215;
    auVar38._8_4_ = fVar368 * fVar260;
    auVar38._12_4_ = fVar369 * fVar291;
    auVar38._16_4_ = fVar370 * fVar314;
    auVar38._20_4_ = fVar371 * fVar327;
    auVar38._24_4_ = fVar372 * fVar24;
    auVar38._28_4_ = local_880._28_4_;
    auVar39._4_4_ = fVar381 * fVar232;
    auVar39._0_4_ = fVar374 * fVar213;
    auVar39._8_4_ = fVar382 * fVar258;
    auVar39._12_4_ = fVar383 * fVar288;
    auVar39._16_4_ = fVar384 * fVar310;
    auVar39._20_4_ = fVar385 * fVar325;
    auVar39._24_4_ = fVar386 * fVar22;
    auVar39._28_4_ = fVar360;
    auVar19 = vsubps_avx(auVar39,auVar38);
    fVar193 = auVar19._28_4_;
    auVar155._0_4_ = fVar215 * fVar215 + fVar213 * fVar213 + fVar214 * fVar214;
    auVar155._4_4_ = fVar234 * fVar234 + fVar232 * fVar232 + fVar233 * fVar233;
    auVar155._8_4_ = fVar260 * fVar260 + fVar258 * fVar258 + fVar259 * fVar259;
    auVar155._12_4_ = fVar291 * fVar291 + fVar288 * fVar288 + fVar289 * fVar289;
    auVar155._16_4_ = fVar314 * fVar314 + fVar310 * fVar310 + fVar312 * fVar312;
    auVar155._20_4_ = fVar327 * fVar327 + fVar325 * fVar325 + fVar326 * fVar326;
    auVar155._24_4_ = fVar24 * fVar24 + fVar22 * fVar22 + fVar23 * fVar23;
    auVar155._28_4_ = fVar193 + fVar193 + auVar17._28_4_;
    auVar110 = vrcpps_avx(auVar155);
    fVar285 = auVar110._0_4_;
    fVar286 = auVar110._4_4_;
    auVar40._4_4_ = fVar286 * auVar155._4_4_;
    auVar40._0_4_ = fVar285 * auVar155._0_4_;
    fVar294 = auVar110._8_4_;
    auVar40._8_4_ = fVar294 * auVar155._8_4_;
    fVar305 = auVar110._12_4_;
    auVar40._12_4_ = fVar305 * auVar155._12_4_;
    fVar306 = auVar110._16_4_;
    auVar40._16_4_ = fVar306 * auVar155._16_4_;
    fVar308 = auVar110._20_4_;
    auVar40._20_4_ = fVar308 * auVar155._20_4_;
    fVar321 = auVar110._24_4_;
    auVar40._24_4_ = fVar321 * auVar155._24_4_;
    auVar40._28_4_ = fVar360;
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = 0x3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar156 = vsubps_avx(auVar115,auVar40);
    fVar285 = auVar156._0_4_ * fVar285 + fVar285;
    fVar286 = auVar156._4_4_ * fVar286 + fVar286;
    fVar294 = auVar156._8_4_ * fVar294 + fVar294;
    fVar305 = auVar156._12_4_ * fVar305 + fVar305;
    fVar306 = auVar156._16_4_ * fVar306 + fVar306;
    fVar308 = auVar156._20_4_ * fVar308 + fVar308;
    fVar321 = auVar156._24_4_ * fVar321 + fVar321;
    auVar164 = vperm2f128_avx(local_8c0,local_8c0,1);
    auVar164 = vshufps_avx(auVar164,local_8c0,0x30);
    local_9a0 = vshufps_avx(local_8c0,auVar164,0x29);
    auVar164 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar164 = vshufps_avx(auVar164,local_9e0,0x30);
    local_820 = vshufps_avx(local_9e0,auVar164,0x29);
    fVar216 = local_820._0_4_;
    fVar235 = local_820._4_4_;
    auVar41._4_4_ = fVar232 * fVar235;
    auVar41._0_4_ = fVar213 * fVar216;
    fVar262 = local_820._8_4_;
    auVar41._8_4_ = fVar258 * fVar262;
    fVar292 = local_820._12_4_;
    auVar41._12_4_ = fVar288 * fVar292;
    fVar316 = local_820._16_4_;
    auVar41._16_4_ = fVar310 * fVar316;
    fVar348 = local_820._20_4_;
    auVar41._20_4_ = fVar325 * fVar348;
    fVar25 = local_820._24_4_;
    auVar41._24_4_ = fVar22 * fVar25;
    auVar41._28_4_ = auVar164._28_4_;
    fVar387 = local_9a0._0_4_;
    fVar392 = local_9a0._4_4_;
    auVar42._4_4_ = fVar392 * fVar233;
    auVar42._0_4_ = fVar387 * fVar214;
    fVar393 = local_9a0._8_4_;
    auVar42._8_4_ = fVar393 * fVar259;
    fVar394 = local_9a0._12_4_;
    auVar42._12_4_ = fVar394 * fVar289;
    fVar395 = local_9a0._16_4_;
    auVar42._16_4_ = fVar395 * fVar312;
    fVar396 = local_9a0._20_4_;
    auVar42._20_4_ = fVar396 * fVar326;
    fVar397 = local_9a0._24_4_;
    auVar42._24_4_ = fVar397 * fVar23;
    auVar42._28_4_ = uStack_224;
    auVar180 = vsubps_avx(auVar42,auVar41);
    auVar164 = vperm2f128_avx(local_980,local_980,1);
    auVar164 = vshufps_avx(auVar164,local_980,0x30);
    local_8e0 = vshufps_avx(local_980,auVar164,0x29);
    fVar329 = local_8e0._0_4_;
    fVar337 = local_8e0._4_4_;
    auVar43._4_4_ = fVar337 * fVar233;
    auVar43._0_4_ = fVar329 * fVar214;
    fVar339 = local_8e0._8_4_;
    auVar43._8_4_ = fVar339 * fVar259;
    fVar341 = local_8e0._12_4_;
    auVar43._12_4_ = fVar341 * fVar289;
    fVar343 = local_8e0._16_4_;
    auVar43._16_4_ = fVar343 * fVar312;
    fVar345 = local_8e0._20_4_;
    auVar43._20_4_ = fVar345 * fVar326;
    fVar347 = local_8e0._24_4_;
    auVar43._24_4_ = fVar347 * fVar23;
    auVar43._28_4_ = auVar164._28_4_;
    auVar21 = local_820;
    auVar44._4_4_ = fVar235 * fVar234;
    auVar44._0_4_ = fVar216 * fVar215;
    auVar44._8_4_ = fVar262 * fVar260;
    auVar44._12_4_ = fVar292 * fVar291;
    auVar44._16_4_ = fVar316 * fVar314;
    auVar44._20_4_ = fVar348 * fVar327;
    auVar44._24_4_ = fVar25 * fVar24;
    auVar44._28_4_ = uStack_1c4;
    auVar20 = vsubps_avx(auVar44,auVar43);
    auVar45._4_4_ = fVar392 * fVar234;
    auVar45._0_4_ = fVar387 * fVar215;
    auVar45._8_4_ = fVar393 * fVar260;
    auVar45._12_4_ = fVar394 * fVar291;
    auVar45._16_4_ = fVar395 * fVar314;
    auVar45._20_4_ = fVar396 * fVar327;
    auVar45._24_4_ = fVar397 * fVar24;
    auVar45._28_4_ = uStack_1c4;
    auVar46._4_4_ = fVar337 * fVar232;
    auVar46._0_4_ = fVar329 * fVar213;
    auVar46._8_4_ = fVar339 * fVar258;
    auVar46._12_4_ = fVar341 * fVar288;
    auVar46._16_4_ = fVar343 * fVar310;
    auVar46._20_4_ = fVar345 * fVar325;
    fVar231 = local_9a0._28_4_;
    auVar46._24_4_ = fVar347 * fVar22;
    auVar46._28_4_ = fVar231;
    auVar164 = vsubps_avx(auVar46,auVar45);
    fVar257 = auVar164._28_4_;
    auVar47._4_4_ =
         (auVar17._4_4_ * auVar17._4_4_ +
         auVar18._4_4_ * auVar18._4_4_ + auVar19._4_4_ * auVar19._4_4_) * fVar286;
    auVar47._0_4_ =
         (auVar17._0_4_ * auVar17._0_4_ +
         auVar18._0_4_ * auVar18._0_4_ + auVar19._0_4_ * auVar19._0_4_) * fVar285;
    auVar47._8_4_ =
         (auVar17._8_4_ * auVar17._8_4_ +
         auVar18._8_4_ * auVar18._8_4_ + auVar19._8_4_ * auVar19._8_4_) * fVar294;
    auVar47._12_4_ =
         (auVar17._12_4_ * auVar17._12_4_ +
         auVar18._12_4_ * auVar18._12_4_ + auVar19._12_4_ * auVar19._12_4_) * fVar305;
    auVar47._16_4_ =
         (auVar17._16_4_ * auVar17._16_4_ +
         auVar18._16_4_ * auVar18._16_4_ + auVar19._16_4_ * auVar19._16_4_) * fVar306;
    auVar47._20_4_ =
         (auVar17._20_4_ * auVar17._20_4_ +
         auVar18._20_4_ * auVar18._20_4_ + auVar19._20_4_ * auVar19._20_4_) * fVar308;
    auVar47._24_4_ =
         (auVar17._24_4_ * auVar17._24_4_ +
         auVar18._24_4_ * auVar18._24_4_ + auVar19._24_4_ * auVar19._24_4_) * fVar321;
    auVar47._28_4_ = auVar17._28_4_ + auVar18._28_4_ + fVar193;
    auVar48._4_4_ =
         (auVar180._4_4_ * auVar180._4_4_ +
         auVar20._4_4_ * auVar20._4_4_ + auVar164._4_4_ * auVar164._4_4_) * fVar286;
    auVar48._0_4_ =
         (auVar180._0_4_ * auVar180._0_4_ +
         auVar20._0_4_ * auVar20._0_4_ + auVar164._0_4_ * auVar164._0_4_) * fVar285;
    auVar48._8_4_ =
         (auVar180._8_4_ * auVar180._8_4_ +
         auVar20._8_4_ * auVar20._8_4_ + auVar164._8_4_ * auVar164._8_4_) * fVar294;
    auVar48._12_4_ =
         (auVar180._12_4_ * auVar180._12_4_ +
         auVar20._12_4_ * auVar20._12_4_ + auVar164._12_4_ * auVar164._12_4_) * fVar305;
    auVar48._16_4_ =
         (auVar180._16_4_ * auVar180._16_4_ +
         auVar20._16_4_ * auVar20._16_4_ + auVar164._16_4_ * auVar164._16_4_) * fVar306;
    auVar48._20_4_ =
         (auVar180._20_4_ * auVar180._20_4_ +
         auVar20._20_4_ * auVar20._20_4_ + auVar164._20_4_ * auVar164._20_4_) * fVar308;
    auVar48._24_4_ =
         (auVar180._24_4_ * auVar180._24_4_ +
         auVar20._24_4_ * auVar20._24_4_ + auVar164._24_4_ * auVar164._24_4_) * fVar321;
    auVar48._28_4_ = auVar156._28_4_ + auVar110._28_4_;
    auVar110 = vmaxps_avx(auVar47,auVar48);
    auVar164 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar164 = vshufps_avx(auVar164,_local_ae0,0x30);
    _local_7e0 = vshufps_avx(_local_ae0,auVar164,0x29);
    local_6c0._0_4_ = (float)local_ae0._0_4_ + fVar239;
    local_6c0._4_4_ = (float)local_ae0._4_4_ + fVar256;
    fStack_6b8 = fStack_ad8 + fVar282;
    fStack_6b4 = fStack_ad4 + fVar237;
    fStack_6b0 = fStack_ad0 + fVar217;
    fStack_6ac = fStack_acc + fVar218;
    fStack_6a8 = fStack_ac8 + fVar219;
    register0x0000121c = fStack_ac4 + fVar283;
    auVar164 = vmaxps_avx(_local_ae0,_local_6c0);
    auVar17 = vmaxps_avx(local_7c0,_local_7e0);
    auVar164 = vmaxps_avx(auVar164,auVar17);
    auVar17 = vrsqrtps_avx(auVar155);
    fVar193 = auVar17._0_4_;
    fVar217 = auVar17._4_4_;
    fVar218 = auVar17._8_4_;
    fVar219 = auVar17._12_4_;
    fVar237 = auVar17._16_4_;
    fVar239 = auVar17._20_4_;
    fVar256 = auVar17._24_4_;
    auVar49._4_4_ = fVar217 * fVar217 * fVar217 * auVar155._4_4_ * 0.5;
    auVar49._0_4_ = fVar193 * fVar193 * fVar193 * auVar155._0_4_ * 0.5;
    auVar49._8_4_ = fVar218 * fVar218 * fVar218 * auVar155._8_4_ * 0.5;
    auVar49._12_4_ = fVar219 * fVar219 * fVar219 * auVar155._12_4_ * 0.5;
    auVar49._16_4_ = fVar237 * fVar237 * fVar237 * auVar155._16_4_ * 0.5;
    auVar49._20_4_ = fVar239 * fVar239 * fVar239 * auVar155._20_4_ * 0.5;
    auVar49._24_4_ = fVar256 * fVar256 * fVar256 * auVar155._24_4_ * 0.5;
    auVar49._28_4_ = auVar155._28_4_;
    auVar50._4_4_ = fVar217 * 1.5;
    auVar50._0_4_ = fVar193 * 1.5;
    auVar50._8_4_ = fVar218 * 1.5;
    auVar50._12_4_ = fVar219 * 1.5;
    auVar50._16_4_ = fVar237 * 1.5;
    auVar50._20_4_ = fVar239 * 1.5;
    auVar50._24_4_ = fVar256 * 1.5;
    auVar50._28_4_ = auVar17._28_4_;
    auVar18 = vsubps_avx(auVar50,auVar49);
    auVar81._4_4_ = fVar125;
    auVar81._0_4_ = fVar98;
    auVar81._8_4_ = fVar127;
    auVar81._12_4_ = fVar129;
    auVar81._16_4_ = fVar131;
    auVar81._20_4_ = fVar133;
    auVar81._24_4_ = fVar135;
    auVar81._28_4_ = fVar137;
    _local_a60 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    local_780 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    fVar217 = local_780._0_4_;
    fVar237 = local_780._4_4_;
    fVar282 = local_780._8_4_;
    fVar294 = local_780._12_4_;
    fVar321 = local_780._16_4_;
    fVar349 = local_780._20_4_;
    fVar26 = local_780._24_4_;
    auVar16._4_4_ = fStack_59c;
    auVar16._0_4_ = local_5a0;
    auVar16._8_4_ = fStack_598;
    auVar16._12_4_ = fStack_594;
    auVar16._16_4_ = fStack_590;
    auVar16._20_4_ = fStack_58c;
    auVar16._24_4_ = fStack_588;
    auVar16._28_4_ = fStack_584;
    fVar218 = local_a60._0_4_;
    fVar239 = local_a60._4_4_;
    fVar283 = local_a60._8_4_;
    fVar305 = local_a60._12_4_;
    fVar322 = local_a60._16_4_;
    fVar360 = local_a60._20_4_;
    fVar27 = local_a60._24_4_;
    auVar19 = vsubps_avx(ZEXT832(0) << 0x20,auVar82);
    fVar219 = auVar19._0_4_;
    fVar256 = auVar19._4_4_;
    fVar285 = auVar19._8_4_;
    fVar306 = auVar19._12_4_;
    fVar323 = auVar19._16_4_;
    fVar373 = auVar19._20_4_;
    fVar28 = auVar19._24_4_;
    auVar351._0_4_ = local_580 * fVar219 + local_5a0 * fVar218 + local_5c0 * fVar217;
    auVar351._4_4_ = fStack_57c * fVar256 + fStack_59c * fVar239 + fStack_5bc * fVar237;
    auVar351._8_4_ = fStack_578 * fVar285 + fStack_598 * fVar283 + fStack_5b8 * fVar282;
    auVar351._12_4_ = fStack_574 * fVar306 + fStack_594 * fVar305 + fStack_5b4 * fVar294;
    auVar351._16_4_ = fStack_570 * fVar323 + fStack_590 * fVar322 + fStack_5b0 * fVar321;
    auVar351._20_4_ = fStack_56c * fVar373 + fStack_58c * fVar360 + fStack_5ac * fVar349;
    auVar351._24_4_ = fStack_568 * fVar28 + fStack_588 * fVar27 + fStack_5a8 * fVar26;
    auVar351._28_4_ = fVar257 + auVar180._28_4_ + auVar20._28_4_ + fVar257 + auVar17._28_4_;
    auVar376._0_4_ = fVar219 * fVar219 + fVar218 * fVar218 + fVar217 * fVar217;
    auVar376._4_4_ = fVar256 * fVar256 + fVar239 * fVar239 + fVar237 * fVar237;
    auVar376._8_4_ = fVar285 * fVar285 + fVar283 * fVar283 + fVar282 * fVar282;
    auVar376._12_4_ = fVar306 * fVar306 + fVar305 * fVar305 + fVar294 * fVar294;
    auVar376._16_4_ = fVar323 * fVar323 + fVar322 * fVar322 + fVar321 * fVar321;
    auVar376._20_4_ = fVar373 * fVar373 + fVar360 * fVar360 + fVar349 * fVar349;
    auVar376._24_4_ = fVar28 * fVar28 + fVar27 * fVar27 + fVar26 * fVar26;
    auVar376._28_4_ = fVar231 + fVar231 + fVar257;
    fVar231 = auVar18._0_4_;
    fVar257 = auVar18._4_4_;
    fVar286 = auVar18._8_4_;
    fVar308 = auVar18._12_4_;
    fVar324 = auVar18._16_4_;
    fVar261 = auVar18._20_4_;
    fVar263 = auVar18._24_4_;
    fVar193 = local_5e0._28_4_;
    fVar265 = auVar18._28_4_;
    local_620._0_4_ =
         local_580 * fVar215 * fVar231 +
         local_5a0 * fVar213 * fVar231 + fVar214 * fVar231 * local_5c0;
    local_620._4_4_ =
         fStack_57c * fVar234 * fVar257 +
         fStack_59c * fVar232 * fVar257 + fVar233 * fVar257 * fStack_5bc;
    fStack_618 = fStack_578 * fVar260 * fVar286 +
                 fStack_598 * fVar258 * fVar286 + fVar259 * fVar286 * fStack_5b8;
    fStack_614 = fStack_574 * fVar291 * fVar308 +
                 fStack_594 * fVar288 * fVar308 + fVar289 * fVar308 * fStack_5b4;
    fStack_610 = fStack_570 * fVar314 * fVar324 +
                 fStack_590 * fVar310 * fVar324 + fVar312 * fVar324 * fStack_5b0;
    fStack_60c = fStack_56c * fVar327 * fVar261 +
                 fStack_58c * fVar325 * fVar261 + fVar326 * fVar261 * fStack_5ac;
    fStack_608 = fStack_568 * fVar24 * fVar263 +
                 fStack_588 * fVar22 * fVar263 + fVar23 * fVar263 * fStack_5a8;
    fVar264 = fVar265 + fVar193 + 0.0;
    local_900._0_4_ =
         fVar219 * fVar215 * fVar231 + fVar213 * fVar231 * fVar218 + fVar214 * fVar231 * fVar217;
    local_900._4_4_ =
         fVar256 * fVar234 * fVar257 + fVar232 * fVar257 * fVar239 + fVar233 * fVar257 * fVar237;
    fStack_8f8 = fVar285 * fVar260 * fVar286 +
                 fVar258 * fVar286 * fVar283 + fVar259 * fVar286 * fVar282;
    fStack_8f4 = fVar306 * fVar291 * fVar308 +
                 fVar288 * fVar308 * fVar305 + fVar289 * fVar308 * fVar294;
    fStack_8f0 = fVar323 * fVar314 * fVar324 +
                 fVar310 * fVar324 * fVar322 + fVar312 * fVar324 * fVar321;
    fStack_8ec = fVar373 * fVar327 * fVar261 +
                 fVar325 * fVar261 * fVar360 + fVar326 * fVar261 * fVar349;
    fStack_8e8 = fVar28 * fVar24 * fVar263 + fVar22 * fVar263 * fVar27 + fVar23 * fVar263 * fVar26;
    fStack_8e4 = fVar193 + fVar264;
    auVar51._4_4_ = (float)local_900._4_4_ * (float)local_620._4_4_;
    auVar51._0_4_ = (float)local_900._0_4_ * (float)local_620._0_4_;
    auVar51._8_4_ = fStack_8f8 * fStack_618;
    auVar51._12_4_ = fStack_8f4 * fStack_614;
    auVar51._16_4_ = fStack_8f0 * fStack_610;
    auVar51._20_4_ = fStack_8ec * fStack_60c;
    auVar51._24_4_ = fStack_8e8 * fStack_608;
    auVar51._28_4_ = fVar264;
    auVar18 = vsubps_avx(auVar351,auVar51);
    auVar52._4_4_ = (float)local_900._4_4_ * (float)local_900._4_4_;
    auVar52._0_4_ = (float)local_900._0_4_ * (float)local_900._0_4_;
    auVar52._8_4_ = fStack_8f8 * fStack_8f8;
    auVar52._12_4_ = fStack_8f4 * fStack_8f4;
    auVar52._16_4_ = fStack_8f0 * fStack_8f0;
    auVar52._20_4_ = fStack_8ec * fStack_8ec;
    auVar52._24_4_ = fStack_8e8 * fStack_8e8;
    auVar52._28_4_ = fVar193;
    local_660 = vsubps_avx(auVar376,auVar52);
    auVar17 = vsqrtps_avx(auVar110);
    local_920 = auVar17;
    local_920._8_24_ = auVar17._8_24_;
    fVar264 = (auVar164._0_4_ + auVar17._0_4_) * 1.0000002;
    fVar126 = (auVar164._4_4_ + auVar17._4_4_) * 1.0000002;
    fVar128 = (auVar164._8_4_ + auVar17._8_4_) * 1.0000002;
    fVar130 = (auVar164._12_4_ + auVar17._12_4_) * 1.0000002;
    fVar132 = (auVar164._16_4_ + auVar17._16_4_) * 1.0000002;
    fVar134 = (auVar164._20_4_ + auVar17._20_4_) * 1.0000002;
    fVar136 = (auVar164._24_4_ + auVar17._24_4_) * 1.0000002;
    auVar53._4_4_ = fVar126 * fVar126;
    auVar53._0_4_ = fVar264 * fVar264;
    auVar53._8_4_ = fVar128 * fVar128;
    auVar53._12_4_ = fVar130 * fVar130;
    auVar53._16_4_ = fVar132 * fVar132;
    auVar53._20_4_ = fVar134 * fVar134;
    auVar53._24_4_ = fVar136 * fVar136;
    auVar53._28_4_ = auVar164._28_4_ + auVar17._28_4_;
    fVar264 = auVar18._0_4_ + auVar18._0_4_;
    fVar126 = auVar18._4_4_ + auVar18._4_4_;
    local_300._0_8_ = CONCAT44(fVar126,fVar264);
    local_300._8_4_ = auVar18._8_4_ + auVar18._8_4_;
    local_300._12_4_ = auVar18._12_4_ + auVar18._12_4_;
    local_300._16_4_ = auVar18._16_4_ + auVar18._16_4_;
    local_300._20_4_ = auVar18._20_4_ + auVar18._20_4_;
    local_300._24_4_ = auVar18._24_4_ + auVar18._24_4_;
    local_300._28_4_ = auVar18._28_4_ + auVar18._28_4_;
    auVar164 = vsubps_avx(local_660,auVar53);
    local_2e0._4_4_ = (float)local_620._4_4_ * (float)local_620._4_4_;
    local_2e0._0_4_ = (float)local_620._0_4_ * (float)local_620._0_4_;
    local_2e0._8_4_ = fStack_618 * fStack_618;
    local_2e0._12_4_ = fStack_614 * fStack_614;
    local_2e0._16_4_ = fStack_610 * fStack_610;
    local_2e0._20_4_ = fStack_60c * fStack_60c;
    local_2e0._24_4_ = fStack_608 * fStack_608;
    local_2e0._28_4_ = fStack_564;
    local_4a0 = vsubps_avx(local_2a0,local_2e0);
    local_6e0._4_4_ = fVar126 * fVar126;
    local_6e0._0_4_ = fVar264 * fVar264;
    fStack_6d8 = local_300._8_4_ * local_300._8_4_;
    fStack_6d4 = local_300._12_4_ * local_300._12_4_;
    fStack_6d0 = local_300._16_4_ * local_300._16_4_;
    fStack_6cc = local_300._20_4_ * local_300._20_4_;
    fStack_6c8 = local_300._24_4_ * local_300._24_4_;
    unique0x100124bc = fVar265;
    fVar128 = local_4a0._0_4_;
    local_700._0_4_ = fVar128 * 4.0;
    fVar130 = local_4a0._4_4_;
    local_700._4_4_ = fVar130 * 4.0;
    fVar132 = local_4a0._8_4_;
    fStack_6f8 = fVar132 * 4.0;
    fVar134 = local_4a0._12_4_;
    fStack_6f4 = fVar134 * 4.0;
    fVar136 = local_4a0._16_4_;
    fStack_6f0 = fVar136 * 4.0;
    fVar236 = local_4a0._20_4_;
    fStack_6ec = fVar236 * 4.0;
    fVar238 = local_4a0._24_4_;
    fStack_6e8 = fVar238 * 4.0;
    uStack_6e4 = 0x40800000;
    auVar54._4_4_ = auVar164._4_4_ * (float)local_700._4_4_;
    auVar54._0_4_ = auVar164._0_4_ * (float)local_700._0_4_;
    auVar54._8_4_ = auVar164._8_4_ * fStack_6f8;
    auVar54._12_4_ = auVar164._12_4_ * fStack_6f4;
    auVar54._16_4_ = auVar164._16_4_ * fStack_6f0;
    auVar54._20_4_ = auVar164._20_4_ * fStack_6ec;
    auVar54._24_4_ = auVar164._24_4_ * fStack_6e8;
    auVar54._28_4_ = 0x40800000;
    auVar18 = vsubps_avx(_local_6e0,auVar54);
    auVar359 = ZEXT3264(auVar18);
    auVar110 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,5);
    fStack_604 = fVar265 + fVar193 + 0.0;
    fVar193 = local_4a0._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar389._8_4_ = 0x7f800000;
      auVar389._0_8_ = 0x7f8000007f800000;
      auVar389._12_4_ = 0x7f800000;
      auVar389._16_4_ = 0x7f800000;
      auVar389._20_4_ = 0x7f800000;
      auVar389._24_4_ = 0x7f800000;
      auVar389._28_4_ = 0x7f800000;
      auVar364._8_4_ = 0xff800000;
      auVar364._0_8_ = 0xff800000ff800000;
      auVar364._12_4_ = 0xff800000;
      auVar364._16_4_ = 0xff800000;
      auVar364._20_4_ = 0xff800000;
      auVar364._24_4_ = 0xff800000;
      auVar364._28_4_ = 0xff800000;
      auVar274 = local_2a0;
      auVar15 = _local_6e0;
    }
    else {
      auVar16 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,5);
      auVar156 = vsqrtps_avx(auVar18);
      auVar273._0_4_ = fVar128 + fVar128;
      auVar273._4_4_ = fVar130 + fVar130;
      auVar273._8_4_ = fVar132 + fVar132;
      auVar273._12_4_ = fVar134 + fVar134;
      auVar273._16_4_ = fVar136 + fVar136;
      auVar273._20_4_ = fVar236 + fVar236;
      auVar273._24_4_ = fVar238 + fVar238;
      auVar273._28_4_ = fVar193 + fVar193;
      auVar18 = vrcpps_avx(auVar273);
      fVar265 = auVar18._0_4_;
      fVar280 = auVar18._4_4_;
      auVar55._4_4_ = auVar273._4_4_ * fVar280;
      auVar55._0_4_ = auVar273._0_4_ * fVar265;
      fVar281 = auVar18._8_4_;
      auVar55._8_4_ = auVar273._8_4_ * fVar281;
      fVar284 = auVar18._12_4_;
      auVar55._12_4_ = auVar273._12_4_ * fVar284;
      fVar287 = auVar18._16_4_;
      auVar55._16_4_ = auVar273._16_4_ * fVar287;
      fVar290 = auVar18._20_4_;
      auVar55._20_4_ = auVar273._20_4_ * fVar290;
      fVar293 = auVar18._24_4_;
      auVar55._24_4_ = auVar273._24_4_ * fVar293;
      auVar55._28_4_ = auVar273._28_4_;
      auVar352._8_4_ = 0x3f800000;
      auVar352._0_8_ = 0x3f8000003f800000;
      auVar352._12_4_ = 0x3f800000;
      auVar352._16_4_ = 0x3f800000;
      auVar352._20_4_ = 0x3f800000;
      auVar352._24_4_ = 0x3f800000;
      auVar352._28_4_ = 0x3f800000;
      auVar180 = vsubps_avx(auVar352,auVar55);
      fVar265 = fVar265 + fVar265 * auVar180._0_4_;
      fVar280 = fVar280 + fVar280 * auVar180._4_4_;
      fVar281 = fVar281 + fVar281 * auVar180._8_4_;
      fVar284 = fVar284 + fVar284 * auVar180._12_4_;
      fVar287 = fVar287 + fVar287 * auVar180._16_4_;
      fVar290 = fVar290 + fVar290 * auVar180._20_4_;
      fVar293 = fVar293 + fVar293 * auVar180._24_4_;
      auVar301._0_8_ = CONCAT44(fVar126,fVar264) ^ 0x8000000080000000;
      auVar301._8_4_ = -local_300._8_4_;
      auVar301._12_4_ = -local_300._12_4_;
      auVar301._16_4_ = -local_300._16_4_;
      auVar301._20_4_ = -local_300._20_4_;
      auVar301._24_4_ = -local_300._24_4_;
      auVar301._28_4_ = -local_300._28_4_;
      auVar20 = vsubps_avx(auVar301,auVar156);
      fVar264 = auVar20._0_4_ * fVar265;
      fVar126 = auVar20._4_4_ * fVar280;
      auVar15._4_4_ = fVar126;
      auVar15._0_4_ = fVar264;
      fVar307 = auVar20._8_4_ * fVar281;
      auVar15._8_4_ = fVar307;
      fVar309 = auVar20._12_4_ * fVar284;
      auVar15._12_4_ = fVar309;
      fVar311 = auVar20._16_4_ * fVar287;
      auVar15._16_4_ = fVar311;
      fVar313 = auVar20._20_4_ * fVar290;
      auVar15._20_4_ = fVar313;
      fVar315 = auVar20._24_4_ * fVar293;
      auVar15._24_4_ = fVar315;
      auVar15._28_4_ = auVar20._28_4_;
      auVar156 = vsubps_avx(auVar156,local_300);
      fVar265 = auVar156._0_4_ * fVar265;
      fVar280 = auVar156._4_4_ * fVar280;
      auVar56._4_4_ = fVar280;
      auVar56._0_4_ = fVar265;
      fVar281 = auVar156._8_4_ * fVar281;
      auVar56._8_4_ = fVar281;
      fVar284 = auVar156._12_4_ * fVar284;
      auVar56._12_4_ = fVar284;
      fVar287 = auVar156._16_4_ * fVar287;
      auVar56._16_4_ = fVar287;
      fVar290 = auVar156._20_4_ * fVar290;
      auVar56._20_4_ = fVar290;
      fVar293 = auVar156._24_4_ * fVar293;
      auVar56._24_4_ = fVar293;
      auVar56._28_4_ = auVar156._28_4_;
      local_680 = fVar231 * ((float)local_900._0_4_ + (float)local_620._0_4_ * fVar264);
      fStack_67c = fVar257 * ((float)local_900._4_4_ + (float)local_620._4_4_ * fVar126);
      fStack_678 = fVar286 * (fStack_8f8 + fStack_618 * fVar307);
      fStack_674 = fVar308 * (fStack_8f4 + fStack_614 * fVar309);
      fStack_670 = fVar324 * (fStack_8f0 + fStack_610 * fVar311);
      fStack_66c = fVar261 * (fStack_8ec + fStack_60c * fVar313);
      fStack_668 = fVar263 * (fStack_8e8 + fStack_608 * fVar315);
      fStack_664 = fStack_8e4 + auVar18._28_4_ + auVar180._28_4_;
      auVar353._8_4_ = 0x7fffffff;
      auVar353._0_8_ = 0x7fffffff7fffffff;
      auVar353._12_4_ = 0x7fffffff;
      auVar353._16_4_ = 0x7fffffff;
      auVar353._20_4_ = 0x7fffffff;
      auVar353._24_4_ = 0x7fffffff;
      auVar353._28_4_ = 0x7fffffff;
      auVar18 = vandps_avx(local_2e0,auVar353);
      auVar156 = vmaxps_avx(local_480,auVar18);
      auVar57._4_4_ = auVar156._4_4_ * 1.9073486e-06;
      auVar57._0_4_ = auVar156._0_4_ * 1.9073486e-06;
      auVar57._8_4_ = auVar156._8_4_ * 1.9073486e-06;
      auVar57._12_4_ = auVar156._12_4_ * 1.9073486e-06;
      auVar57._16_4_ = auVar156._16_4_ * 1.9073486e-06;
      auVar57._20_4_ = auVar156._20_4_ * 1.9073486e-06;
      auVar57._24_4_ = auVar156._24_4_ * 1.9073486e-06;
      auVar57._28_4_ = auVar156._28_4_;
      auVar18 = vandps_avx(auVar353,local_4a0);
      auVar18 = vcmpps_avx(auVar18,auVar57,1);
      auVar359 = ZEXT3264(auVar18);
      auVar365._8_4_ = 0x7f800000;
      auVar365._0_8_ = 0x7f8000007f800000;
      auVar365._12_4_ = 0x7f800000;
      auVar365._16_4_ = 0x7f800000;
      auVar365._20_4_ = 0x7f800000;
      auVar365._24_4_ = 0x7f800000;
      auVar365._28_4_ = 0x7f800000;
      auVar389 = vblendvps_avx(auVar365,auVar15,auVar16);
      local_6a0._4_4_ = fVar257 * ((float)local_900._4_4_ + (float)local_620._4_4_ * fVar280);
      local_6a0._0_4_ = fVar231 * ((float)local_900._0_4_ + (float)local_620._0_4_ * fVar265);
      fStack_698 = fVar286 * (fStack_8f8 + fStack_618 * fVar281);
      fStack_694 = fVar308 * (fStack_8f4 + fStack_614 * fVar284);
      fStack_690 = fVar324 * (fStack_8f0 + fStack_610 * fVar287);
      fStack_68c = fVar261 * (fStack_8ec + fStack_60c * fVar290);
      fStack_688 = fVar263 * (fStack_8e8 + fStack_608 * fVar293);
      fStack_684 = fStack_8e4 + auVar156._28_4_;
      auVar274._8_4_ = 0xff800000;
      auVar274._0_8_ = 0xff800000ff800000;
      auVar274._12_4_ = 0xff800000;
      auVar274._16_4_ = 0xff800000;
      auVar274._20_4_ = 0xff800000;
      auVar274._24_4_ = 0xff800000;
      auVar274._28_4_ = 0xff800000;
      auVar364 = vblendvps_avx(auVar274,auVar56,auVar16);
      auVar156 = auVar16 & auVar18;
      if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar156 >> 0x7f,0) != '\0') ||
            (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar156 >> 0xbf,0) != '\0') ||
          (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar156[0x1f] < '\0') {
        auVar110 = vandps_avx(auVar18,auVar16);
        auVar101 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar274 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,2);
        auVar399._8_4_ = 0xff800000;
        auVar399._0_8_ = 0xff800000ff800000;
        auVar399._12_4_ = 0xff800000;
        auVar399._16_4_ = 0xff800000;
        auVar399._20_4_ = 0xff800000;
        auVar399._24_4_ = 0xff800000;
        auVar399._28_4_ = 0xff800000;
        auVar379._8_4_ = 0x7f800000;
        auVar379._0_8_ = 0x7f8000007f800000;
        auVar379._12_4_ = 0x7f800000;
        auVar379._16_4_ = 0x7f800000;
        auVar379._20_4_ = 0x7f800000;
        auVar379._24_4_ = 0x7f800000;
        auVar379._28_4_ = 0x7f800000;
        auVar164 = vblendvps_avx(auVar379,auVar399,auVar274);
        auVar29 = vpmovsxwd_avx(auVar101);
        auVar359 = ZEXT1664(auVar29);
        auVar101 = vpunpckhwd_avx(auVar101,auVar101);
        auVar254._16_16_ = auVar101;
        auVar254._0_16_ = auVar29;
        auVar389 = vblendvps_avx(auVar389,auVar164,auVar254);
        auVar15 = vblendvps_avx(auVar399,auVar379,auVar274);
        auVar364 = vblendvps_avx(auVar364,auVar15,auVar254);
        auVar164 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar123._0_4_ = auVar110._0_4_ ^ auVar164._0_4_;
        auVar123._4_4_ = auVar110._4_4_ ^ auVar164._4_4_;
        auVar123._8_4_ = auVar110._8_4_ ^ auVar164._8_4_;
        auVar123._12_4_ = auVar110._12_4_ ^ auVar164._12_4_;
        auVar123._16_4_ = auVar110._16_4_ ^ auVar164._16_4_;
        auVar123._20_4_ = auVar110._20_4_ ^ auVar164._20_4_;
        auVar123._24_4_ = auVar110._24_4_ ^ auVar164._24_4_;
        auVar123._28_4_ = auVar110._28_4_ ^ auVar164._28_4_;
        auVar110 = vorps_avx(auVar274,auVar123);
        auVar110 = vandps_avx(auVar16,auVar110);
      }
    }
    auVar366 = ZEXT3264(auVar364);
    auVar304 = ZEXT3264(auVar15);
    auVar279 = ZEXT3264(auVar274);
    auVar335 = ZEXT3264(auVar16);
    auVar255 = ZEXT3264(local_460);
    auVar164 = local_460 & auVar110;
    auVar380 = ZEXT3264(CONCAT428(fStack_564,
                                  CONCAT424(fStack_568,
                                            CONCAT420(fStack_56c,
                                                      CONCAT416(fStack_570,
                                                                CONCAT412(fStack_574,
                                                                          CONCAT48(fStack_578,
                                                                                   CONCAT44(
                                                  fStack_57c,local_580))))))));
    local_920._0_8_ = uVar94;
    if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar164 >> 0x7f,0) != '\0') ||
          (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar164 >> 0xbf,0) != '\0') ||
        (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar164[0x1f] < '\0') {
      auVar101 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7f0._0_4_));
      auVar101 = vshufps_avx(auVar101,auVar101,0);
      auVar248._16_16_ = auVar101;
      auVar248._0_16_ = auVar101;
      auVar156 = vmaxps_avx(auVar248,auVar389);
      auVar101 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7f0._0_4_));
      auVar101 = vshufps_avx(auVar101,auVar101,0);
      auVar249._16_16_ = auVar101;
      auVar249._0_16_ = auVar101;
      auVar180 = vminps_avx(auVar249,auVar364);
      fVar290 = local_660._28_4_;
      auVar366 = ZEXT3264(CONCAT428(fStack_584,
                                    CONCAT424(fStack_588,
                                              CONCAT420(fStack_58c,
                                                        CONCAT416(fStack_590,
                                                                  CONCAT412(fStack_594,
                                                                            CONCAT48(fStack_598,
                                                                                     CONCAT44(
                                                  fStack_59c,local_5a0))))))));
      auVar179._0_4_ = local_580 * fVar374 + local_5a0 * fVar361 + fVar328 * local_5c0;
      auVar179._4_4_ = fStack_57c * fVar381 + fStack_59c * fVar367 + fVar336 * fStack_5bc;
      auVar179._8_4_ = fStack_578 * fVar382 + fStack_598 * fVar368 + fVar338 * fStack_5b8;
      auVar179._12_4_ = fStack_574 * fVar383 + fStack_594 * fVar369 + fVar340 * fStack_5b4;
      auVar179._16_4_ = fStack_570 * fVar384 + fStack_590 * fVar370 + fVar342 * fStack_5b0;
      auVar179._20_4_ = fStack_56c * fVar385 + fStack_58c * fVar371 + fVar344 * fStack_5ac;
      auVar179._24_4_ = fStack_568 * fVar386 + fStack_588 * fVar372 + fVar346 * fStack_5a8;
      auVar179._28_4_ = fVar290 + fVar290 + auVar19._28_4_;
      auVar164 = vrcpps_avx(auVar179);
      fVar265 = auVar164._0_4_;
      fVar264 = auVar164._4_4_;
      auVar58._4_4_ = auVar179._4_4_ * fVar264;
      auVar58._0_4_ = auVar179._0_4_ * fVar265;
      fVar126 = auVar164._8_4_;
      auVar58._8_4_ = auVar179._8_4_ * fVar126;
      fVar280 = auVar164._12_4_;
      auVar58._12_4_ = auVar179._12_4_ * fVar280;
      fVar281 = auVar164._16_4_;
      auVar58._16_4_ = auVar179._16_4_ * fVar281;
      fVar284 = auVar164._20_4_;
      auVar58._20_4_ = auVar179._20_4_ * fVar284;
      fVar287 = auVar164._24_4_;
      auVar58._24_4_ = auVar179._24_4_ * fVar287;
      auVar58._28_4_ = uStack_1c4;
      auVar354._8_4_ = 0x3f800000;
      auVar354._0_8_ = 0x3f8000003f800000;
      auVar354._12_4_ = 0x3f800000;
      auVar354._16_4_ = 0x3f800000;
      auVar354._20_4_ = 0x3f800000;
      auVar354._24_4_ = 0x3f800000;
      auVar354._28_4_ = 0x3f800000;
      auVar18 = vsubps_avx(auVar354,auVar58);
      auVar302._8_4_ = 0x7fffffff;
      auVar302._0_8_ = 0x7fffffff7fffffff;
      auVar302._12_4_ = 0x7fffffff;
      auVar302._16_4_ = 0x7fffffff;
      auVar302._20_4_ = 0x7fffffff;
      auVar302._24_4_ = 0x7fffffff;
      auVar302._28_4_ = 0x7fffffff;
      auVar164 = vandps_avx(auVar179,auVar302);
      auVar334._8_4_ = 0x219392ef;
      auVar334._0_8_ = 0x219392ef219392ef;
      auVar334._12_4_ = 0x219392ef;
      auVar334._16_4_ = 0x219392ef;
      auVar334._20_4_ = 0x219392ef;
      auVar334._24_4_ = 0x219392ef;
      auVar334._28_4_ = 0x219392ef;
      auVar164 = vcmpps_avx(auVar164,auVar334,1);
      auVar59._4_4_ =
           (fVar264 + fVar264 * auVar18._4_4_) *
           -(fVar381 * fVar256 + fVar367 * fVar239 + fVar336 * fVar237);
      auVar59._0_4_ =
           (fVar265 + fVar265 * auVar18._0_4_) *
           -(fVar374 * fVar219 + fVar361 * fVar218 + fVar328 * fVar217);
      auVar59._8_4_ =
           (fVar126 + fVar126 * auVar18._8_4_) *
           -(fVar382 * fVar285 + fVar368 * fVar283 + fVar338 * fVar282);
      auVar59._12_4_ =
           (fVar280 + fVar280 * auVar18._12_4_) *
           -(fVar383 * fVar306 + fVar369 * fVar305 + fVar340 * fVar294);
      auVar59._16_4_ =
           (fVar281 + fVar281 * auVar18._16_4_) *
           -(fVar384 * fVar323 + fVar370 * fVar322 + fVar342 * fVar321);
      auVar59._20_4_ =
           (fVar284 + fVar284 * auVar18._20_4_) *
           -(fVar385 * fVar373 + fVar371 * fVar360 + fVar344 * fVar349);
      auVar59._24_4_ =
           (fVar287 + fVar287 * auVar18._24_4_) *
           -(fVar386 * fVar28 + fVar372 * fVar27 + fVar346 * fVar26);
      auVar59._28_4_ = -(auVar19._28_4_ + local_300._28_4_ + fVar290);
      auVar335 = ZEXT3264(auVar110);
      auVar101 = ZEXT816(0) << 0x40;
      auVar18 = vcmpps_avx(auVar179,ZEXT1632(auVar101),1);
      auVar19 = vorps_avx(auVar164,auVar18);
      auVar18 = vcmpps_avx(auVar179,ZEXT1632(auVar101),6);
      auVar18 = vorps_avx(auVar164,auVar18);
      auVar390._8_4_ = 0xff800000;
      auVar390._0_8_ = 0xff800000ff800000;
      auVar390._12_4_ = 0xff800000;
      auVar390._16_4_ = 0xff800000;
      auVar390._20_4_ = 0xff800000;
      auVar390._24_4_ = 0xff800000;
      auVar390._28_4_ = 0xff800000;
      auVar164 = vblendvps_avx(auVar59,auVar390,auVar19);
      auVar355._8_4_ = 0x7f800000;
      auVar355._0_8_ = 0x7f8000007f800000;
      auVar355._12_4_ = 0x7f800000;
      auVar355._16_4_ = 0x7f800000;
      auVar355._20_4_ = 0x7f800000;
      auVar355._24_4_ = 0x7f800000;
      auVar355._28_4_ = 0x7f800000;
      auVar359 = ZEXT3264(auVar355);
      auVar18 = vblendvps_avx(auVar59,auVar355,auVar18);
      auVar19 = vmaxps_avx(auVar156,auVar164);
      auVar156 = vminps_avx(auVar180,auVar18);
      auVar116 = ZEXT1632(auVar101);
      auVar164 = vsubps_avx(auVar116,local_880);
      auVar18 = vsubps_avx(auVar116,local_a40);
      auVar60._4_4_ = auVar18._4_4_ * -fVar235;
      auVar60._0_4_ = auVar18._0_4_ * -fVar216;
      auVar60._8_4_ = auVar18._8_4_ * -fVar262;
      auVar60._12_4_ = auVar18._12_4_ * -fVar292;
      auVar60._16_4_ = auVar18._16_4_ * -fVar316;
      auVar60._20_4_ = auVar18._20_4_ * -fVar348;
      auVar60._24_4_ = auVar18._24_4_ * -fVar25;
      auVar60._28_4_ = auVar18._28_4_;
      auVar61._4_4_ = fVar392 * auVar164._4_4_;
      auVar61._0_4_ = fVar387 * auVar164._0_4_;
      auVar61._8_4_ = fVar393 * auVar164._8_4_;
      auVar61._12_4_ = fVar394 * auVar164._12_4_;
      auVar61._16_4_ = fVar395 * auVar164._16_4_;
      auVar61._20_4_ = fVar396 * auVar164._20_4_;
      auVar61._24_4_ = fVar397 * auVar164._24_4_;
      auVar61._28_4_ = auVar164._28_4_;
      auVar164 = vsubps_avx(auVar60,auVar61);
      auVar18 = vsubps_avx(auVar116,local_9c0);
      auVar62._4_4_ = fVar337 * auVar18._4_4_;
      auVar62._0_4_ = fVar329 * auVar18._0_4_;
      auVar62._8_4_ = fVar339 * auVar18._8_4_;
      auVar62._12_4_ = fVar341 * auVar18._12_4_;
      auVar62._16_4_ = fVar343 * auVar18._16_4_;
      auVar62._20_4_ = fVar345 * auVar18._20_4_;
      uVar1 = auVar18._28_4_;
      auVar62._24_4_ = fVar347 * auVar18._24_4_;
      auVar62._28_4_ = uVar1;
      auVar180 = vsubps_avx(auVar164,auVar62);
      auVar63._4_4_ = fStack_5bc * -fVar235;
      auVar63._0_4_ = local_5c0 * -fVar216;
      auVar63._8_4_ = fStack_5b8 * -fVar262;
      auVar63._12_4_ = fStack_5b4 * -fVar292;
      auVar63._16_4_ = fStack_5b0 * -fVar316;
      auVar63._20_4_ = fStack_5ac * -fVar348;
      auVar63._24_4_ = fStack_5a8 * -fVar25;
      auVar63._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar64._4_4_ = fStack_59c * fVar392;
      auVar64._0_4_ = local_5a0 * fVar387;
      auVar64._8_4_ = fStack_598 * fVar393;
      auVar64._12_4_ = fStack_594 * fVar394;
      auVar64._16_4_ = fStack_590 * fVar395;
      auVar64._20_4_ = fStack_58c * fVar396;
      auVar64._24_4_ = fStack_588 * fVar397;
      auVar64._28_4_ = uVar1;
      auVar164 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = fStack_57c * fVar337;
      auVar65._0_4_ = local_580 * fVar329;
      auVar65._8_4_ = fStack_578 * fVar339;
      auVar65._12_4_ = fStack_574 * fVar341;
      auVar65._16_4_ = fStack_570 * fVar343;
      auVar65._20_4_ = fStack_56c * fVar345;
      auVar65._24_4_ = fStack_568 * fVar347;
      auVar65._28_4_ = uVar1;
      auVar377._8_4_ = 0x3f800000;
      auVar377._0_8_ = 0x3f8000003f800000;
      auVar377._12_4_ = 0x3f800000;
      auVar377._16_4_ = 0x3f800000;
      auVar377._20_4_ = 0x3f800000;
      auVar377._24_4_ = 0x3f800000;
      auVar377._28_4_ = 0x3f800000;
      auVar380 = ZEXT3264(auVar377);
      auVar20 = vsubps_avx(auVar164,auVar65);
      auVar164 = vrcpps_avx(auVar20);
      fVar216 = auVar164._0_4_;
      fVar217 = auVar164._4_4_;
      auVar66._4_4_ = auVar20._4_4_ * fVar217;
      auVar66._0_4_ = auVar20._0_4_ * fVar216;
      fVar218 = auVar164._8_4_;
      auVar66._8_4_ = auVar20._8_4_ * fVar218;
      fVar219 = auVar164._12_4_;
      auVar66._12_4_ = auVar20._12_4_ * fVar219;
      fVar235 = auVar164._16_4_;
      auVar66._16_4_ = auVar20._16_4_ * fVar235;
      fVar237 = auVar164._20_4_;
      auVar66._20_4_ = auVar20._20_4_ * fVar237;
      fVar239 = auVar164._24_4_;
      auVar66._24_4_ = auVar20._24_4_ * fVar239;
      auVar66._28_4_ = fStack_5a4;
      auVar30 = vsubps_avx(auVar377,auVar66);
      auVar164 = vandps_avx(auVar20,auVar302);
      auVar303._8_4_ = 0x219392ef;
      auVar303._0_8_ = 0x219392ef219392ef;
      auVar303._12_4_ = 0x219392ef;
      auVar303._16_4_ = 0x219392ef;
      auVar303._20_4_ = 0x219392ef;
      auVar303._24_4_ = 0x219392ef;
      auVar303._28_4_ = 0x219392ef;
      auVar18 = vcmpps_avx(auVar164,auVar303,1);
      auVar279 = ZEXT3264(auVar18);
      auVar67._4_4_ = (fVar217 + fVar217 * auVar30._4_4_) * -auVar180._4_4_;
      auVar67._0_4_ = (fVar216 + fVar216 * auVar30._0_4_) * -auVar180._0_4_;
      auVar67._8_4_ = (fVar218 + fVar218 * auVar30._8_4_) * -auVar180._8_4_;
      auVar67._12_4_ = (fVar219 + fVar219 * auVar30._12_4_) * -auVar180._12_4_;
      auVar67._16_4_ = (fVar235 + fVar235 * auVar30._16_4_) * -auVar180._16_4_;
      auVar67._20_4_ = (fVar237 + fVar237 * auVar30._20_4_) * -auVar180._20_4_;
      auVar67._24_4_ = (fVar239 + fVar239 * auVar30._24_4_) * -auVar180._24_4_;
      auVar67._28_4_ = auVar180._28_4_ ^ 0x80000000;
      auVar164 = vcmpps_avx(auVar20,auVar116,1);
      auVar164 = vorps_avx(auVar18,auVar164);
      auVar164 = vblendvps_avx(auVar67,auVar390,auVar164);
      local_640 = vmaxps_avx(auVar19,auVar164);
      auVar304 = ZEXT3264(local_640);
      auVar255 = ZEXT864(0) << 0x20;
      auVar164 = vcmpps_avx(auVar20,ZEXT832(0) << 0x20,6);
      auVar164 = vorps_avx(auVar18,auVar164);
      auVar164 = vblendvps_avx(auVar67,auVar355,auVar164);
      auVar110 = vandps_avx(auVar110,local_460);
      local_500 = vminps_avx(auVar156,auVar164);
      auVar164 = vcmpps_avx(local_640,local_500,2);
      auVar18 = auVar110 & auVar164;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar18 = vminps_avx(_local_ae0,_local_6c0);
        auVar19 = vminps_avx(local_7c0,_local_7e0);
        auVar18 = vminps_avx(auVar18,auVar19);
        auVar17 = vsubps_avx(auVar18,auVar17);
        auVar110 = vandps_avx(auVar164,auVar110);
        auVar87._4_4_ = fStack_67c;
        auVar87._0_4_ = local_680;
        auVar87._8_4_ = fStack_678;
        auVar87._12_4_ = fStack_674;
        auVar87._16_4_ = fStack_670;
        auVar87._20_4_ = fStack_66c;
        auVar87._24_4_ = fStack_668;
        auVar87._28_4_ = fStack_664;
        auVar164 = vminps_avx(auVar87,auVar377);
        auVar164 = vmaxps_avx(auVar164,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar169 + fVar138 * (auVar164._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar190 + fVar165 * (auVar164._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar191 + fVar166 * (auVar164._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar192 + fVar168 * (auVar164._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar169 + fVar138 * (auVar164._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar190 + fVar165 * (auVar164._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar191 + fVar166 * (auVar164._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar192 + auVar164._28_4_ + 7.0;
        auVar164 = vminps_avx(_local_6a0,auVar377);
        auVar164 = vmaxps_avx(auVar164,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar169 + fVar138 * (auVar164._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar190 + fVar165 * (auVar164._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar191 + fVar166 * (auVar164._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar192 + fVar168 * (auVar164._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar169 + fVar138 * (auVar164._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar190 + fVar165 * (auVar164._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar191 + fVar166 * (auVar164._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar192 + auVar164._28_4_ + 7.0;
        auVar68._4_4_ = auVar17._4_4_ * 0.99999976;
        auVar68._0_4_ = auVar17._0_4_ * 0.99999976;
        auVar68._8_4_ = auVar17._8_4_ * 0.99999976;
        auVar68._12_4_ = auVar17._12_4_ * 0.99999976;
        auVar68._16_4_ = auVar17._16_4_ * 0.99999976;
        auVar68._20_4_ = auVar17._20_4_ * 0.99999976;
        auVar68._24_4_ = auVar17._24_4_ * 0.99999976;
        auVar68._28_4_ = 0x3f7ffffc;
        auVar164 = vmaxps_avx(ZEXT832(0) << 0x20,auVar68);
        auVar69._4_4_ = auVar164._4_4_ * auVar164._4_4_;
        auVar69._0_4_ = auVar164._0_4_ * auVar164._0_4_;
        auVar69._8_4_ = auVar164._8_4_ * auVar164._8_4_;
        auVar69._12_4_ = auVar164._12_4_ * auVar164._12_4_;
        auVar69._16_4_ = auVar164._16_4_ * auVar164._16_4_;
        auVar69._20_4_ = auVar164._20_4_ * auVar164._20_4_;
        auVar69._24_4_ = auVar164._24_4_ * auVar164._24_4_;
        auVar69._28_4_ = auVar164._28_4_;
        auVar17 = vsubps_avx(local_660,auVar69);
        auVar70._4_4_ = auVar17._4_4_ * (float)local_700._4_4_;
        auVar70._0_4_ = auVar17._0_4_ * (float)local_700._0_4_;
        auVar70._8_4_ = auVar17._8_4_ * fStack_6f8;
        auVar70._12_4_ = auVar17._12_4_ * fStack_6f4;
        auVar70._16_4_ = auVar17._16_4_ * fStack_6f0;
        auVar70._20_4_ = auVar17._20_4_ * fStack_6ec;
        auVar70._24_4_ = auVar17._24_4_ * fStack_6e8;
        auVar70._28_4_ = auVar164._28_4_;
        auVar18 = vsubps_avx(_local_6e0,auVar70);
        auVar164 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,5);
        if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0x7f,0) == '\0') &&
              (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar164 >> 0xbf,0) == '\0') &&
            (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar164[0x1f]) {
          auVar156 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_6c0 = ZEXT832(0) << 0x20;
          _local_6e0 = ZEXT832(0) << 0x20;
          _local_700 = ZEXT832(0) << 0x20;
          auVar180 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar205 = ZEXT828(0) << 0x20;
          auVar250._8_4_ = 0x7f800000;
          auVar250._0_8_ = 0x7f8000007f800000;
          auVar250._12_4_ = 0x7f800000;
          auVar250._16_4_ = 0x7f800000;
          auVar250._20_4_ = 0x7f800000;
          auVar250._24_4_ = 0x7f800000;
          auVar250._28_4_ = 0x7f800000;
          auVar275._8_4_ = 0xff800000;
          auVar275._0_8_ = 0xff800000ff800000;
          auVar275._12_4_ = 0xff800000;
          auVar275._16_4_ = 0xff800000;
          auVar275._20_4_ = 0xff800000;
          auVar275._24_4_ = 0xff800000;
          auVar275._28_4_ = 0xff800000;
        }
        else {
          local_980 = auVar17;
          local_a40 = auVar164;
          auVar156 = vsqrtps_avx(auVar18);
          auVar181._0_4_ = fVar128 + fVar128;
          auVar181._4_4_ = fVar130 + fVar130;
          auVar181._8_4_ = fVar132 + fVar132;
          auVar181._12_4_ = fVar134 + fVar134;
          auVar181._16_4_ = fVar136 + fVar136;
          auVar181._20_4_ = fVar236 + fVar236;
          auVar181._24_4_ = fVar238 + fVar238;
          auVar181._28_4_ = fVar193 + fVar193;
          auVar19 = vrcpps_avx(auVar181);
          fVar193 = auVar19._0_4_;
          fVar216 = auVar19._4_4_;
          auVar71._4_4_ = auVar181._4_4_ * fVar216;
          auVar71._0_4_ = auVar181._0_4_ * fVar193;
          fVar217 = auVar19._8_4_;
          auVar71._8_4_ = auVar181._8_4_ * fVar217;
          fVar218 = auVar19._12_4_;
          auVar71._12_4_ = auVar181._12_4_ * fVar218;
          fVar219 = auVar19._16_4_;
          auVar71._16_4_ = auVar181._16_4_ * fVar219;
          fVar235 = auVar19._20_4_;
          auVar71._20_4_ = auVar181._20_4_ * fVar235;
          fVar237 = auVar19._24_4_;
          auVar71._24_4_ = auVar181._24_4_ * fVar237;
          auVar71._28_4_ = auVar181._28_4_;
          auVar180 = vsubps_avx(auVar377,auVar71);
          fVar193 = fVar193 + fVar193 * auVar180._0_4_;
          fVar216 = fVar216 + fVar216 * auVar180._4_4_;
          fVar217 = fVar217 + fVar217 * auVar180._8_4_;
          fVar218 = fVar218 + fVar218 * auVar180._12_4_;
          fVar219 = fVar219 + fVar219 * auVar180._16_4_;
          fVar235 = fVar235 + fVar235 * auVar180._20_4_;
          fVar237 = fVar237 + fVar237 * auVar180._24_4_;
          fVar239 = auVar19._28_4_ + auVar180._28_4_;
          auVar210._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
          auVar210._8_4_ = -local_300._8_4_;
          auVar210._12_4_ = -local_300._12_4_;
          auVar210._16_4_ = -local_300._16_4_;
          auVar210._20_4_ = -local_300._20_4_;
          auVar210._24_4_ = -local_300._24_4_;
          auVar210._28_4_ = -local_300._28_4_;
          auVar19 = vsubps_avx(auVar210,auVar156);
          fVar305 = auVar19._0_4_ * fVar193;
          fVar306 = auVar19._4_4_ * fVar216;
          auVar72._4_4_ = fVar306;
          auVar72._0_4_ = fVar305;
          fVar316 = auVar19._8_4_ * fVar217;
          auVar72._8_4_ = fVar316;
          fVar321 = auVar19._12_4_ * fVar218;
          auVar72._12_4_ = fVar321;
          fVar322 = auVar19._16_4_ * fVar219;
          auVar72._16_4_ = fVar322;
          fVar323 = auVar19._20_4_ * fVar235;
          auVar72._20_4_ = fVar323;
          fVar348 = auVar19._24_4_ * fVar237;
          auVar72._24_4_ = fVar348;
          auVar72._28_4_ = 0xff800000;
          auVar156 = vsubps_avx(auVar156,local_300);
          fVar193 = auVar156._0_4_ * fVar193;
          fVar216 = auVar156._4_4_ * fVar216;
          auVar73._4_4_ = fVar216;
          auVar73._0_4_ = fVar193;
          fVar217 = auVar156._8_4_ * fVar217;
          auVar73._8_4_ = fVar217;
          fVar218 = auVar156._12_4_ * fVar218;
          auVar73._12_4_ = fVar218;
          fVar219 = auVar156._16_4_ * fVar219;
          auVar73._16_4_ = fVar219;
          fVar235 = auVar156._20_4_ * fVar235;
          auVar73._20_4_ = fVar235;
          fVar237 = auVar156._24_4_ * fVar237;
          auVar73._24_4_ = fVar237;
          auVar73._28_4_ = 0x3f800000;
          fVar256 = fVar231 * ((float)local_620._0_4_ * fVar305 + (float)local_900._0_4_);
          fVar262 = fVar257 * ((float)local_620._4_4_ * fVar306 + (float)local_900._4_4_);
          fVar282 = fVar286 * (fStack_618 * fVar316 + fStack_8f8);
          fVar283 = fVar308 * (fStack_614 * fVar321 + fStack_8f4);
          fVar285 = fVar324 * (fStack_610 * fVar322 + fStack_8f0);
          fVar292 = fVar261 * (fStack_60c * fVar323 + fStack_8ec);
          fVar294 = fVar263 * (fStack_608 * fVar348 + fStack_8e8);
          auVar157._0_4_ = local_860 + fVar215 * fVar256;
          auVar157._4_4_ = fStack_85c + fVar234 * fVar262;
          auVar157._8_4_ = fStack_858 + fVar260 * fVar282;
          auVar157._12_4_ = fStack_854 + fVar291 * fVar283;
          auVar157._16_4_ = fStack_850 + fVar314 * fVar285;
          auVar157._20_4_ = fStack_84c + fVar327 * fVar292;
          auVar157._24_4_ = fStack_848 + fVar24 * fVar294;
          auVar157._28_4_ = fStack_844 + auVar156._28_4_ + fStack_8e4;
          auVar74._4_4_ = fStack_57c * fVar306;
          auVar74._0_4_ = local_580 * fVar305;
          auVar74._8_4_ = fStack_578 * fVar316;
          auVar74._12_4_ = fStack_574 * fVar321;
          auVar74._16_4_ = fStack_570 * fVar322;
          auVar74._20_4_ = fStack_56c * fVar323;
          auVar74._24_4_ = fStack_568 * fVar348;
          auVar74._28_4_ = fVar239;
          auVar156 = vsubps_avx(auVar74,auVar157);
          _local_a60 = auVar156;
          auVar182._0_4_ = fVar98 + fVar213 * fVar256;
          auVar182._4_4_ = fVar125 + fVar232 * fVar262;
          auVar182._8_4_ = fVar127 + fVar258 * fVar282;
          auVar182._12_4_ = fVar129 + fVar288 * fVar283;
          auVar182._16_4_ = fVar131 + fVar310 * fVar285;
          auVar182._20_4_ = fVar133 + fVar325 * fVar292;
          auVar182._24_4_ = fVar135 + fVar22 * fVar294;
          auVar182._28_4_ = fVar137 + fVar239;
          auVar251._0_4_ = local_5a0 * fVar305;
          auVar251._4_4_ = fStack_59c * fVar306;
          auVar251._8_4_ = fStack_598 * fVar316;
          auVar251._12_4_ = fStack_594 * fVar321;
          auVar251._16_4_ = fStack_590 * fVar322;
          auVar251._20_4_ = fStack_58c * fVar323;
          auVar251._24_4_ = fStack_588 * fVar348;
          auVar251._28_4_ = 0;
          auVar180 = vsubps_avx(auVar251,auVar182);
          local_880 = auVar180;
          auVar211._0_4_ = local_840 + fVar214 * fVar256;
          auVar211._4_4_ = fStack_83c + fVar233 * fVar262;
          auVar211._8_4_ = fStack_838 + fVar259 * fVar282;
          auVar211._12_4_ = aStack_834.w + fVar289 * fVar283;
          auVar211._16_4_ = fStack_830 + fVar312 * fVar285;
          auVar211._20_4_ = fStack_82c + fVar326 * fVar292;
          auVar211._24_4_ = fStack_828 + fVar23 * fVar294;
          auVar211._28_4_ = fStack_824 + auVar19._28_4_;
          auVar75._4_4_ = fStack_5bc * fVar306;
          auVar75._0_4_ = local_5c0 * fVar305;
          auVar75._8_4_ = fStack_5b8 * fVar316;
          auVar75._12_4_ = fStack_5b4 * fVar321;
          auVar75._16_4_ = fStack_5b0 * fVar322;
          auVar75._20_4_ = fStack_5ac * fVar323;
          auVar75._24_4_ = fStack_5a8 * fVar348;
          auVar75._28_4_ = 0;
          auVar19 = vsubps_avx(auVar75,auVar211);
          auVar205 = auVar19._0_28_;
          fVar231 = fVar231 * ((float)local_620._0_4_ * fVar193 + (float)local_900._0_4_);
          fVar257 = fVar257 * ((float)local_620._4_4_ * fVar216 + (float)local_900._4_4_);
          fVar286 = fVar286 * (fStack_618 * fVar217 + fStack_8f8);
          fVar308 = fVar308 * (fStack_614 * fVar218 + fStack_8f4);
          fVar324 = fVar324 * (fStack_610 * fVar219 + fStack_8f0);
          fVar261 = fVar261 * (fStack_60c * fVar235 + fStack_8ec);
          fVar263 = fVar263 * (fStack_608 * fVar237 + fStack_8e8);
          auVar276._0_4_ = local_860 + fVar215 * fVar231;
          auVar276._4_4_ = fStack_85c + fVar234 * fVar257;
          auVar276._8_4_ = fStack_858 + fVar260 * fVar286;
          auVar276._12_4_ = fStack_854 + fVar291 * fVar308;
          auVar276._16_4_ = fStack_850 + fVar314 * fVar324;
          auVar276._20_4_ = fStack_84c + fVar327 * fVar261;
          auVar276._24_4_ = fStack_848 + fVar24 * fVar263;
          auVar276._28_4_ = fStack_844 + fStack_704;
          auVar76._4_4_ = fStack_57c * fVar216;
          auVar76._0_4_ = local_580 * fVar193;
          auVar76._8_4_ = fStack_578 * fVar217;
          auVar76._12_4_ = fStack_574 * fVar218;
          auVar76._16_4_ = fStack_570 * fVar219;
          auVar76._20_4_ = fStack_56c * fVar235;
          auVar76._24_4_ = fStack_568 * fVar237;
          auVar76._28_4_ = fStack_844;
          _local_6c0 = vsubps_avx(auVar76,auVar276);
          auVar277._0_4_ = fVar98 + fVar213 * fVar231;
          auVar277._4_4_ = fVar125 + fVar232 * fVar257;
          auVar277._8_4_ = fVar127 + fVar258 * fVar286;
          auVar277._12_4_ = fVar129 + fVar288 * fVar308;
          auVar277._16_4_ = fVar131 + fVar310 * fVar324;
          auVar277._20_4_ = fVar133 + fVar325 * fVar261;
          auVar277._24_4_ = fVar135 + fVar22 * fVar263;
          auVar277._28_4_ = fVar137 + local_6c0._28_4_;
          auVar77._4_4_ = fVar216 * fStack_59c;
          auVar77._0_4_ = fVar193 * local_5a0;
          auVar77._8_4_ = fVar217 * fStack_598;
          auVar77._12_4_ = fVar218 * fStack_594;
          auVar77._16_4_ = fVar219 * fStack_590;
          auVar77._20_4_ = fVar235 * fStack_58c;
          auVar77._24_4_ = fVar237 * fStack_588;
          auVar77._28_4_ = fStack_844;
          _local_6e0 = vsubps_avx(auVar77,auVar277);
          auVar252._0_4_ = local_840 + fVar214 * fVar231;
          auVar252._4_4_ = fStack_83c + fVar233 * fVar257;
          auVar252._8_4_ = fStack_838 + fVar259 * fVar286;
          auVar252._12_4_ = aStack_834.w + fVar289 * fVar308;
          auVar252._16_4_ = fStack_830 + fVar312 * fVar324;
          auVar252._20_4_ = fStack_82c + fVar326 * fVar261;
          auVar252._24_4_ = fStack_828 + fVar23 * fVar263;
          auVar252._28_4_ = fStack_824 + fStack_8e4 + 0.0;
          auVar78._4_4_ = fStack_5bc * fVar216;
          auVar78._0_4_ = local_5c0 * fVar193;
          auVar78._8_4_ = fStack_5b8 * fVar217;
          auVar78._12_4_ = fStack_5b4 * fVar218;
          auVar78._16_4_ = fStack_5b0 * fVar219;
          auVar78._20_4_ = fStack_5ac * fVar235;
          auVar78._24_4_ = fStack_5a8 * fVar237;
          auVar78._28_4_ = local_6e0._28_4_;
          _local_700 = vsubps_avx(auVar78,auVar252);
          auVar19 = vcmpps_avx(auVar18,_DAT_01faff00,5);
          auVar253._8_4_ = 0x7f800000;
          auVar253._0_8_ = 0x7f8000007f800000;
          auVar253._12_4_ = 0x7f800000;
          auVar253._16_4_ = 0x7f800000;
          auVar253._20_4_ = 0x7f800000;
          auVar253._24_4_ = 0x7f800000;
          auVar253._28_4_ = 0x7f800000;
          auVar250 = vblendvps_avx(auVar253,auVar72,auVar19);
          auVar356._8_4_ = 0x7fffffff;
          auVar356._0_8_ = 0x7fffffff7fffffff;
          auVar356._12_4_ = 0x7fffffff;
          auVar356._16_4_ = 0x7fffffff;
          auVar356._20_4_ = 0x7fffffff;
          auVar356._24_4_ = 0x7fffffff;
          auVar356._28_4_ = 0x7fffffff;
          auVar18 = vandps_avx(auVar356,local_2e0);
          auVar18 = vmaxps_avx(local_480,auVar18);
          auVar79._4_4_ = auVar18._4_4_ * 1.9073486e-06;
          auVar79._0_4_ = auVar18._0_4_ * 1.9073486e-06;
          auVar79._8_4_ = auVar18._8_4_ * 1.9073486e-06;
          auVar79._12_4_ = auVar18._12_4_ * 1.9073486e-06;
          auVar79._16_4_ = auVar18._16_4_ * 1.9073486e-06;
          auVar79._20_4_ = auVar18._20_4_ * 1.9073486e-06;
          auVar79._24_4_ = auVar18._24_4_ * 1.9073486e-06;
          auVar79._28_4_ = auVar18._28_4_;
          auVar18 = vandps_avx(auVar356,local_4a0);
          auVar18 = vcmpps_avx(auVar18,auVar79,1);
          auVar278._8_4_ = 0xff800000;
          auVar278._0_8_ = 0xff800000ff800000;
          auVar278._12_4_ = 0xff800000;
          auVar278._16_4_ = 0xff800000;
          auVar278._20_4_ = 0xff800000;
          auVar278._24_4_ = 0xff800000;
          auVar278._28_4_ = 0xff800000;
          auVar275 = vblendvps_avx(auVar278,auVar73,auVar19);
          auVar20 = auVar19 & auVar18;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            auVar164 = vandps_avx(auVar18,auVar19);
            auVar101 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
            auVar18 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,2);
            auVar400._8_4_ = 0xff800000;
            auVar400._0_8_ = 0xff800000ff800000;
            auVar400._12_4_ = 0xff800000;
            auVar400._16_4_ = 0xff800000;
            auVar400._20_4_ = 0xff800000;
            auVar400._24_4_ = 0xff800000;
            auVar400._28_4_ = 0xff800000;
            auVar391._8_4_ = 0x7f800000;
            auVar391._0_8_ = 0x7f8000007f800000;
            auVar391._12_4_ = 0x7f800000;
            auVar391._16_4_ = 0x7f800000;
            auVar391._20_4_ = 0x7f800000;
            auVar391._24_4_ = 0x7f800000;
            auVar391._28_4_ = 0x7f800000;
            auVar17 = vblendvps_avx(auVar391,auVar400,auVar18);
            auVar29 = vpmovsxwd_avx(auVar101);
            auVar101 = vpunpckhwd_avx(auVar101,auVar101);
            auVar358._16_16_ = auVar101;
            auVar358._0_16_ = auVar29;
            auVar250 = vblendvps_avx(auVar250,auVar17,auVar358);
            auVar17 = vblendvps_avx(auVar400,auVar391,auVar18);
            auVar275 = vblendvps_avx(auVar275,auVar17,auVar358);
            auVar17 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar124._0_4_ = auVar17._0_4_ ^ auVar164._0_4_;
            auVar124._4_4_ = auVar17._4_4_ ^ auVar164._4_4_;
            auVar124._8_4_ = auVar17._8_4_ ^ auVar164._8_4_;
            auVar124._12_4_ = auVar17._12_4_ ^ auVar164._12_4_;
            auVar124._16_4_ = auVar17._16_4_ ^ auVar164._16_4_;
            auVar124._20_4_ = auVar17._20_4_ ^ auVar164._20_4_;
            auVar124._24_4_ = auVar17._24_4_ ^ auVar164._24_4_;
            auVar124._28_4_ = auVar17._28_4_ ^ auVar164._28_4_;
            auVar164 = vorps_avx(auVar18,auVar124);
            auVar164 = vandps_avx(auVar19,auVar164);
          }
        }
        auVar304 = ZEXT3264(auVar110);
        fVar193 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar331._4_4_ = fVar193;
        auVar331._0_4_ = fVar193;
        auVar331._8_4_ = fVar193;
        auVar331._12_4_ = fVar193;
        auVar331._16_4_ = fVar193;
        auVar331._20_4_ = fVar193;
        auVar331._24_4_ = fVar193;
        local_7c0._28_4_ = fVar193;
        local_7c0._0_28_ = auVar331;
        auVar335 = ZEXT3264(local_7c0);
        fVar213 = (ray->super_RayK<1>).dir.field_0.m128[1];
        auVar357._4_4_ = fVar213;
        auVar357._0_4_ = fVar213;
        auVar357._8_4_ = fVar213;
        auVar357._12_4_ = fVar213;
        auVar357._16_4_ = fVar213;
        auVar357._20_4_ = fVar213;
        auVar357._24_4_ = fVar213;
        auVar357._28_4_ = fVar213;
        auVar359 = ZEXT3264(auVar357);
        fVar214 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar378._4_4_ = fVar214;
        auVar378._0_4_ = fVar214;
        auVar378._8_4_ = fVar214;
        auVar378._12_4_ = fVar214;
        auVar378._16_4_ = fVar214;
        auVar378._20_4_ = fVar214;
        auVar378._24_4_ = fVar214;
        auVar378._28_4_ = fVar214;
        auVar380 = ZEXT3264(auVar378);
        local_4e0 = local_640;
        local_4c0 = vminps_avx(local_500,auVar250);
        _local_520 = vmaxps_avx(local_640,auVar275);
        auVar279 = ZEXT3264(_local_520);
        auVar17 = vcmpps_avx(local_640,local_4c0,2);
        local_5e0 = vandps_avx(auVar17,auVar110);
        auVar255 = ZEXT3264(local_5e0);
        auVar17 = vcmpps_avx(_local_520,local_500,2);
        auVar110 = vandps_avx(auVar17,auVar110);
        auVar366 = ZEXT3264(auVar110);
        auVar17 = vorps_avx(auVar110,local_5e0);
        if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0x7f,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0xbf,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar17[0x1f] < '\0') {
          _local_720 = _local_520;
          auVar18 = _local_720;
          auVar17 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_620._0_4_ = auVar164._0_4_ ^ auVar17._0_4_;
          local_620._4_4_ = auVar164._4_4_ ^ auVar17._4_4_;
          fStack_618 = (float)(auVar164._8_4_ ^ auVar17._8_4_);
          fStack_614 = (float)(auVar164._12_4_ ^ auVar17._12_4_);
          fStack_610 = (float)(auVar164._16_4_ ^ auVar17._16_4_);
          fStack_60c = (float)(auVar164._20_4_ ^ auVar17._20_4_);
          fStack_608 = (float)(auVar164._24_4_ ^ auVar17._24_4_);
          fStack_604 = (float)((uint)auVar164._28_4_ ^ auVar17._28_4_);
          auVar117._0_4_ =
               fVar193 * auVar156._0_4_ + fVar213 * auVar180._0_4_ + fVar214 * auVar205._0_4_;
          auVar117._4_4_ =
               fVar193 * auVar156._4_4_ + fVar213 * auVar180._4_4_ + fVar214 * auVar205._4_4_;
          auVar117._8_4_ =
               fVar193 * auVar156._8_4_ + fVar213 * auVar180._8_4_ + fVar214 * auVar205._8_4_;
          auVar117._12_4_ =
               fVar193 * auVar156._12_4_ + fVar213 * auVar180._12_4_ + fVar214 * auVar205._12_4_;
          auVar117._16_4_ =
               fVar193 * auVar156._16_4_ + fVar213 * auVar180._16_4_ + fVar214 * auVar205._16_4_;
          auVar117._20_4_ =
               fVar193 * auVar156._20_4_ + fVar213 * auVar180._20_4_ + fVar214 * auVar205._20_4_;
          auVar117._24_4_ =
               fVar193 * auVar156._24_4_ + fVar213 * auVar180._24_4_ + fVar214 * auVar205._24_4_;
          auVar117._28_4_ = auVar164._28_4_ + auVar156._28_4_ + auVar180._28_4_;
          auVar158._8_4_ = 0x7fffffff;
          auVar158._0_8_ = 0x7fffffff7fffffff;
          auVar158._12_4_ = 0x7fffffff;
          auVar158._16_4_ = 0x7fffffff;
          auVar158._20_4_ = 0x7fffffff;
          auVar158._24_4_ = 0x7fffffff;
          auVar158._28_4_ = 0x7fffffff;
          auVar164 = vandps_avx(auVar117,auVar158);
          auVar159._8_4_ = 0x3e99999a;
          auVar159._0_8_ = 0x3e99999a3e99999a;
          auVar159._12_4_ = 0x3e99999a;
          auVar159._16_4_ = 0x3e99999a;
          auVar159._20_4_ = 0x3e99999a;
          auVar159._24_4_ = 0x3e99999a;
          auVar159._28_4_ = 0x3e99999a;
          auVar164 = vcmpps_avx(auVar164,auVar159,1);
          auVar164 = vorps_avx(auVar164,_local_620);
          auVar160._8_4_ = 3;
          auVar160._0_8_ = 0x300000003;
          auVar160._12_4_ = 3;
          auVar160._16_4_ = 3;
          auVar160._20_4_ = 3;
          auVar160._24_4_ = 3;
          auVar160._28_4_ = 3;
          auVar183._8_4_ = 2;
          auVar183._0_8_ = 0x200000002;
          auVar183._12_4_ = 2;
          auVar183._16_4_ = 2;
          auVar183._20_4_ = 2;
          auVar183._24_4_ = 2;
          auVar183._28_4_ = 2;
          auVar164 = vblendvps_avx(auVar183,auVar160,auVar164);
          local_660 = ZEXT432(local_b0c);
          auVar29 = vpshufd_avx(ZEXT416(local_b0c),0);
          auVar189 = ZEXT1664(auVar29);
          auVar101 = vpcmpgtd_avx(auVar164._16_16_,auVar29);
          local_680 = auVar29._0_4_;
          fStack_67c = auVar29._4_4_;
          fStack_678 = auVar29._8_4_;
          fStack_674 = auVar29._12_4_;
          auVar29 = vpcmpgtd_avx(auVar164._0_16_,auVar29);
          auVar161._16_16_ = auVar101;
          auVar161._0_16_ = auVar29;
          local_600 = vblendps_avx(ZEXT1632(auVar29),auVar161,0xf0);
          local_560 = vandnps_avx(local_600,local_5e0);
          auVar304 = ZEXT3264(local_560);
          auVar164 = local_5e0 & ~local_600;
          local_820 = auVar21;
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar164 >> 0x7f,0) == '\0') &&
                (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0xbf,0) == '\0') &&
              (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar164[0x1f]) {
            fVar193 = (ray->super_RayK<1>).tfar;
            auVar118._4_4_ = fVar193;
            auVar118._0_4_ = fVar193;
            auVar118._8_4_ = fVar193;
            auVar118._12_4_ = fVar193;
            auVar118._16_4_ = fVar193;
            auVar118._20_4_ = fVar193;
            auVar118._24_4_ = fVar193;
            auVar118._28_4_ = fVar193;
            local_720._0_4_ = local_520._0_4_;
            local_720._4_4_ = local_520._4_4_;
            fStack_718 = local_520._8_4_;
            fStack_714 = local_520._12_4_;
            fStack_710 = local_520._16_4_;
            fStack_70c = local_520._20_4_;
            fStack_708 = local_520._24_4_;
            fStack_704 = local_520._28_4_;
            local_8a0 = _local_520;
            fVar193 = (float)local_720._0_4_;
            fVar213 = (float)local_720._4_4_;
            fVar214 = fStack_718;
            fVar215 = fStack_714;
            fVar216 = fStack_710;
            fVar217 = fStack_70c;
            fVar218 = fStack_708;
            fVar219 = fStack_704;
            _local_720 = auVar18;
          }
          else {
            auVar189 = ZEXT3264(local_640);
            local_7e0._4_4_ = local_640._4_4_ + (float)local_760._4_4_;
            local_7e0._0_4_ = local_640._0_4_ + (float)local_760._0_4_;
            fStack_7d8 = local_640._8_4_ + fStack_758;
            fStack_7d4 = local_640._12_4_ + fStack_754;
            fStack_7d0 = local_640._16_4_ + fStack_750;
            fStack_7cc = local_640._20_4_ + fStack_74c;
            fStack_7c8 = local_640._24_4_ + fStack_748;
            fStack_7c4 = local_640._28_4_ + fStack_744;
            _local_6a0 = auVar357;
            local_9c0 = auVar110;
            local_9e0 = auVar378;
            do {
              auVar119._8_4_ = 0x7f800000;
              auVar119._0_8_ = 0x7f8000007f800000;
              auVar119._12_4_ = 0x7f800000;
              auVar119._16_4_ = 0x7f800000;
              auVar119._20_4_ = 0x7f800000;
              auVar119._24_4_ = 0x7f800000;
              auVar119._28_4_ = 0x7f800000;
              auVar110 = auVar304._0_32_;
              auVar164 = vblendvps_avx(auVar119,auVar189._0_32_,auVar110);
              auVar17 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar17 = vminps_avx(auVar164,auVar17);
              auVar18 = vshufpd_avx(auVar17,auVar17,5);
              auVar17 = vminps_avx(auVar17,auVar18);
              auVar18 = vperm2f128_avx(auVar17,auVar17,1);
              auVar17 = vminps_avx(auVar17,auVar18);
              auVar164 = vcmpps_avx(auVar164,auVar17,0);
              auVar17 = auVar110 & auVar164;
              if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar17 >> 0x7f,0) != '\0') ||
                    (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0xbf,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar17[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar164,auVar110);
              }
              uVar89 = vmovmskps_avx(auVar110);
              uVar91 = 0;
              if (uVar89 != 0) {
                for (; (uVar89 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
                }
              }
              uVar94 = (ulong)uVar91;
              *(undefined4 *)(local_560 + uVar94 * 4) = 0;
              aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_840 = aVar3.x;
              fStack_83c = aVar3.y;
              fStack_838 = aVar3.z;
              aStack_834 = aVar3.field_3;
              auVar101 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
              fVar193 = local_1a0[uVar94];
              uVar91 = *(uint *)(local_4e0 + uVar94 * 4);
              if (auVar101._0_4_ < 0.0) {
                fVar213 = sqrtf(auVar101._0_4_);
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                fVar213 = auVar101._0_4_;
              }
              auVar29 = vminps_avx(_local_9f0,_local_a10);
              auVar101 = vmaxps_avx(_local_9f0,_local_a10);
              auVar106 = vminps_avx(_local_a00,_local_a20);
              auVar146 = vminps_avx(auVar29,auVar106);
              auVar29 = vmaxps_avx(_local_a00,_local_a20);
              auVar106 = vmaxps_avx(auVar101,auVar29);
              auVar195._8_4_ = 0x7fffffff;
              auVar195._0_8_ = 0x7fffffff7fffffff;
              auVar195._12_4_ = 0x7fffffff;
              auVar101 = vandps_avx(auVar146,auVar195);
              auVar29 = vandps_avx(auVar106,auVar195);
              auVar101 = vmaxps_avx(auVar101,auVar29);
              auVar29 = vmovshdup_avx(auVar101);
              auVar29 = vmaxss_avx(auVar29,auVar101);
              auVar101 = vshufpd_avx(auVar101,auVar101,1);
              auVar101 = vmaxss_avx(auVar101,auVar29);
              local_860 = auVar101._0_4_ * 1.9073486e-06;
              local_8c0._0_4_ = fVar213 * 1.9073486e-06;
              _local_7a0 = vshufps_avx(auVar106,auVar106,0xff);
              auVar101 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar193),0x10);
              auVar335 = ZEXT1664(auVar101);
              lVar93 = 5;
              do {
                auVar330 = auVar335._0_16_;
                auVar29 = vmovshdup_avx(auVar330);
                fVar218 = auVar29._0_4_;
                fVar217 = 1.0 - fVar218;
                fVar193 = fVar217 * fVar217;
                fVar213 = fVar217 * fVar193;
                fVar214 = fVar218 * fVar218;
                fVar215 = fVar218 * fVar214;
                fVar216 = fVar218 * fVar217;
                auVar101 = vshufps_avx(ZEXT416((uint)(fVar215 * 0.16666667)),
                                       ZEXT416((uint)(fVar215 * 0.16666667)),0);
                auVar106 = ZEXT416((uint)((fVar215 * 4.0 + fVar213 +
                                          fVar218 * fVar216 * 12.0 + fVar217 * fVar216 * 6.0) *
                                         0.16666667));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar146 = ZEXT416((uint)((fVar213 * 4.0 + fVar215 +
                                          fVar217 * fVar216 * 12.0 + fVar218 * fVar216 * 6.0) *
                                         0.16666667));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar105 = vshufps_avx(auVar330,auVar330,0);
                auVar171._0_4_ = auVar105._0_4_ * local_840 + 0.0;
                auVar171._4_4_ = auVar105._4_4_ * fStack_83c + 0.0;
                auVar171._8_4_ = auVar105._8_4_ * fStack_838 + 0.0;
                auVar171._12_4_ = auVar105._12_4_ * aStack_834.w + 0.0;
                auVar105 = vshufps_avx(ZEXT416((uint)(fVar213 * 0.16666667)),
                                       ZEXT416((uint)(fVar213 * 0.16666667)),0);
                auVar102._0_4_ =
                     auVar105._0_4_ * (float)local_9f0._0_4_ +
                     auVar146._0_4_ * (float)local_a10._0_4_ +
                     auVar101._0_4_ * (float)local_a20._0_4_ +
                     auVar106._0_4_ * (float)local_a00._0_4_;
                auVar102._4_4_ =
                     auVar105._4_4_ * (float)local_9f0._4_4_ +
                     auVar146._4_4_ * (float)local_a10._4_4_ +
                     auVar101._4_4_ * (float)local_a20._4_4_ +
                     auVar106._4_4_ * (float)local_a00._4_4_;
                auVar102._8_4_ =
                     auVar105._8_4_ * fStack_9e8 +
                     auVar146._8_4_ * fStack_a08 +
                     auVar101._8_4_ * fStack_a18 + auVar106._8_4_ * fStack_9f8;
                auVar102._12_4_ =
                     auVar105._12_4_ * fStack_9e4 +
                     auVar146._12_4_ * fStack_a04 +
                     auVar101._12_4_ * fStack_a14 + auVar106._12_4_ * fStack_9f4;
                local_880._0_16_ = auVar102;
                auVar101 = vsubps_avx(auVar171,auVar102);
                _local_a60 = auVar101;
                auVar101 = vdpps_avx(auVar101,auVar101,0x7f);
                fVar213 = auVar101._0_4_;
                if (fVar213 < 0.0) {
                  local_a40._0_16_ = auVar29;
                  local_980._0_4_ = fVar214;
                  local_9a0._0_4_ = fVar193;
                  local_8e0._0_4_ = fVar216;
                  fVar215 = sqrtf(fVar213);
                  fVar193 = (float)local_9a0._0_4_;
                  fVar214 = (float)local_980._0_4_;
                  fVar216 = (float)local_8e0._0_4_;
                  auVar29 = local_a40._0_16_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar101,auVar101);
                  fVar215 = auVar106._0_4_;
                }
                fVar218 = auVar29._0_4_;
                auVar29 = vshufps_avx(ZEXT416((uint)(fVar214 * 0.5)),ZEXT416((uint)(fVar214 * 0.5)),
                                      0);
                auVar106 = ZEXT416((uint)((fVar193 + fVar216 * 4.0) * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar146 = ZEXT416((uint)((fVar218 * -fVar218 - fVar216 * 4.0) * 0.5));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar105 = ZEXT416((uint)(fVar217 * -fVar217 * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar317._0_4_ =
                     (float)local_9f0._0_4_ * auVar105._0_4_ +
                     (float)local_a10._0_4_ * auVar146._0_4_ +
                     (float)local_a20._0_4_ * auVar29._0_4_ +
                     (float)local_a00._0_4_ * auVar106._0_4_;
                auVar317._4_4_ =
                     (float)local_9f0._4_4_ * auVar105._4_4_ +
                     (float)local_a10._4_4_ * auVar146._4_4_ +
                     (float)local_a20._4_4_ * auVar29._4_4_ +
                     (float)local_a00._4_4_ * auVar106._4_4_;
                auVar317._8_4_ =
                     fStack_9e8 * auVar105._8_4_ +
                     fStack_a08 * auVar146._8_4_ +
                     fStack_a18 * auVar29._8_4_ + fStack_9f8 * auVar106._8_4_;
                auVar317._12_4_ =
                     fStack_9e4 * auVar105._12_4_ +
                     fStack_a04 * auVar146._12_4_ +
                     fStack_a14 * auVar29._12_4_ + fStack_9f4 * auVar106._12_4_;
                auVar29 = vshufps_avx(auVar330,auVar330,0x55);
                auVar106 = ZEXT416((uint)(fVar217 - (fVar218 + fVar218)));
                auVar146 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = ZEXT416((uint)(fVar218 - (fVar217 + fVar217)));
                auVar105 = vshufps_avx(auVar106,auVar106,0);
                auVar5 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
                auVar106 = vdpps_avx(auVar317,auVar317,0x7f);
                auVar142._0_4_ =
                     (float)local_9f0._0_4_ * auVar5._0_4_ +
                     (float)local_a10._0_4_ * auVar105._0_4_ +
                     (float)local_a20._0_4_ * auVar29._0_4_ +
                     (float)local_a00._0_4_ * auVar146._0_4_;
                auVar142._4_4_ =
                     (float)local_9f0._4_4_ * auVar5._4_4_ +
                     (float)local_a10._4_4_ * auVar105._4_4_ +
                     (float)local_a20._4_4_ * auVar29._4_4_ +
                     (float)local_a00._4_4_ * auVar146._4_4_;
                auVar142._8_4_ =
                     fStack_9e8 * auVar5._8_4_ +
                     fStack_a08 * auVar105._8_4_ +
                     fStack_a18 * auVar29._8_4_ + fStack_9f8 * auVar146._8_4_;
                auVar142._12_4_ =
                     fStack_9e4 * auVar5._12_4_ +
                     fStack_a04 * auVar105._12_4_ +
                     fStack_a14 * auVar29._12_4_ + fStack_9f4 * auVar146._12_4_;
                auVar29 = vblendps_avx(auVar106,_DAT_01f7aa10,0xe);
                auVar146 = vrsqrtss_avx(auVar29,auVar29);
                fVar214 = auVar146._0_4_;
                fVar193 = auVar106._0_4_;
                auVar146 = vdpps_avx(auVar317,auVar142,0x7f);
                auVar105 = vshufps_avx(auVar106,auVar106,0);
                auVar143._0_4_ = auVar142._0_4_ * auVar105._0_4_;
                auVar143._4_4_ = auVar142._4_4_ * auVar105._4_4_;
                auVar143._8_4_ = auVar142._8_4_ * auVar105._8_4_;
                auVar143._12_4_ = auVar142._12_4_ * auVar105._12_4_;
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar220._0_4_ = auVar317._0_4_ * auVar146._0_4_;
                auVar220._4_4_ = auVar317._4_4_ * auVar146._4_4_;
                auVar220._8_4_ = auVar317._8_4_ * auVar146._8_4_;
                auVar220._12_4_ = auVar317._12_4_ * auVar146._12_4_;
                auVar5 = vsubps_avx(auVar143,auVar220);
                auVar146 = vrcpss_avx(auVar29,auVar29);
                auVar29 = vmaxss_avx(ZEXT416((uint)local_860),
                                     ZEXT416((uint)(auVar335._0_4_ * (float)local_8c0._0_4_)));
                auVar146 = ZEXT416((uint)(auVar146._0_4_ * (2.0 - fVar193 * auVar146._0_4_)));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                uVar94 = CONCAT44(auVar317._4_4_,auVar317._0_4_);
                auVar242._0_8_ = uVar94 ^ 0x8000000080000000;
                auVar242._8_4_ = -auVar317._8_4_;
                auVar242._12_4_ = -auVar317._12_4_;
                auVar105 = ZEXT416((uint)(fVar214 * 1.5 +
                                         fVar193 * -0.5 * fVar214 * fVar214 * fVar214));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar196._0_4_ = auVar105._0_4_ * auVar5._0_4_ * auVar146._0_4_;
                auVar196._4_4_ = auVar105._4_4_ * auVar5._4_4_ * auVar146._4_4_;
                auVar196._8_4_ = auVar105._8_4_ * auVar5._8_4_ * auVar146._8_4_;
                auVar196._12_4_ = auVar105._12_4_ * auVar5._12_4_ * auVar146._12_4_;
                auVar268._0_4_ = auVar317._0_4_ * auVar105._0_4_;
                auVar268._4_4_ = auVar317._4_4_ * auVar105._4_4_;
                auVar268._8_4_ = auVar317._8_4_ * auVar105._8_4_;
                auVar268._12_4_ = auVar317._12_4_ * auVar105._12_4_;
                local_a40._0_4_ = auVar29._0_4_;
                if (fVar193 < 0.0) {
                  local_980._0_4_ = fVar215;
                  local_9a0._0_16_ = auVar242;
                  local_8e0._0_16_ = auVar268;
                  local_820._0_16_ = auVar196;
                  fVar214 = sqrtf(fVar193);
                  auVar196 = local_820._0_16_;
                  auVar242 = local_9a0._0_16_;
                  auVar268 = local_8e0._0_16_;
                  fVar193 = (float)local_a40._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  fVar214 = auVar106._0_4_;
                  local_980._0_4_ = fVar215;
                  fVar193 = auVar29._0_4_;
                }
                auVar29 = vdpps_avx(_local_a60,auVar268,0x7f);
                fVar214 = (local_860 / fVar214) * ((float)local_980._0_4_ + 1.0) +
                          fVar193 + (float)local_980._0_4_ * local_860;
                auVar106 = vdpps_avx(auVar242,auVar268,0x7f);
                auVar146 = vdpps_avx(_local_a60,auVar196,0x7f);
                auVar83._4_4_ = fStack_83c;
                auVar83._0_4_ = local_840;
                auVar83._8_4_ = fStack_838;
                auVar83._12_4_ = aStack_834.a;
                auVar105 = vdpps_avx(auVar83,auVar268,0x7f);
                auVar5 = vdpps_avx(_local_a60,auVar242,0x7f);
                fVar215 = auVar106._0_4_ + auVar146._0_4_;
                fVar216 = auVar29._0_4_;
                auVar103._0_4_ = fVar216 * fVar216;
                auVar103._4_4_ = auVar29._4_4_ * auVar29._4_4_;
                auVar103._8_4_ = auVar29._8_4_ * auVar29._8_4_;
                auVar103._12_4_ = auVar29._12_4_ * auVar29._12_4_;
                auVar146 = vsubps_avx(auVar101,auVar103);
                local_980._0_16_ = ZEXT416((uint)fVar215);
                auVar106 = vdpps_avx(_local_a60,auVar83,0x7f);
                fVar217 = auVar5._0_4_ - fVar216 * fVar215;
                fVar216 = auVar106._0_4_ - fVar216 * auVar105._0_4_;
                auVar106 = vrsqrtss_avx(auVar146,auVar146);
                fVar218 = auVar146._0_4_;
                fVar215 = auVar106._0_4_;
                fVar215 = fVar215 * 1.5 + fVar218 * -0.5 * fVar215 * fVar215 * fVar215;
                if (fVar218 < 0.0) {
                  local_9a0._0_16_ = auVar29;
                  local_8e0._0_4_ = fVar214;
                  local_820._0_16_ = auVar105;
                  local_780._0_4_ = fVar217;
                  local_900._0_4_ = fVar216;
                  local_8a0._0_4_ = fVar215;
                  fVar218 = sqrtf(fVar218);
                  fVar215 = (float)local_8a0._0_4_;
                  fVar217 = (float)local_780._0_4_;
                  fVar216 = (float)local_900._0_4_;
                  auVar105 = local_820._0_16_;
                  auVar29 = local_9a0._0_16_;
                  fVar214 = (float)local_8e0._0_4_;
                  fVar193 = (float)local_a40._0_4_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar146,auVar146);
                  fVar218 = auVar106._0_4_;
                }
                auVar366 = ZEXT3264(local_9c0);
                auVar5 = vpermilps_avx(local_880._0_16_,0xff);
                auVar6 = vshufps_avx(auVar317,auVar317,0xff);
                fVar219 = fVar217 * fVar215 - auVar6._0_4_;
                auVar221._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                auVar221._8_4_ = auVar105._8_4_ ^ 0x80000000;
                auVar221._12_4_ = auVar105._12_4_ ^ 0x80000000;
                auVar243._0_4_ = -fVar219;
                auVar243._4_4_ = 0x80000000;
                auVar243._8_4_ = 0x80000000;
                auVar243._12_4_ = 0x80000000;
                auVar255 = ZEXT1664(auVar243);
                fVar217 = local_980._0_4_ * fVar216 * fVar215;
                auVar279 = ZEXT464((uint)fVar217);
                auVar106 = vinsertps_avx(auVar243,ZEXT416((uint)(fVar216 * fVar215)),0x1c);
                auVar105 = vmovsldup_avx(ZEXT416((uint)(fVar217 - auVar105._0_4_ * fVar219)));
                auVar106 = vdivps_avx(auVar106,auVar105);
                auVar146 = vinsertps_avx(local_980._0_16_,auVar221,0x10);
                auVar146 = vdivps_avx(auVar146,auVar105);
                auVar105 = vmovsldup_avx(auVar29);
                auVar108 = ZEXT416((uint)(fVar218 - auVar5._0_4_));
                auVar5 = vmovsldup_avx(auVar108);
                auVar172._0_4_ = auVar105._0_4_ * auVar106._0_4_ + auVar5._0_4_ * auVar146._0_4_;
                auVar172._4_4_ = auVar105._4_4_ * auVar106._4_4_ + auVar5._4_4_ * auVar146._4_4_;
                auVar172._8_4_ = auVar105._8_4_ * auVar106._8_4_ + auVar5._8_4_ * auVar146._8_4_;
                auVar172._12_4_ =
                     auVar105._12_4_ * auVar106._12_4_ + auVar5._12_4_ * auVar146._12_4_;
                auVar106 = vsubps_avx(auVar330,auVar172);
                auVar335 = ZEXT1664(auVar106);
                auVar173._8_4_ = 0x7fffffff;
                auVar173._0_8_ = 0x7fffffff7fffffff;
                auVar173._12_4_ = 0x7fffffff;
                auVar29 = vandps_avx(auVar29,auVar173);
                if (auVar29._0_4_ < fVar214) {
                  auVar197._8_4_ = 0x7fffffff;
                  auVar197._0_8_ = 0x7fffffff7fffffff;
                  auVar197._12_4_ = 0x7fffffff;
                  auVar29 = vandps_avx(auVar108,auVar197);
                  if (auVar29._0_4_ < (float)local_7a0._0_4_ * 1.9073486e-06 + fVar193 + fVar214) {
                    fVar193 = auVar106._0_4_ + (float)local_7f0._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar193) {
                      fVar214 = (ray->super_RayK<1>).tfar;
                      auVar279 = ZEXT464((uint)fVar214);
                      if (fVar193 <= fVar214) {
                        auVar29 = vmovshdup_avx(auVar106);
                        fVar215 = auVar29._0_4_;
                        if ((0.0 <= fVar215) && (fVar215 <= 1.0)) {
                          auVar101 = vrsqrtss_avx(auVar101,auVar101);
                          fVar216 = auVar101._0_4_;
                          auVar255 = ZEXT464((uint)(fVar213 * -0.5));
                          pGVar11 = (context->scene->geometries).items[uVar88].ptr;
                          if ((pGVar11->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar101 = ZEXT416((uint)(fVar216 * 1.5 +
                                                     fVar213 * -0.5 * fVar216 * fVar216 * fVar216));
                            auVar101 = vshufps_avx(auVar101,auVar101,0);
                            auVar198._0_4_ = auVar101._0_4_ * (float)local_a60._0_4_;
                            auVar198._4_4_ = auVar101._4_4_ * (float)local_a60._4_4_;
                            auVar198._8_4_ = auVar101._8_4_ * fStack_a58;
                            auVar198._12_4_ = auVar101._12_4_ * fStack_a54;
                            auVar144._0_4_ = auVar317._0_4_ + auVar6._0_4_ * auVar198._0_4_;
                            auVar144._4_4_ = auVar317._4_4_ + auVar6._4_4_ * auVar198._4_4_;
                            auVar144._8_4_ = auVar317._8_4_ + auVar6._8_4_ * auVar198._8_4_;
                            auVar144._12_4_ = auVar317._12_4_ + auVar6._12_4_ * auVar198._12_4_;
                            auVar101 = vshufps_avx(auVar198,auVar198,0xc9);
                            auVar29 = vshufps_avx(auVar317,auVar317,0xc9);
                            auVar199._0_4_ = auVar29._0_4_ * auVar198._0_4_;
                            auVar199._4_4_ = auVar29._4_4_ * auVar198._4_4_;
                            auVar199._8_4_ = auVar29._8_4_ * auVar198._8_4_;
                            auVar199._12_4_ = auVar29._12_4_ * auVar198._12_4_;
                            auVar222._0_4_ = auVar317._0_4_ * auVar101._0_4_;
                            auVar222._4_4_ = auVar317._4_4_ * auVar101._4_4_;
                            auVar222._8_4_ = auVar317._8_4_ * auVar101._8_4_;
                            auVar222._12_4_ = auVar317._12_4_ * auVar101._12_4_;
                            auVar146 = vsubps_avx(auVar222,auVar199);
                            auVar101 = vshufps_avx(auVar146,auVar146,0xc9);
                            auVar29 = vshufps_avx(auVar144,auVar144,0xc9);
                            auVar255 = ZEXT1664(auVar29);
                            auVar223._0_4_ = auVar29._0_4_ * auVar101._0_4_;
                            auVar223._4_4_ = auVar29._4_4_ * auVar101._4_4_;
                            auVar223._8_4_ = auVar29._8_4_ * auVar101._8_4_;
                            auVar223._12_4_ = auVar29._12_4_ * auVar101._12_4_;
                            auVar101 = vshufps_avx(auVar146,auVar146,0xd2);
                            auVar145._0_4_ = auVar144._0_4_ * auVar101._0_4_;
                            auVar145._4_4_ = auVar144._4_4_ * auVar101._4_4_;
                            auVar145._8_4_ = auVar144._8_4_ * auVar101._8_4_;
                            auVar145._12_4_ = auVar144._12_4_ * auVar101._12_4_;
                            auVar101 = vsubps_avx(auVar223,auVar145);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar193;
                              auVar29 = vshufps_avx(auVar101,auVar101,0xe9);
                              uVar2 = vmovlps_avx(auVar29);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                              (ray->Ng).field_0.field_0.z = auVar101._0_4_;
                              ray->u = fVar215;
                              ray->v = 0.0;
                              ray->primID = local_920._0_4_;
                              ray->geomID = uVar88;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar146 = vshufps_avx(auVar101,auVar101,0xe9);
                              local_950 = vmovlps_avx(auVar146);
                              local_948 = auVar101._0_4_;
                              local_944 = fVar215;
                              local_940 = 0;
                              local_93c = local_920._0_4_;
                              local_938 = uVar88;
                              local_934 = context->user->instID[0];
                              local_930 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar193;
                              local_740._0_4_ = 0xffffffff;
                              local_a98.valid = (int *)local_740;
                              local_a98.geometryUserPtr = pGVar11->userPtr;
                              local_a98.context = context->user;
                              local_a98.hit = (RTCHitN *)&local_950;
                              local_a98.N = 1;
                              local_a98.ray = (RTCRayN *)ray;
                              if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010c0e4d:
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar255 = ZEXT1664(auVar255._0_16_);
                                  auVar279 = ZEXT1664(auVar279._0_16_);
                                  auVar335 = ZEXT1664(auVar335._0_16_);
                                  (*p_Var12)(&local_a98);
                                  if (*local_a98.valid == 0) goto LAB_010c0ee1;
                                }
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a98.hit;
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a98.hit + 4);
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a98.hit + 8);
                                *(float *)((long)local_a98.ray + 0x3c) =
                                     *(float *)(local_a98.hit + 0xc);
                                *(float *)((long)local_a98.ray + 0x40) =
                                     *(float *)(local_a98.hit + 0x10);
                                *(float *)((long)local_a98.ray + 0x44) =
                                     *(float *)(local_a98.hit + 0x14);
                                *(float *)((long)local_a98.ray + 0x48) =
                                     *(float *)(local_a98.hit + 0x18);
                                *(float *)((long)local_a98.ray + 0x4c) =
                                     *(float *)(local_a98.hit + 0x1c);
                                *(float *)((long)local_a98.ray + 0x50) =
                                     *(float *)(local_a98.hit + 0x20);
                              }
                              else {
                                auVar255 = ZEXT1664(auVar29);
                                auVar279 = ZEXT464((uint)fVar214);
                                auVar335 = ZEXT1664(auVar106);
                                (*pGVar11->intersectionFilterN)(&local_a98);
                                if (*local_a98.valid != 0) goto LAB_010c0e4d;
LAB_010c0ee1:
                                (ray->super_RayK<1>).tfar = fVar214;
                              }
                              auVar366 = ZEXT3264(local_9c0);
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar93 = lVar93 + -1;
              } while (lVar93 != 0);
              auVar164 = local_560;
              fVar193 = (ray->super_RayK<1>).tfar;
              auVar118._4_4_ = fVar193;
              auVar118._0_4_ = fVar193;
              auVar118._8_4_ = fVar193;
              auVar118._12_4_ = fVar193;
              auVar118._16_4_ = fVar193;
              auVar118._20_4_ = fVar193;
              auVar118._24_4_ = fVar193;
              auVar118._28_4_ = fVar193;
              auVar110 = vcmpps_avx(_local_7e0,auVar118,2);
              local_560 = vandps_avx(auVar110,local_560);
              auVar304 = ZEXT3264(local_560);
              auVar164 = auVar164 & auVar110;
              auVar189 = ZEXT3264(local_640);
              auVar331 = local_7c0._0_28_;
            } while ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar164 >> 0x7f,0) != '\0') ||
                       (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar164 >> 0xbf,0) != '\0') ||
                     (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar164[0x1f] < '\0');
            auVar304 = ZEXT3264(_local_520);
            local_8a0 = _local_520;
            auVar359 = ZEXT3264(_local_6a0);
            auVar380 = ZEXT3264(local_9e0);
            fVar193 = (float)local_720._0_4_;
            fVar213 = (float)local_720._4_4_;
            fVar214 = fStack_718;
            fVar215 = fStack_714;
            fVar216 = fStack_710;
            fVar217 = fStack_70c;
            fVar218 = fStack_708;
            fVar219 = fStack_704;
          }
          auVar162._0_4_ =
               auVar331._0_4_ * (float)local_6c0._0_4_ +
               auVar359._0_4_ * (float)local_6e0._0_4_ + auVar380._0_4_ * (float)local_700._0_4_;
          auVar162._4_4_ =
               auVar331._4_4_ * (float)local_6c0._4_4_ +
               auVar359._4_4_ * (float)local_6e0._4_4_ + auVar380._4_4_ * (float)local_700._4_4_;
          auVar162._8_4_ =
               auVar331._8_4_ * fStack_6b8 +
               auVar359._8_4_ * fStack_6d8 + auVar380._8_4_ * fStack_6f8;
          auVar162._12_4_ =
               auVar331._12_4_ * fStack_6b4 +
               auVar359._12_4_ * fStack_6d4 + auVar380._12_4_ * fStack_6f4;
          auVar162._16_4_ =
               auVar331._16_4_ * fStack_6b0 +
               auVar359._16_4_ * fStack_6d0 + auVar380._16_4_ * fStack_6f0;
          auVar162._20_4_ =
               auVar331._20_4_ * fStack_6ac +
               auVar359._20_4_ * fStack_6cc + auVar380._20_4_ * fStack_6ec;
          auVar162._24_4_ =
               auVar331._24_4_ * fStack_6a8 +
               auVar359._24_4_ * fStack_6c8 + auVar380._24_4_ * fStack_6e8;
          auVar162._28_4_ = auVar189._28_4_ + auVar189._28_4_ + auVar304._28_4_;
          auVar184._8_4_ = 0x7fffffff;
          auVar184._0_8_ = 0x7fffffff7fffffff;
          auVar184._12_4_ = 0x7fffffff;
          auVar184._16_4_ = 0x7fffffff;
          auVar184._20_4_ = 0x7fffffff;
          auVar184._24_4_ = 0x7fffffff;
          auVar184._28_4_ = 0x7fffffff;
          auVar110 = vandps_avx(auVar162,auVar184);
          auVar185._8_4_ = 0x3e99999a;
          auVar185._0_8_ = 0x3e99999a3e99999a;
          auVar185._12_4_ = 0x3e99999a;
          auVar185._16_4_ = 0x3e99999a;
          auVar185._20_4_ = 0x3e99999a;
          auVar185._24_4_ = 0x3e99999a;
          auVar185._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar185,1);
          auVar164 = vorps_avx(auVar110,_local_620);
          auVar186._0_4_ = (float)local_760._0_4_ + fVar193;
          auVar186._4_4_ = (float)local_760._4_4_ + fVar213;
          auVar186._8_4_ = fStack_758 + fVar214;
          auVar186._12_4_ = fStack_754 + fVar215;
          auVar186._16_4_ = fStack_750 + fVar216;
          auVar186._20_4_ = fStack_74c + fVar217;
          auVar186._24_4_ = fStack_748 + fVar218;
          auVar186._28_4_ = fStack_744 + fVar219;
          auVar110 = vcmpps_avx(auVar186,auVar118,2);
          _local_7e0 = vandps_avx(auVar366._0_32_,auVar110);
          auVar187._8_4_ = 3;
          auVar187._0_8_ = 0x300000003;
          auVar187._12_4_ = 3;
          auVar187._16_4_ = 3;
          auVar187._20_4_ = 3;
          auVar187._24_4_ = 3;
          auVar187._28_4_ = 3;
          auVar212._8_4_ = 2;
          auVar212._0_8_ = 0x200000002;
          auVar212._12_4_ = 2;
          auVar212._16_4_ = 2;
          auVar212._20_4_ = 2;
          auVar212._24_4_ = 2;
          auVar212._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar212,auVar187,auVar164);
          auVar86._4_4_ = fStack_67c;
          auVar86._0_4_ = local_680;
          auVar86._8_4_ = fStack_678;
          auVar86._12_4_ = fStack_674;
          auVar101 = vpcmpgtd_avx(auVar110._16_16_,auVar86);
          auVar29 = vpshufd_avx(local_660._0_16_,0);
          auVar29 = vpcmpgtd_avx(auVar110._0_16_,auVar29);
          auVar188._16_16_ = auVar101;
          auVar188._0_16_ = auVar118._0_16_;
          local_7c0 = vblendps_avx(ZEXT1632(auVar29),auVar188,0xf0);
          local_740 = vandnps_avx(local_7c0,_local_7e0);
          auVar110 = _local_7e0 & ~local_7c0;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            local_7a0._4_4_ = (float)local_760._4_4_ + local_520._4_4_;
            local_7a0._0_4_ = (float)local_760._0_4_ + local_520._0_4_;
            fStack_798 = fStack_758 + local_520._8_4_;
            fStack_794 = fStack_754 + local_520._12_4_;
            fStack_790 = fStack_750 + local_520._16_4_;
            fStack_78c = fStack_74c + local_520._20_4_;
            fStack_788 = fStack_748 + local_520._24_4_;
            fStack_784 = fStack_744 + local_520._28_4_;
            local_8a0 = _local_520;
            do {
              auVar120._8_4_ = 0x7f800000;
              auVar120._0_8_ = 0x7f8000007f800000;
              auVar120._12_4_ = 0x7f800000;
              auVar120._16_4_ = 0x7f800000;
              auVar120._20_4_ = 0x7f800000;
              auVar120._24_4_ = 0x7f800000;
              auVar120._28_4_ = 0x7f800000;
              auVar110 = vblendvps_avx(auVar120,local_8a0,local_740);
              auVar164 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar164 = vminps_avx(auVar110,auVar164);
              auVar17 = vshufpd_avx(auVar164,auVar164,5);
              auVar164 = vminps_avx(auVar164,auVar17);
              auVar17 = vperm2f128_avx(auVar164,auVar164,1);
              auVar164 = vminps_avx(auVar164,auVar17);
              auVar164 = vcmpps_avx(auVar110,auVar164,0);
              auVar17 = local_740 & auVar164;
              auVar110 = local_740;
              if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar17 >> 0x7f,0) != '\0') ||
                    (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0xbf,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar17[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar164,local_740);
              }
              uVar89 = vmovmskps_avx(auVar110);
              uVar91 = 0;
              if (uVar89 != 0) {
                for (; (uVar89 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
                }
              }
              uVar94 = (ulong)uVar91;
              *(undefined4 *)(local_740 + uVar94 * 4) = 0;
              aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_840 = aVar3.x;
              fStack_83c = aVar3.y;
              fStack_838 = aVar3.z;
              aStack_834 = aVar3.field_3;
              auVar101 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
              fVar193 = local_1c0[uVar94];
              uVar91 = *(uint *)(local_500 + uVar94 * 4);
              if (auVar101._0_4_ < 0.0) {
                fVar213 = sqrtf(auVar101._0_4_);
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                fVar213 = auVar101._0_4_;
              }
              auVar29 = vminps_avx(_local_9f0,_local_a10);
              auVar101 = vmaxps_avx(_local_9f0,_local_a10);
              auVar106 = vminps_avx(_local_a00,_local_a20);
              auVar146 = vminps_avx(auVar29,auVar106);
              auVar29 = vmaxps_avx(_local_a00,_local_a20);
              auVar106 = vmaxps_avx(auVar101,auVar29);
              auVar200._8_4_ = 0x7fffffff;
              auVar200._0_8_ = 0x7fffffff7fffffff;
              auVar200._12_4_ = 0x7fffffff;
              auVar101 = vandps_avx(auVar146,auVar200);
              auVar29 = vandps_avx(auVar106,auVar200);
              auVar101 = vmaxps_avx(auVar101,auVar29);
              auVar29 = vmovshdup_avx(auVar101);
              auVar29 = vmaxss_avx(auVar29,auVar101);
              auVar101 = vshufpd_avx(auVar101,auVar101,1);
              auVar101 = vmaxss_avx(auVar101,auVar29);
              local_860 = auVar101._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar213 * 1.9073486e-06;
              _local_900 = vshufps_avx(auVar106,auVar106,0xff);
              auVar101 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar193),0x10);
              auVar335 = ZEXT1664(auVar101);
              lVar93 = 5;
              do {
                auVar330 = auVar335._0_16_;
                auVar29 = vmovshdup_avx(auVar330);
                fVar193 = auVar29._0_4_;
                fVar218 = 1.0 - fVar193;
                fVar213 = fVar218 * fVar218;
                fVar214 = fVar218 * fVar213;
                fVar215 = fVar193 * fVar193;
                fVar216 = fVar193 * fVar215;
                fVar217 = fVar193 * fVar218;
                auVar101 = vshufps_avx(ZEXT416((uint)(fVar216 * 0.16666667)),
                                       ZEXT416((uint)(fVar216 * 0.16666667)),0);
                auVar106 = ZEXT416((uint)((fVar216 * 4.0 + fVar214 +
                                          fVar193 * fVar217 * 12.0 + fVar218 * fVar217 * 6.0) *
                                         0.16666667));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar146 = ZEXT416((uint)((fVar214 * 4.0 + fVar216 +
                                          fVar218 * fVar217 * 12.0 + fVar193 * fVar217 * 6.0) *
                                         0.16666667));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar105 = vshufps_avx(auVar330,auVar330,0);
                auVar174._0_4_ = auVar105._0_4_ * local_840 + 0.0;
                auVar174._4_4_ = auVar105._4_4_ * fStack_83c + 0.0;
                auVar174._8_4_ = auVar105._8_4_ * fStack_838 + 0.0;
                auVar174._12_4_ = auVar105._12_4_ * aStack_834.w + 0.0;
                auVar105 = vshufps_avx(ZEXT416((uint)(fVar214 * 0.16666667)),
                                       ZEXT416((uint)(fVar214 * 0.16666667)),0);
                auVar104._0_4_ =
                     auVar105._0_4_ * (float)local_9f0._0_4_ +
                     auVar146._0_4_ * (float)local_a10._0_4_ +
                     auVar101._0_4_ * (float)local_a20._0_4_ +
                     auVar106._0_4_ * (float)local_a00._0_4_;
                auVar104._4_4_ =
                     auVar105._4_4_ * (float)local_9f0._4_4_ +
                     auVar146._4_4_ * (float)local_a10._4_4_ +
                     auVar101._4_4_ * (float)local_a20._4_4_ +
                     auVar106._4_4_ * (float)local_a00._4_4_;
                auVar104._8_4_ =
                     auVar105._8_4_ * fStack_9e8 +
                     auVar146._8_4_ * fStack_a08 +
                     auVar101._8_4_ * fStack_a18 + auVar106._8_4_ * fStack_9f8;
                auVar104._12_4_ =
                     auVar105._12_4_ * fStack_9e4 +
                     auVar146._12_4_ * fStack_a04 +
                     auVar101._12_4_ * fStack_a14 + auVar106._12_4_ * fStack_9f4;
                local_880._0_16_ = auVar104;
                auVar101 = vsubps_avx(auVar174,auVar104);
                _local_a60 = auVar101;
                auVar101 = vdpps_avx(auVar101,auVar101,0x7f);
                fVar214 = auVar101._0_4_;
                local_b00 = auVar335._0_4_;
                if (fVar214 < 0.0) {
                  local_a40._0_16_ = auVar29;
                  local_8c0._0_4_ = fVar215;
                  local_9c0._0_4_ = fVar213;
                  local_9e0._0_4_ = fVar217;
                  fVar216 = sqrtf(fVar214);
                  fVar215 = (float)local_8c0._0_4_;
                  fVar213 = (float)local_9c0._0_4_;
                  fVar217 = (float)local_9e0._0_4_;
                  fVar193 = (float)local_a40._0_4_;
                }
                else {
                  auVar29 = vsqrtss_avx(auVar101,auVar101);
                  fVar216 = auVar29._0_4_;
                }
                auVar29 = vshufps_avx(ZEXT416((uint)(fVar215 * 0.5)),ZEXT416((uint)(fVar215 * 0.5)),
                                      0);
                auVar106 = ZEXT416((uint)((fVar213 + fVar217 * 4.0) * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar146 = ZEXT416((uint)((fVar193 * -fVar193 - fVar217 * 4.0) * 0.5));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar105 = ZEXT416((uint)(fVar218 * -fVar218 * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar318._0_4_ =
                     (float)local_9f0._0_4_ * auVar105._0_4_ +
                     (float)local_a10._0_4_ * auVar146._0_4_ +
                     (float)local_a20._0_4_ * auVar29._0_4_ +
                     (float)local_a00._0_4_ * auVar106._0_4_;
                auVar318._4_4_ =
                     (float)local_9f0._4_4_ * auVar105._4_4_ +
                     (float)local_a10._4_4_ * auVar146._4_4_ +
                     (float)local_a20._4_4_ * auVar29._4_4_ +
                     (float)local_a00._4_4_ * auVar106._4_4_;
                auVar318._8_4_ =
                     fStack_9e8 * auVar105._8_4_ +
                     fStack_a08 * auVar146._8_4_ +
                     fStack_a18 * auVar29._8_4_ + fStack_9f8 * auVar106._8_4_;
                auVar318._12_4_ =
                     fStack_9e4 * auVar105._12_4_ +
                     fStack_a04 * auVar146._12_4_ +
                     fStack_a14 * auVar29._12_4_ + fStack_9f4 * auVar106._12_4_;
                auVar29 = vshufps_avx(auVar330,auVar330,0x55);
                auVar106 = ZEXT416((uint)(fVar218 - (fVar193 + fVar193)));
                auVar146 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = ZEXT416((uint)(fVar193 - (fVar218 + fVar218)));
                auVar105 = vshufps_avx(auVar106,auVar106,0);
                auVar5 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
                auVar106 = vdpps_avx(auVar318,auVar318,0x7f);
                auVar147._0_4_ =
                     (float)local_9f0._0_4_ * auVar5._0_4_ +
                     (float)local_a10._0_4_ * auVar105._0_4_ +
                     (float)local_a20._0_4_ * auVar29._0_4_ +
                     (float)local_a00._0_4_ * auVar146._0_4_;
                auVar147._4_4_ =
                     (float)local_9f0._4_4_ * auVar5._4_4_ +
                     (float)local_a10._4_4_ * auVar105._4_4_ +
                     (float)local_a20._4_4_ * auVar29._4_4_ +
                     (float)local_a00._4_4_ * auVar146._4_4_;
                auVar147._8_4_ =
                     fStack_9e8 * auVar5._8_4_ +
                     fStack_a08 * auVar105._8_4_ +
                     fStack_a18 * auVar29._8_4_ + fStack_9f8 * auVar146._8_4_;
                auVar147._12_4_ =
                     fStack_9e4 * auVar5._12_4_ +
                     fStack_a04 * auVar105._12_4_ +
                     fStack_a14 * auVar29._12_4_ + fStack_9f4 * auVar146._12_4_;
                auVar29 = vblendps_avx(auVar106,_DAT_01f7aa10,0xe);
                auVar146 = vrsqrtss_avx(auVar29,auVar29);
                fVar213 = auVar146._0_4_;
                fVar193 = auVar106._0_4_;
                auVar146 = vdpps_avx(auVar318,auVar147,0x7f);
                auVar105 = vshufps_avx(auVar106,auVar106,0);
                auVar148._0_4_ = auVar147._0_4_ * auVar105._0_4_;
                auVar148._4_4_ = auVar147._4_4_ * auVar105._4_4_;
                auVar148._8_4_ = auVar147._8_4_ * auVar105._8_4_;
                auVar148._12_4_ = auVar147._12_4_ * auVar105._12_4_;
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar224._0_4_ = auVar318._0_4_ * auVar146._0_4_;
                auVar224._4_4_ = auVar318._4_4_ * auVar146._4_4_;
                auVar224._8_4_ = auVar318._8_4_ * auVar146._8_4_;
                auVar224._12_4_ = auVar318._12_4_ * auVar146._12_4_;
                auVar5 = vsubps_avx(auVar148,auVar224);
                auVar146 = vrcpss_avx(auVar29,auVar29);
                auVar29 = vmaxss_avx(ZEXT416((uint)local_860),
                                     ZEXT416((uint)(local_b00 * (float)local_980._0_4_)));
                auVar359 = ZEXT1664(auVar29);
                auVar146 = ZEXT416((uint)(auVar146._0_4_ * (2.0 - fVar193 * auVar146._0_4_)));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                uVar94 = CONCAT44(auVar318._4_4_,auVar318._0_4_);
                auVar244._0_8_ = uVar94 ^ 0x8000000080000000;
                auVar244._8_4_ = -auVar318._8_4_;
                auVar244._12_4_ = -auVar318._12_4_;
                auVar105 = ZEXT416((uint)(fVar213 * 1.5 +
                                         fVar193 * -0.5 * fVar213 * fVar213 * fVar213));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar201._0_4_ = auVar105._0_4_ * auVar5._0_4_ * auVar146._0_4_;
                auVar201._4_4_ = auVar105._4_4_ * auVar5._4_4_ * auVar146._4_4_;
                auVar201._8_4_ = auVar105._8_4_ * auVar5._8_4_ * auVar146._8_4_;
                auVar201._12_4_ = auVar105._12_4_ * auVar5._12_4_ * auVar146._12_4_;
                auVar269._0_4_ = auVar318._0_4_ * auVar105._0_4_;
                auVar269._4_4_ = auVar318._4_4_ * auVar105._4_4_;
                auVar269._8_4_ = auVar318._8_4_ * auVar105._8_4_;
                auVar269._12_4_ = auVar318._12_4_ * auVar105._12_4_;
                local_a40._0_4_ = auVar29._0_4_;
                if (fVar193 < 0.0) {
                  local_8c0._0_4_ = fVar216;
                  local_9c0._0_16_ = auVar244;
                  local_9e0._0_16_ = auVar269;
                  local_9a0._0_16_ = auVar201;
                  fVar193 = sqrtf(fVar193);
                  auVar359 = ZEXT464((uint)local_a40._0_4_);
                  auVar201 = local_9a0._0_16_;
                  auVar244 = local_9c0._0_16_;
                  auVar269 = local_9e0._0_16_;
                  fVar216 = (float)local_8c0._0_4_;
                }
                else {
                  auVar29 = vsqrtss_avx(auVar106,auVar106);
                  fVar193 = auVar29._0_4_;
                }
                auVar29 = vdpps_avx(_local_a60,auVar269,0x7f);
                fVar193 = (local_860 / fVar193) * (fVar216 + 1.0) +
                          auVar359._0_4_ + fVar216 * local_860;
                auVar106 = vdpps_avx(auVar244,auVar269,0x7f);
                auVar146 = vdpps_avx(_local_a60,auVar201,0x7f);
                auVar84._4_4_ = fStack_83c;
                auVar84._0_4_ = local_840;
                auVar84._8_4_ = fStack_838;
                auVar84._12_4_ = aStack_834.a;
                auVar105 = vdpps_avx(auVar84,auVar269,0x7f);
                auVar5 = vdpps_avx(_local_a60,auVar244,0x7f);
                fVar213 = auVar106._0_4_ + auVar146._0_4_;
                fVar215 = auVar29._0_4_;
                auVar107._0_4_ = fVar215 * fVar215;
                auVar107._4_4_ = auVar29._4_4_ * auVar29._4_4_;
                auVar107._8_4_ = auVar29._8_4_ * auVar29._8_4_;
                auVar107._12_4_ = auVar29._12_4_ * auVar29._12_4_;
                auVar146 = vsubps_avx(auVar101,auVar107);
                auVar106 = vdpps_avx(_local_a60,auVar84,0x7f);
                fVar216 = auVar5._0_4_ - fVar215 * fVar213;
                fVar217 = auVar106._0_4_ - fVar215 * auVar105._0_4_;
                auVar106 = vrsqrtss_avx(auVar146,auVar146);
                fVar218 = auVar146._0_4_;
                fVar215 = auVar106._0_4_;
                fVar215 = fVar215 * 1.5 + fVar218 * -0.5 * fVar215 * fVar215 * fVar215;
                if (fVar218 < 0.0) {
                  local_8c0._0_16_ = auVar29;
                  local_9c0._0_4_ = fVar193;
                  local_9e0._0_16_ = auVar105;
                  local_9a0._0_16_ = ZEXT416((uint)fVar213);
                  local_8e0._0_4_ = fVar216;
                  local_820._0_4_ = fVar217;
                  local_780._0_4_ = fVar215;
                  fVar218 = sqrtf(fVar218);
                  auVar359 = ZEXT464((uint)local_a40._0_4_);
                  fVar215 = (float)local_780._0_4_;
                  fVar216 = (float)local_8e0._0_4_;
                  fVar217 = (float)local_820._0_4_;
                  auVar105 = local_9e0._0_16_;
                  fVar193 = (float)local_9c0._0_4_;
                  auVar29 = local_8c0._0_16_;
                  auVar106 = local_9a0._0_16_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar146,auVar146);
                  fVar218 = auVar106._0_4_;
                  auVar106 = ZEXT416((uint)fVar213);
                }
                auVar380 = ZEXT1664(auVar29);
                auVar366 = ZEXT464((uint)fVar193);
                auVar5 = vpermilps_avx(local_880._0_16_,0xff);
                auVar6 = vshufps_avx(auVar318,auVar318,0xff);
                fVar216 = fVar216 * fVar215 - auVar6._0_4_;
                auVar225._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
                auVar225._8_4_ = auVar105._8_4_ ^ 0x80000000;
                auVar225._12_4_ = auVar105._12_4_ ^ 0x80000000;
                auVar245._0_4_ = -fVar216;
                auVar245._4_4_ = 0x80000000;
                auVar245._8_4_ = 0x80000000;
                auVar245._12_4_ = 0x80000000;
                auVar255 = ZEXT1664(auVar245);
                fVar213 = auVar106._0_4_ * fVar217 * fVar215;
                auVar279 = ZEXT464((uint)fVar213);
                auVar146 = vinsertps_avx(auVar245,ZEXT416((uint)(fVar217 * fVar215)),0x1c);
                auVar105 = vmovsldup_avx(ZEXT416((uint)(fVar213 - auVar105._0_4_ * fVar216)));
                auVar146 = vdivps_avx(auVar146,auVar105);
                auVar106 = vinsertps_avx(auVar106,auVar225,0x10);
                auVar106 = vdivps_avx(auVar106,auVar105);
                auVar105 = vmovsldup_avx(auVar29);
                auVar108 = ZEXT416((uint)(fVar218 - auVar5._0_4_));
                auVar5 = vmovsldup_avx(auVar108);
                auVar175._0_4_ = auVar105._0_4_ * auVar146._0_4_ + auVar5._0_4_ * auVar106._0_4_;
                auVar175._4_4_ = auVar105._4_4_ * auVar146._4_4_ + auVar5._4_4_ * auVar106._4_4_;
                auVar175._8_4_ = auVar105._8_4_ * auVar146._8_4_ + auVar5._8_4_ * auVar106._8_4_;
                auVar175._12_4_ =
                     auVar105._12_4_ * auVar146._12_4_ + auVar5._12_4_ * auVar106._12_4_;
                auVar146 = vsubps_avx(auVar330,auVar175);
                auVar335 = ZEXT1664(auVar146);
                auVar176._8_4_ = 0x7fffffff;
                auVar176._0_8_ = 0x7fffffff7fffffff;
                auVar176._12_4_ = 0x7fffffff;
                auVar106 = vandps_avx(auVar29,auVar176);
                if (auVar106._0_4_ < fVar193) {
                  auVar202._8_4_ = 0x7fffffff;
                  auVar202._0_8_ = 0x7fffffff7fffffff;
                  auVar202._12_4_ = 0x7fffffff;
                  auVar106 = vandps_avx(auVar108,auVar202);
                  if (auVar106._0_4_ <
                      (float)local_900._0_4_ * 1.9073486e-06 + auVar359._0_4_ + fVar193) {
                    fVar213 = auVar146._0_4_ + (float)local_7f0._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar213) {
                      fVar215 = (ray->super_RayK<1>).tfar;
                      auVar279 = ZEXT464((uint)fVar215);
                      if (fVar213 <= fVar215) {
                        auVar106 = vmovshdup_avx(auVar146);
                        fVar216 = auVar106._0_4_;
                        if ((0.0 <= fVar216) && (fVar216 <= 1.0)) {
                          auVar101 = vrsqrtss_avx(auVar101,auVar101);
                          fVar217 = auVar101._0_4_;
                          auVar255 = ZEXT464((uint)(fVar214 * -0.5));
                          pGVar11 = (context->scene->geometries).items[uVar88].ptr;
                          if ((pGVar11->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar101 = ZEXT416((uint)(fVar217 * 1.5 +
                                                     fVar214 * -0.5 * fVar217 * fVar217 * fVar217));
                            auVar101 = vshufps_avx(auVar101,auVar101,0);
                            auVar203._0_4_ = auVar101._0_4_ * (float)local_a60._0_4_;
                            auVar203._4_4_ = auVar101._4_4_ * (float)local_a60._4_4_;
                            auVar203._8_4_ = auVar101._8_4_ * fStack_a58;
                            auVar203._12_4_ = auVar101._12_4_ * fStack_a54;
                            auVar149._0_4_ = auVar318._0_4_ + auVar6._0_4_ * auVar203._0_4_;
                            auVar149._4_4_ = auVar318._4_4_ + auVar6._4_4_ * auVar203._4_4_;
                            auVar149._8_4_ = auVar318._8_4_ + auVar6._8_4_ * auVar203._8_4_;
                            auVar149._12_4_ = auVar318._12_4_ + auVar6._12_4_ * auVar203._12_4_;
                            auVar101 = vshufps_avx(auVar203,auVar203,0xc9);
                            auVar106 = vshufps_avx(auVar318,auVar318,0xc9);
                            auVar204._0_4_ = auVar106._0_4_ * auVar203._0_4_;
                            auVar204._4_4_ = auVar106._4_4_ * auVar203._4_4_;
                            auVar204._8_4_ = auVar106._8_4_ * auVar203._8_4_;
                            auVar204._12_4_ = auVar106._12_4_ * auVar203._12_4_;
                            auVar226._0_4_ = auVar318._0_4_ * auVar101._0_4_;
                            auVar226._4_4_ = auVar318._4_4_ * auVar101._4_4_;
                            auVar226._8_4_ = auVar318._8_4_ * auVar101._8_4_;
                            auVar226._12_4_ = auVar318._12_4_ * auVar101._12_4_;
                            auVar105 = vsubps_avx(auVar226,auVar204);
                            auVar101 = vshufps_avx(auVar105,auVar105,0xc9);
                            auVar106 = vshufps_avx(auVar149,auVar149,0xc9);
                            auVar255 = ZEXT1664(auVar106);
                            auVar227._0_4_ = auVar106._0_4_ * auVar101._0_4_;
                            auVar227._4_4_ = auVar106._4_4_ * auVar101._4_4_;
                            auVar227._8_4_ = auVar106._8_4_ * auVar101._8_4_;
                            auVar227._12_4_ = auVar106._12_4_ * auVar101._12_4_;
                            auVar101 = vshufps_avx(auVar105,auVar105,0xd2);
                            auVar150._0_4_ = auVar149._0_4_ * auVar101._0_4_;
                            auVar150._4_4_ = auVar149._4_4_ * auVar101._4_4_;
                            auVar150._8_4_ = auVar149._8_4_ * auVar101._8_4_;
                            auVar150._12_4_ = auVar149._12_4_ * auVar101._12_4_;
                            auVar101 = vsubps_avx(auVar227,auVar150);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar213;
                              auVar29 = vshufps_avx(auVar101,auVar101,0xe9);
                              uVar2 = vmovlps_avx(auVar29);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                              (ray->Ng).field_0.field_0.z = auVar101._0_4_;
                              ray->u = fVar216;
                              ray->v = 0.0;
                              ray->primID = local_920._0_4_;
                              ray->geomID = uVar88;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar105 = vshufps_avx(auVar101,auVar101,0xe9);
                              local_950 = vmovlps_avx(auVar105);
                              local_948 = auVar101._0_4_;
                              local_944 = fVar216;
                              local_940 = 0;
                              local_93c = local_920._0_4_;
                              local_938 = uVar88;
                              local_934 = context->user->instID[0];
                              local_930 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar213;
                              local_a64 = -1;
                              local_a98.valid = &local_a64;
                              local_a98.geometryUserPtr = pGVar11->userPtr;
                              local_a98.context = context->user;
                              local_a98.hit = (RTCHitN *)&local_950;
                              local_a98.N = 1;
                              local_a98.ray = (RTCRayN *)ray;
                              if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010c1965:
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar255 = ZEXT1664(auVar255._0_16_);
                                  auVar279 = ZEXT1664(auVar279._0_16_);
                                  auVar335 = ZEXT1664(auVar335._0_16_);
                                  auVar359 = ZEXT1664(auVar359._0_16_);
                                  auVar366 = ZEXT1664(auVar366._0_16_);
                                  auVar380 = ZEXT1664(auVar380._0_16_);
                                  (*p_Var12)(&local_a98);
                                  if (*local_a98.valid == 0) goto LAB_010c19fc;
                                }
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a98.hit;
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a98.hit + 4);
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a98.hit + 8);
                                *(float *)((long)local_a98.ray + 0x3c) =
                                     *(float *)(local_a98.hit + 0xc);
                                *(float *)((long)local_a98.ray + 0x40) =
                                     *(float *)(local_a98.hit + 0x10);
                                *(float *)((long)local_a98.ray + 0x44) =
                                     *(float *)(local_a98.hit + 0x14);
                                *(float *)((long)local_a98.ray + 0x48) =
                                     *(float *)(local_a98.hit + 0x18);
                                *(float *)((long)local_a98.ray + 0x4c) =
                                     *(float *)(local_a98.hit + 0x1c);
                                *(float *)((long)local_a98.ray + 0x50) =
                                     *(float *)(local_a98.hit + 0x20);
                              }
                              else {
                                auVar255 = ZEXT1664(auVar106);
                                auVar279 = ZEXT464((uint)fVar215);
                                auVar335 = ZEXT1664(auVar146);
                                auVar359 = ZEXT1664(auVar359._0_16_);
                                auVar366 = ZEXT464((uint)fVar193);
                                auVar380 = ZEXT1664(auVar29);
                                (*pGVar11->intersectionFilterN)(&local_a98);
                                if (*local_a98.valid != 0) goto LAB_010c1965;
LAB_010c19fc:
                                (ray->super_RayK<1>).tfar = fVar215;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar93 = lVar93 + -1;
              } while (lVar93 != 0);
              auVar164 = local_740;
              fVar193 = (ray->super_RayK<1>).tfar;
              auVar118._4_4_ = fVar193;
              auVar118._0_4_ = fVar193;
              auVar118._8_4_ = fVar193;
              auVar118._12_4_ = fVar193;
              auVar118._16_4_ = fVar193;
              auVar118._20_4_ = fVar193;
              auVar118._24_4_ = fVar193;
              auVar118._28_4_ = fVar193;
              auVar110 = vcmpps_avx(_local_7a0,auVar118,2);
              local_740 = vandps_avx(auVar110,local_740);
              auVar164 = auVar164 & auVar110;
            } while ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar164 >> 0x7f,0) != '\0') ||
                       (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar164 >> 0xbf,0) != '\0') ||
                     (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar164[0x1f] < '\0');
          }
          auVar110 = vandps_avx(local_600,local_5e0);
          auVar164 = vandps_avx(_local_7e0,local_7c0);
          auVar304 = ZEXT3264(_local_760);
          auVar229._0_4_ = local_760._0_4_ + local_4e0._0_4_;
          auVar229._4_4_ = local_760._4_4_ + local_4e0._4_4_;
          auVar229._8_4_ = local_760._8_4_ + local_4e0._8_4_;
          auVar229._12_4_ = local_760._12_4_ + local_4e0._12_4_;
          auVar229._16_4_ = local_760._16_4_ + local_4e0._16_4_;
          auVar229._20_4_ = local_760._20_4_ + local_4e0._20_4_;
          auVar229._24_4_ = local_760._24_4_ + local_4e0._24_4_;
          auVar229._28_4_ = local_760._28_4_ + local_4e0._28_4_;
          auVar17 = vcmpps_avx(auVar229,auVar118,2);
          auVar110 = vandps_avx(auVar17,auVar110);
          auVar230._0_4_ = local_520._0_4_ + local_760._0_4_;
          auVar230._4_4_ = local_520._4_4_ + local_760._4_4_;
          auVar230._8_4_ = local_520._8_4_ + local_760._8_4_;
          auVar230._12_4_ = local_520._12_4_ + local_760._12_4_;
          auVar230._16_4_ = local_520._16_4_ + local_760._16_4_;
          auVar230._20_4_ = local_520._20_4_ + local_760._20_4_;
          auVar230._24_4_ = local_520._24_4_ + local_760._24_4_;
          auVar230._28_4_ = local_520._28_4_ + local_760._28_4_;
          auVar17 = vcmpps_avx(auVar230,auVar118,2);
          auVar164 = vandps_avx(auVar17,auVar164);
          auVar164 = vorps_avx(auVar110,auVar164);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar164;
            auVar110 = vblendvps_avx(_local_520,local_4e0,auVar110);
            *(undefined1 (*) [32])(auStack_160 + uVar97 * 0x60) = auVar110;
            uVar2 = vmovlps_avx(local_530);
            (&uStack_140)[uVar97 * 0xc] = uVar2;
            aiStack_138[uVar97 * 0x18] = local_b0c + 1;
            iVar96 = iVar96 + 1;
          }
        }
      }
    }
    fVar193 = (ray->super_RayK<1>).tfar;
    auVar121._4_4_ = fVar193;
    auVar121._0_4_ = fVar193;
    auVar121._8_4_ = fVar193;
    auVar121._12_4_ = fVar193;
    auVar121._16_4_ = fVar193;
    auVar121._20_4_ = fVar193;
    auVar121._24_4_ = fVar193;
    auVar121._28_4_ = fVar193;
    if (iVar96 == 0) break;
    uVar91 = -iVar96;
    pauVar90 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar96 - 1) * 0x60);
    while( true ) {
      auVar110 = pauVar90[1];
      auVar163._0_4_ = auVar110._0_4_ + (float)local_760._0_4_;
      auVar163._4_4_ = auVar110._4_4_ + (float)local_760._4_4_;
      auVar163._8_4_ = auVar110._8_4_ + fStack_758;
      auVar163._12_4_ = auVar110._12_4_ + fStack_754;
      auVar163._16_4_ = auVar110._16_4_ + fStack_750;
      auVar163._20_4_ = auVar110._20_4_ + fStack_74c;
      auVar163._24_4_ = auVar110._24_4_ + fStack_748;
      auVar163._28_4_ = auVar110._28_4_ + fStack_744;
      auVar17 = vcmpps_avx(auVar163,auVar121,2);
      auVar164 = vandps_avx(auVar17,*pauVar90);
      local_4e0 = auVar164;
      auVar17 = *pauVar90 & auVar17;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') break;
      pauVar90 = pauVar90 + -3;
      uVar91 = uVar91 + 1;
      if (uVar91 == 0) goto LAB_010c1cd0;
    }
    auVar122._8_4_ = 0x7f800000;
    auVar122._0_8_ = 0x7f8000007f800000;
    auVar122._12_4_ = 0x7f800000;
    auVar122._16_4_ = 0x7f800000;
    auVar122._20_4_ = 0x7f800000;
    auVar122._24_4_ = 0x7f800000;
    auVar122._28_4_ = 0x7f800000;
    auVar110 = vblendvps_avx(auVar122,auVar110,auVar164);
    auVar17 = vshufps_avx(auVar110,auVar110,0xb1);
    auVar17 = vminps_avx(auVar110,auVar17);
    auVar18 = vshufpd_avx(auVar17,auVar17,5);
    auVar17 = vminps_avx(auVar17,auVar18);
    auVar18 = vperm2f128_avx(auVar17,auVar17,1);
    auVar17 = vminps_avx(auVar17,auVar18);
    auVar110 = vcmpps_avx(auVar110,auVar17,0);
    auVar17 = auVar164 & auVar110;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar164 = vandps_avx(auVar110,auVar164);
    }
    auVar109._8_8_ = 0;
    auVar109._0_8_ = *(ulong *)pauVar90[2];
    local_b0c = *(uint *)(pauVar90[2] + 8);
    uVar92 = vmovmskps_avx(auVar164);
    uVar89 = 0;
    if (uVar92 != 0) {
      for (; (uVar92 >> uVar89 & 1) == 0; uVar89 = uVar89 + 1) {
      }
    }
    *(undefined4 *)(local_4e0 + (ulong)uVar89 * 4) = 0;
    *pauVar90 = local_4e0;
    uVar92 = ~uVar91;
    if ((((((((local_4e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4e0 >> 0x7f,0) != '\0') ||
          (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4e0 >> 0xbf,0) != '\0') ||
        (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4e0[0x1f] < '\0') {
      uVar92 = -uVar91;
    }
    uVar97 = (ulong)uVar92;
    auVar101 = vshufps_avx(auVar109,auVar109,0);
    auVar29 = vshufps_avx(auVar109,auVar109,0x55);
    auVar29 = vsubps_avx(auVar29,auVar101);
    local_520._4_4_ = auVar101._4_4_ + auVar29._4_4_ * 0.14285715;
    local_520._0_4_ = auVar101._0_4_ + auVar29._0_4_ * 0.0;
    fStack_518 = auVar101._8_4_ + auVar29._8_4_ * 0.2857143;
    fStack_514 = auVar101._12_4_ + auVar29._12_4_ * 0.42857146;
    fStack_510 = auVar101._0_4_ + auVar29._0_4_ * 0.5714286;
    fStack_50c = auVar101._4_4_ + auVar29._4_4_ * 0.71428573;
    fStack_508 = auVar101._8_4_ + auVar29._8_4_ * 0.8571429;
    fStack_504 = auVar101._12_4_ + auVar29._12_4_;
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_520 + (ulong)uVar89 * 4);
    uVar94 = local_920._0_8_;
  } while( true );
LAB_010c1cd0:
  auVar110 = vcmpps_avx(local_2c0,auVar121,2);
  uVar88 = vmovmskps_avx(auVar110);
  uVar88 = (uint)uVar95 & uVar88;
  if (uVar88 == 0) {
    return;
  }
  goto LAB_010bf2f6;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }